

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  bool bVar70;
  undefined1 auVar71 [12];
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  uint uVar88;
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  ulong uVar92;
  byte bVar93;
  long lVar94;
  uint uVar95;
  long lVar96;
  ulong uVar97;
  ulong uVar98;
  bool bVar99;
  float fVar100;
  float fVar131;
  float fVar132;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar119 [32];
  float fVar133;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 extraout_var [60];
  float fVar137;
  float fVar171;
  float fVar173;
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar138;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar172;
  float fVar174;
  float fVar175;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar149 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar176;
  float fVar197;
  float fVar198;
  vint4 bi;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar199;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar185 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar190 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar200;
  float fVar213;
  float fVar214;
  vint4 ai_1;
  undefined1 auVar201 [16];
  float fVar215;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [28];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar216;
  float fVar233;
  float fVar234;
  vint4 ai_2;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar258;
  float fVar260;
  undefined1 auVar247 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar217 [16];
  float fVar235;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  float fVar236;
  float fVar253;
  float fVar254;
  undefined1 auVar237 [16];
  float fVar255;
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar256;
  float fVar257;
  float fVar259;
  undefined1 auVar252 [64];
  float fVar261;
  float fVar262;
  float fVar274;
  float fVar278;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar275;
  float fVar276;
  float fVar279;
  float fVar280;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar287;
  float fVar288;
  float fVar291;
  float fVar292;
  float fVar295;
  float fVar296;
  float fVar298;
  undefined1 auVar268 [32];
  float fVar277;
  float fVar281;
  float fVar285;
  float fVar289;
  float fVar293;
  float fVar297;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar286;
  float fVar290;
  float fVar294;
  undefined1 auVar273 [64];
  float fVar299;
  float fVar309;
  float fVar310;
  vint4 ai;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar312;
  undefined1 auVar305 [32];
  float fVar311;
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar319;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar314;
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar308 [64];
  float fVar321;
  float fVar332;
  float fVar334;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar322;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [28];
  float fVar333;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar346 [16];
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar347 [64];
  undefined1 auVar353 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [64];
  float fVar356;
  float fVar361;
  float fVar362;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  undefined1 auVar359 [32];
  float fVar368;
  float fVar374;
  float fVar375;
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float fVar380;
  float fVar389;
  float fVar391;
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  float fVar381;
  float fVar390;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  float fVar401;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar410;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  float fVar411;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  undefined1 auVar412 [28];
  undefined1 auVar413 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_ba9;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  float local_ac8;
  float local_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 auStack_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined8 *local_9a0;
  ulong local_998;
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  Primitive *local_850;
  ulong local_848;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  RTCHitN local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  uint local_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint uStack_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  ulong local_5e0;
  undefined1 auStack_5d8 [24];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar360 [64];
  undefined1 auVar373 [64];
  
  PVar11 = prim[1];
  uVar91 = (ulong)(byte)PVar11;
  lVar94 = uVar91 * 0x25;
  auVar143 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar112 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar112 = vinsertps_avx(auVar112,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar137 = *(float *)(prim + lVar94 + 0x12);
  auVar143 = vsubps_avx(auVar143,*(undefined1 (*) [16])(prim + lVar94 + 6));
  auVar139._0_4_ = fVar137 * auVar143._0_4_;
  auVar139._4_4_ = fVar137 * auVar143._4_4_;
  auVar139._8_4_ = fVar137 * auVar143._8_4_;
  auVar139._12_4_ = fVar137 * auVar143._12_4_;
  auVar300._0_4_ = fVar137 * auVar112._0_4_;
  auVar300._4_4_ = fVar137 * auVar112._4_4_;
  auVar300._8_4_ = fVar137 * auVar112._8_4_;
  auVar300._12_4_ = fVar137 * auVar112._12_4_;
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xf + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar91 + 6)));
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1a + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1b + 6)));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1c + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vshufps_avx(auVar300,auVar300,0);
  auVar20 = vshufps_avx(auVar300,auVar300,0x55);
  auVar21 = vshufps_avx(auVar300,auVar300,0xaa);
  fVar137 = auVar21._0_4_;
  fVar138 = auVar21._4_4_;
  fVar172 = auVar21._8_4_;
  fVar174 = auVar21._12_4_;
  fVar216 = auVar20._0_4_;
  fVar233 = auVar20._4_4_;
  fVar234 = auVar20._8_4_;
  fVar235 = auVar20._12_4_;
  fVar200 = auVar19._0_4_;
  fVar213 = auVar19._4_4_;
  fVar214 = auVar19._8_4_;
  fVar215 = auVar19._12_4_;
  auVar369._0_4_ = fVar200 * auVar143._0_4_ + fVar216 * auVar112._0_4_ + fVar137 * auVar107._0_4_;
  auVar369._4_4_ = fVar213 * auVar143._4_4_ + fVar233 * auVar112._4_4_ + fVar138 * auVar107._4_4_;
  auVar369._8_4_ = fVar214 * auVar143._8_4_ + fVar234 * auVar112._8_4_ + fVar172 * auVar107._8_4_;
  auVar369._12_4_ =
       fVar215 * auVar143._12_4_ + fVar235 * auVar112._12_4_ + fVar174 * auVar107._12_4_;
  auVar382._0_4_ = fVar200 * auVar114._0_4_ + fVar216 * auVar106._0_4_ + auVar113._0_4_ * fVar137;
  auVar382._4_4_ = fVar213 * auVar114._4_4_ + fVar233 * auVar106._4_4_ + auVar113._4_4_ * fVar138;
  auVar382._8_4_ = fVar214 * auVar114._8_4_ + fVar234 * auVar106._8_4_ + auVar113._8_4_ * fVar172;
  auVar382._12_4_ =
       fVar215 * auVar114._12_4_ + fVar235 * auVar106._12_4_ + auVar113._12_4_ * fVar174;
  auVar301._0_4_ = fVar200 * auVar146._0_4_ + fVar216 * auVar17._0_4_ + auVar18._0_4_ * fVar137;
  auVar301._4_4_ = fVar213 * auVar146._4_4_ + fVar233 * auVar17._4_4_ + auVar18._4_4_ * fVar138;
  auVar301._8_4_ = fVar214 * auVar146._8_4_ + fVar234 * auVar17._8_4_ + auVar18._8_4_ * fVar172;
  auVar301._12_4_ = fVar215 * auVar146._12_4_ + fVar235 * auVar17._12_4_ + auVar18._12_4_ * fVar174;
  auVar19 = vshufps_avx(auVar139,auVar139,0);
  auVar20 = vshufps_avx(auVar139,auVar139,0x55);
  auVar21 = vshufps_avx(auVar139,auVar139,0xaa);
  fVar137 = auVar21._0_4_;
  fVar138 = auVar21._4_4_;
  fVar172 = auVar21._8_4_;
  fVar174 = auVar21._12_4_;
  fVar216 = auVar20._0_4_;
  fVar233 = auVar20._4_4_;
  fVar234 = auVar20._8_4_;
  fVar235 = auVar20._12_4_;
  fVar200 = auVar19._0_4_;
  fVar213 = auVar19._4_4_;
  fVar214 = auVar19._8_4_;
  fVar215 = auVar19._12_4_;
  auVar177._0_4_ = fVar200 * auVar143._0_4_ + fVar216 * auVar112._0_4_ + fVar137 * auVar107._0_4_;
  auVar177._4_4_ = fVar213 * auVar143._4_4_ + fVar233 * auVar112._4_4_ + fVar138 * auVar107._4_4_;
  auVar177._8_4_ = fVar214 * auVar143._8_4_ + fVar234 * auVar112._8_4_ + fVar172 * auVar107._8_4_;
  auVar177._12_4_ =
       fVar215 * auVar143._12_4_ + fVar235 * auVar112._12_4_ + fVar174 * auVar107._12_4_;
  auVar140._0_4_ = fVar200 * auVar114._0_4_ + auVar113._0_4_ * fVar137 + fVar216 * auVar106._0_4_;
  auVar140._4_4_ = fVar213 * auVar114._4_4_ + auVar113._4_4_ * fVar138 + fVar233 * auVar106._4_4_;
  auVar140._8_4_ = fVar214 * auVar114._8_4_ + auVar113._8_4_ * fVar172 + fVar234 * auVar106._8_4_;
  auVar140._12_4_ =
       fVar215 * auVar114._12_4_ + auVar113._12_4_ * fVar174 + fVar235 * auVar106._12_4_;
  auVar101._0_4_ = fVar200 * auVar146._0_4_ + fVar216 * auVar17._0_4_ + auVar18._0_4_ * fVar137;
  auVar101._4_4_ = fVar213 * auVar146._4_4_ + fVar233 * auVar17._4_4_ + auVar18._4_4_ * fVar138;
  auVar101._8_4_ = fVar214 * auVar146._8_4_ + fVar234 * auVar17._8_4_ + auVar18._8_4_ * fVar172;
  auVar101._12_4_ = fVar215 * auVar146._12_4_ + fVar235 * auVar17._12_4_ + auVar18._12_4_ * fVar174;
  auVar263._8_4_ = 0x7fffffff;
  auVar263._0_8_ = 0x7fffffff7fffffff;
  auVar263._12_4_ = 0x7fffffff;
  auVar143 = vandps_avx(auVar369,auVar263);
  auVar217._8_4_ = 0x219392ef;
  auVar217._0_8_ = 0x219392ef219392ef;
  auVar217._12_4_ = 0x219392ef;
  auVar143 = vcmpps_avx(auVar143,auVar217,1);
  auVar112 = vblendvps_avx(auVar369,auVar217,auVar143);
  auVar143 = vandps_avx(auVar382,auVar263);
  auVar143 = vcmpps_avx(auVar143,auVar217,1);
  auVar107 = vblendvps_avx(auVar382,auVar217,auVar143);
  auVar143 = vandps_avx(auVar301,auVar263);
  auVar143 = vcmpps_avx(auVar143,auVar217,1);
  auVar143 = vblendvps_avx(auVar301,auVar217,auVar143);
  auVar114 = vrcpps_avx(auVar112);
  fVar200 = auVar114._0_4_;
  auVar201._0_4_ = fVar200 * auVar112._0_4_;
  fVar213 = auVar114._4_4_;
  auVar201._4_4_ = fVar213 * auVar112._4_4_;
  fVar214 = auVar114._8_4_;
  auVar201._8_4_ = fVar214 * auVar112._8_4_;
  fVar215 = auVar114._12_4_;
  auVar201._12_4_ = fVar215 * auVar112._12_4_;
  auVar302._8_4_ = 0x3f800000;
  auVar302._0_8_ = &DAT_3f8000003f800000;
  auVar302._12_4_ = 0x3f800000;
  auVar112 = vsubps_avx(auVar302,auVar201);
  fVar200 = fVar200 + fVar200 * auVar112._0_4_;
  fVar213 = fVar213 + fVar213 * auVar112._4_4_;
  fVar214 = fVar214 + fVar214 * auVar112._8_4_;
  fVar215 = fVar215 + fVar215 * auVar112._12_4_;
  auVar112 = vrcpps_avx(auVar107);
  fVar216 = auVar112._0_4_;
  auVar237._0_4_ = fVar216 * auVar107._0_4_;
  fVar233 = auVar112._4_4_;
  auVar237._4_4_ = fVar233 * auVar107._4_4_;
  fVar234 = auVar112._8_4_;
  auVar237._8_4_ = fVar234 * auVar107._8_4_;
  fVar235 = auVar112._12_4_;
  auVar237._12_4_ = fVar235 * auVar107._12_4_;
  auVar112 = vsubps_avx(auVar302,auVar237);
  fVar216 = fVar216 + fVar216 * auVar112._0_4_;
  fVar233 = fVar233 + fVar233 * auVar112._4_4_;
  fVar234 = fVar234 + fVar234 * auVar112._8_4_;
  fVar235 = fVar235 + fVar235 * auVar112._12_4_;
  auVar112 = vrcpps_avx(auVar143);
  fVar236 = auVar112._0_4_;
  auVar264._0_4_ = fVar236 * auVar143._0_4_;
  fVar253 = auVar112._4_4_;
  auVar264._4_4_ = fVar253 * auVar143._4_4_;
  fVar254 = auVar112._8_4_;
  auVar264._8_4_ = fVar254 * auVar143._8_4_;
  fVar255 = auVar112._12_4_;
  auVar264._12_4_ = fVar255 * auVar143._12_4_;
  auVar143 = vsubps_avx(auVar302,auVar264);
  fVar236 = fVar236 + fVar236 * auVar143._0_4_;
  fVar253 = fVar253 + fVar253 * auVar143._4_4_;
  fVar254 = fVar254 + fVar254 * auVar143._8_4_;
  fVar255 = fVar255 + fVar255 * auVar143._12_4_;
  auVar143 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar94 + 0x16)) *
                           *(float *)(prim + lVar94 + 0x1a)));
  auVar107 = vshufps_avx(auVar143,auVar143,0);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar143 = vpmovsxwd_avx(auVar143);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 6);
  auVar112 = vpmovsxwd_avx(auVar112);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar143);
  fVar137 = auVar107._0_4_;
  fVar138 = auVar107._4_4_;
  fVar172 = auVar107._8_4_;
  fVar174 = auVar107._12_4_;
  auVar303._0_4_ = auVar112._0_4_ * fVar137 + auVar143._0_4_;
  auVar303._4_4_ = auVar112._4_4_ * fVar138 + auVar143._4_4_;
  auVar303._8_4_ = auVar112._8_4_ * fVar172 + auVar143._8_4_;
  auVar303._12_4_ = auVar112._12_4_ * fVar174 + auVar143._12_4_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar143 = vpmovsxwd_avx(auVar107);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 6);
  auVar112 = vpmovsxwd_avx(auVar114);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar143);
  auVar323._0_4_ = auVar112._0_4_ * fVar137 + auVar143._0_4_;
  auVar323._4_4_ = auVar112._4_4_ * fVar138 + auVar143._4_4_;
  auVar323._8_4_ = auVar112._8_4_ * fVar172 + auVar143._8_4_;
  auVar323._12_4_ = auVar112._12_4_ * fVar174 + auVar143._12_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 6);
  auVar143 = vpmovsxwd_avx(auVar106);
  auVar143 = vcvtdq2ps_avx(auVar143);
  uVar98 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar91 * 2 + uVar98 + 6);
  auVar112 = vpmovsxwd_avx(auVar113);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar143);
  auVar346._0_4_ = auVar112._0_4_ * fVar137 + auVar143._0_4_;
  auVar346._4_4_ = auVar112._4_4_ * fVar138 + auVar143._4_4_;
  auVar346._8_4_ = auVar112._8_4_ * fVar172 + auVar143._8_4_;
  auVar346._12_4_ = auVar112._12_4_ * fVar174 + auVar143._12_4_;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar98 + 6);
  auVar143 = vpmovsxwd_avx(auVar146);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar91 * 0x18 + 6);
  auVar112 = vpmovsxwd_avx(auVar17);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar143);
  auVar353._0_4_ = auVar112._0_4_ * fVar137 + auVar143._0_4_;
  auVar353._4_4_ = auVar112._4_4_ * fVar138 + auVar143._4_4_;
  auVar353._8_4_ = auVar112._8_4_ * fVar172 + auVar143._8_4_;
  auVar353._12_4_ = auVar112._12_4_ * fVar174 + auVar143._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar91 * 0x1d + 6);
  auVar143 = vpmovsxwd_avx(auVar18);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar91 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar112 = vpmovsxwd_avx(auVar19);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar107 = vsubps_avx(auVar112,auVar143);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar91) + 6);
  auVar112 = vpmovsxwd_avx(auVar20);
  auVar357._0_4_ = auVar107._0_4_ * fVar137 + auVar143._0_4_;
  auVar357._4_4_ = auVar107._4_4_ * fVar138 + auVar143._4_4_;
  auVar357._8_4_ = auVar107._8_4_ * fVar172 + auVar143._8_4_;
  auVar357._12_4_ = auVar107._12_4_ * fVar174 + auVar143._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar91 * 0x23 + 6);
  auVar107 = vpmovsxwd_avx(auVar21);
  auVar143 = vcvtdq2ps_avx(auVar112);
  auVar112 = vcvtdq2ps_avx(auVar107);
  auVar112 = vsubps_avx(auVar112,auVar143);
  auVar265._0_4_ = auVar143._0_4_ + auVar112._0_4_ * fVar137;
  auVar265._4_4_ = auVar143._4_4_ + auVar112._4_4_ * fVar138;
  auVar265._8_4_ = auVar143._8_4_ + auVar112._8_4_ * fVar172;
  auVar265._12_4_ = auVar143._12_4_ + auVar112._12_4_ * fVar174;
  auVar143 = vsubps_avx(auVar303,auVar177);
  auVar304._0_4_ = fVar200 * auVar143._0_4_;
  auVar304._4_4_ = fVar213 * auVar143._4_4_;
  auVar304._8_4_ = fVar214 * auVar143._8_4_;
  auVar304._12_4_ = fVar215 * auVar143._12_4_;
  auVar143 = vsubps_avx(auVar323,auVar177);
  auVar178._0_4_ = fVar200 * auVar143._0_4_;
  auVar178._4_4_ = fVar213 * auVar143._4_4_;
  auVar178._8_4_ = fVar214 * auVar143._8_4_;
  auVar178._12_4_ = fVar215 * auVar143._12_4_;
  auVar143 = vsubps_avx(auVar346,auVar140);
  auVar202._0_4_ = fVar216 * auVar143._0_4_;
  auVar202._4_4_ = fVar233 * auVar143._4_4_;
  auVar202._8_4_ = fVar234 * auVar143._8_4_;
  auVar202._12_4_ = fVar235 * auVar143._12_4_;
  auVar143 = vsubps_avx(auVar353,auVar140);
  auVar141._0_4_ = fVar216 * auVar143._0_4_;
  auVar141._4_4_ = fVar233 * auVar143._4_4_;
  auVar141._8_4_ = fVar234 * auVar143._8_4_;
  auVar141._12_4_ = fVar235 * auVar143._12_4_;
  auVar143 = vsubps_avx(auVar357,auVar101);
  auVar218._0_4_ = fVar236 * auVar143._0_4_;
  auVar218._4_4_ = fVar253 * auVar143._4_4_;
  auVar218._8_4_ = fVar254 * auVar143._8_4_;
  auVar218._12_4_ = fVar255 * auVar143._12_4_;
  auVar143 = vsubps_avx(auVar265,auVar101);
  auVar102._0_4_ = fVar236 * auVar143._0_4_;
  auVar102._4_4_ = fVar253 * auVar143._4_4_;
  auVar102._8_4_ = fVar254 * auVar143._8_4_;
  auVar102._12_4_ = fVar255 * auVar143._12_4_;
  auVar143 = vpminsd_avx(auVar304,auVar178);
  auVar112 = vpminsd_avx(auVar202,auVar141);
  auVar143 = vmaxps_avx(auVar143,auVar112);
  auVar112 = vpminsd_avx(auVar218,auVar102);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar324._4_4_ = uVar8;
  auVar324._0_4_ = uVar8;
  auVar324._8_4_ = uVar8;
  auVar324._12_4_ = uVar8;
  auVar112 = vmaxps_avx(auVar112,auVar324);
  auVar143 = vmaxps_avx(auVar143,auVar112);
  local_4b0._0_4_ = auVar143._0_4_ * 0.99999964;
  local_4b0._4_4_ = auVar143._4_4_ * 0.99999964;
  local_4b0._8_4_ = auVar143._8_4_ * 0.99999964;
  local_4b0._12_4_ = auVar143._12_4_ * 0.99999964;
  auVar143 = vpmaxsd_avx(auVar304,auVar178);
  auVar112 = vpmaxsd_avx(auVar202,auVar141);
  auVar143 = vminps_avx(auVar143,auVar112);
  auVar112 = vpmaxsd_avx(auVar218,auVar102);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar179._4_4_ = uVar8;
  auVar179._0_4_ = uVar8;
  auVar179._8_4_ = uVar8;
  auVar179._12_4_ = uVar8;
  auVar112 = vminps_avx(auVar112,auVar179);
  auVar143 = vminps_avx(auVar143,auVar112);
  auVar103._0_4_ = auVar143._0_4_ * 1.0000004;
  auVar103._4_4_ = auVar143._4_4_ * 1.0000004;
  auVar103._8_4_ = auVar143._8_4_ * 1.0000004;
  auVar103._12_4_ = auVar143._12_4_ * 1.0000004;
  auVar143 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar112 = vpcmpgtd_avx(auVar143,_DAT_01ff0cf0);
  auVar143 = vcmpps_avx(local_4b0,auVar103,2);
  auVar143 = vandps_avx(auVar143,auVar112);
  uVar88 = vmovmskps_avx(auVar143);
  local_ba9 = uVar88 != 0;
  if (uVar88 == 0) {
    return local_ba9;
  }
  uVar88 = uVar88 & 0xff;
  auVar124._16_16_ = mm_lookupmask_ps._240_16_;
  auVar124._0_16_ = mm_lookupmask_ps._240_16_;
  local_480 = vblendps_avx(auVar124,ZEXT832(0) << 0x20,0x80);
  local_9a0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_850 = prim;
LAB_0100f1ae:
  local_848 = (ulong)uVar88;
  lVar94 = 0;
  if (local_848 != 0) {
    for (; (uVar88 >> lVar94 & 1) == 0; lVar94 = lVar94 + 1) {
    }
  }
  local_998 = (ulong)*(uint *)(local_850 + 2);
  pGVar12 = (context->scene->geometries).items[local_998].ptr;
  uVar98 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)*(uint *)(local_850 + lVar94 * 4 + 6) *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar137 = (pGVar12->time_range).lower;
  fVar137 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar137) / ((pGVar12->time_range).upper - fVar137));
  auVar143 = vroundss_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),9);
  auVar143 = vminss_avx(auVar143,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar143 = vmaxss_avx(ZEXT816(0) << 0x20,auVar143);
  fVar137 = fVar137 - auVar143._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar96 = (long)(int)auVar143._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + 0x10 + lVar96);
  uVar91 = *(ulong *)(_Var13 + 0x38 + lVar96);
  lVar15 = *(long *)(_Var13 + 0x48 + lVar96);
  auVar143 = vshufps_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),0);
  pfVar1 = (float *)(uVar91 + uVar98 * lVar15);
  fVar213 = auVar143._0_4_;
  fVar214 = auVar143._4_4_;
  fVar215 = auVar143._8_4_;
  fVar216 = auVar143._12_4_;
  pfVar2 = (float *)(uVar91 + (uVar98 + 1) * lVar15);
  pfVar3 = (float *)(uVar91 + (uVar98 + 2) * lVar15);
  pfVar4 = (float *)(uVar91 + lVar15 * (uVar98 + 3));
  lVar15 = *(long *)(_Var13 + lVar96);
  auVar143 = vshufps_avx(ZEXT416((uint)(1.0 - fVar137)),ZEXT416((uint)(1.0 - fVar137)),0);
  pfVar5 = (float *)(lVar15 + lVar14 * uVar98);
  fVar138 = auVar143._0_4_;
  fVar172 = auVar143._4_4_;
  fVar174 = auVar143._8_4_;
  fVar200 = auVar143._12_4_;
  pfVar6 = (float *)(lVar15 + lVar14 * (uVar98 + 1));
  pfVar7 = (float *)(lVar15 + lVar14 * (uVar98 + 2));
  auVar180._0_4_ = fVar213 * *pfVar1 + fVar138 * *pfVar5;
  auVar180._4_4_ = fVar214 * pfVar1[1] + fVar172 * pfVar5[1];
  auVar180._8_4_ = fVar215 * pfVar1[2] + fVar174 * pfVar5[2];
  auVar180._12_4_ = fVar216 * pfVar1[3] + fVar200 * pfVar5[3];
  auVar142._0_4_ = fVar138 * *pfVar6 + fVar213 * *pfVar2;
  auVar142._4_4_ = fVar172 * pfVar6[1] + fVar214 * pfVar2[1];
  auVar142._8_4_ = fVar174 * pfVar6[2] + fVar215 * pfVar2[2];
  auVar142._12_4_ = fVar200 * pfVar6[3] + fVar216 * pfVar2[3];
  pfVar1 = (float *)(lVar15 + lVar14 * (uVar98 + 3));
  auVar203._0_4_ = fVar138 * *pfVar7 + fVar213 * *pfVar3;
  auVar203._4_4_ = fVar172 * pfVar7[1] + fVar214 * pfVar3[1];
  auVar203._8_4_ = fVar174 * pfVar7[2] + fVar215 * pfVar3[2];
  auVar203._12_4_ = fVar200 * pfVar7[3] + fVar216 * pfVar3[3];
  auVar143 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar112 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar137 = *(float *)(ray + k * 4 + 0x40);
  auVar358._4_4_ = fVar137;
  auVar358._0_4_ = fVar137;
  auVar358._8_4_ = fVar137;
  auVar358._12_4_ = fVar137;
  fStack_790 = fVar137;
  _local_7a0 = auVar358;
  fStack_78c = fVar137;
  fStack_788 = fVar137;
  fStack_784 = fVar137;
  auVar360 = ZEXT3264(_local_7a0);
  auVar238._0_4_ = fVar138 * *pfVar1 + fVar213 * *pfVar4;
  auVar238._4_4_ = fVar172 * pfVar1[1] + fVar214 * pfVar4[1];
  auVar238._8_4_ = fVar174 * pfVar1[2] + fVar215 * pfVar4[2];
  auVar238._12_4_ = fVar200 * pfVar1[3] + fVar216 * pfVar4[3];
  fVar138 = *(float *)(ray + k * 4 + 0x50);
  auVar370._4_4_ = fVar138;
  auVar370._0_4_ = fVar138;
  auVar370._8_4_ = fVar138;
  auVar370._12_4_ = fVar138;
  fStack_a30 = fVar138;
  _local_a40 = auVar370;
  fStack_a2c = fVar138;
  fStack_a28 = fVar138;
  fStack_a24 = fVar138;
  auVar373 = ZEXT3264(_local_a40);
  auVar143 = vunpcklps_avx(auVar358,auVar370);
  fVar172 = *(float *)(ray + k * 4 + 0x60);
  auVar383._4_4_ = fVar172;
  auVar383._0_4_ = fVar172;
  auVar383._8_4_ = fVar172;
  auVar383._12_4_ = fVar172;
  fStack_890 = fVar172;
  _local_8a0 = auVar383;
  fStack_88c = fVar172;
  fStack_888 = fVar172;
  fStack_884 = fVar172;
  _local_8f0 = vinsertps_avx(auVar143,auVar383,0x28);
  auVar347 = ZEXT1664(_local_8f0);
  auVar104._0_4_ = (auVar180._0_4_ + auVar142._0_4_ + auVar203._0_4_ + auVar238._0_4_) * 0.25;
  auVar104._4_4_ = (auVar180._4_4_ + auVar142._4_4_ + auVar203._4_4_ + auVar238._4_4_) * 0.25;
  auVar104._8_4_ = (auVar180._8_4_ + auVar142._8_4_ + auVar203._8_4_ + auVar238._8_4_) * 0.25;
  auVar104._12_4_ = (auVar180._12_4_ + auVar142._12_4_ + auVar203._12_4_ + auVar238._12_4_) * 0.25;
  auVar143 = vsubps_avx(auVar104,auVar112);
  auVar143 = vdpps_avx(auVar143,_local_8f0,0x7f);
  local_900 = vdpps_avx(_local_8f0,_local_8f0,0x7f);
  auVar355 = ZEXT1664(local_900);
  auVar107 = vrcpss_avx(local_900,local_900);
  fVar174 = auVar143._0_4_ * auVar107._0_4_ * (2.0 - local_900._0_4_ * auVar107._0_4_);
  auVar308 = ZEXT464((uint)fVar174);
  auVar107 = vshufps_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),0);
  auVar219._0_4_ = auVar112._0_4_ + local_8f0._0_4_ * auVar107._0_4_;
  auVar219._4_4_ = auVar112._4_4_ + local_8f0._4_4_ * auVar107._4_4_;
  auVar219._8_4_ = auVar112._8_4_ + local_8f0._8_4_ * auVar107._8_4_;
  auVar219._12_4_ = auVar112._12_4_ + local_8f0._12_4_ * auVar107._12_4_;
  auVar143 = vblendps_avx(auVar219,_DAT_01feba10,8);
  _local_a50 = vsubps_avx(auVar180,auVar143);
  auVar273 = ZEXT1664(_local_a50);
  _local_a60 = vsubps_avx(auVar203,auVar143);
  _local_a70 = vsubps_avx(auVar142,auVar143);
  _local_a80 = vsubps_avx(auVar238,auVar143);
  auVar252 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  auVar143 = vshufps_avx(_local_a50,_local_a50,0);
  register0x00001250 = auVar143;
  _local_1a0 = auVar143;
  auVar143 = vshufps_avx(_local_a50,_local_a50,0x55);
  register0x00001250 = auVar143;
  _local_1c0 = auVar143;
  auVar143 = vshufps_avx(_local_a50,_local_a50,0xaa);
  register0x00001250 = auVar143;
  _local_1e0 = auVar143;
  auVar143 = vshufps_avx(_local_a50,_local_a50,0xff);
  register0x00001290 = auVar143;
  _local_200 = auVar143;
  auVar143 = vshufps_avx(_local_a70,_local_a70,0);
  register0x00001290 = auVar143;
  _local_360 = auVar143;
  auVar143 = vshufps_avx(_local_a70,_local_a70,0x55);
  register0x00001290 = auVar143;
  _local_220 = auVar143;
  auVar143 = vshufps_avx(_local_a70,_local_a70,0xaa);
  register0x00001290 = auVar143;
  _local_240 = auVar143;
  auVar143 = vshufps_avx(_local_a70,_local_a70,0xff);
  register0x00001290 = auVar143;
  _local_260 = auVar143;
  auVar143 = vshufps_avx(_local_a60,_local_a60,0);
  register0x00001290 = auVar143;
  _local_380 = auVar143;
  auVar143 = vshufps_avx(_local_a60,_local_a60,0x55);
  register0x00001290 = auVar143;
  _local_3a0 = auVar143;
  auVar143 = vshufps_avx(_local_a60,_local_a60,0xaa);
  register0x00001290 = auVar143;
  _local_3c0 = auVar143;
  auVar143 = vshufps_avx(_local_a60,_local_a60,0xff);
  register0x00001290 = auVar143;
  _local_3e0 = auVar143;
  auVar143 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001290 = auVar143;
  _local_400 = auVar143;
  auVar143 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001290 = auVar143;
  _local_420 = auVar143;
  auVar143 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001290 = auVar143;
  _local_440 = auVar143;
  auVar143 = vshufps_avx(_local_a80,_local_a80,0xff);
  local_460._16_16_ = auVar143;
  local_460._0_16_ = auVar143;
  auVar143 = ZEXT416((uint)(fVar137 * fVar137 + fVar138 * fVar138 + fVar172 * fVar172));
  auVar143 = vshufps_avx(auVar143,auVar143,0);
  local_280._16_16_ = auVar143;
  local_280._0_16_ = auVar143;
  fVar137 = *(float *)(ray + k * 4 + 0x30);
  local_870 = ZEXT416((uint)fVar174);
  auVar143 = vshufps_avx(ZEXT416((uint)(fVar137 - fVar174)),ZEXT416((uint)(fVar137 - fVar174)),0);
  local_2a0._16_16_ = auVar143;
  local_2a0._0_16_ = auVar143;
  local_6d0 = vpshufd_avx(ZEXT416(*(uint *)(local_850 + 2)),0);
  local_6e0 = vpshufd_avx(ZEXT416(*(uint *)(local_850 + lVar94 * 4 + 6)),0);
  register0x00001210 = auVar107;
  _local_920 = auVar107;
  uVar88 = 0;
  uVar97 = 0;
  uVar98 = 1;
  auVar119._8_4_ = 0x7fffffff;
  auVar119._0_8_ = 0x7fffffff7fffffff;
  auVar119._12_4_ = 0x7fffffff;
  auVar119._16_4_ = 0x7fffffff;
  auVar119._20_4_ = 0x7fffffff;
  auVar119._24_4_ = 0x7fffffff;
  auVar119._28_4_ = 0x7fffffff;
  local_4a0 = vandps_avx(local_280,auVar119);
  auVar143 = vsqrtss_avx(local_900,local_900);
  local_ac4 = auVar143._0_4_;
  auVar143 = vsqrtss_avx(local_900,local_900);
  local_ac8 = auVar143._0_4_;
  local_860 = ZEXT816(0x3f80000000000000);
  do {
    auVar143 = vmovshdup_avx(local_860);
    fVar216 = auVar143._0_4_ - local_860._0_4_;
    auVar143 = vshufps_avx(local_860,local_860,0);
    local_720._16_16_ = auVar143;
    local_720._0_16_ = auVar143;
    auVar112 = vshufps_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),0);
    local_740._16_16_ = auVar112;
    local_740._0_16_ = auVar112;
    fVar320 = auVar112._0_4_;
    fVar171 = auVar112._4_4_;
    fVar173 = auVar112._8_4_;
    fVar175 = auVar112._12_4_;
    fVar176 = auVar143._0_4_;
    auVar209._0_4_ = fVar176 + fVar320 * 0.0;
    fVar197 = auVar143._4_4_;
    auVar209._4_4_ = fVar197 + fVar171 * 0.14285715;
    fVar198 = auVar143._8_4_;
    auVar209._8_4_ = fVar198 + fVar173 * 0.2857143;
    fVar199 = auVar143._12_4_;
    auVar209._12_4_ = fVar199 + fVar175 * 0.42857146;
    auVar209._16_4_ = fVar176 + fVar320 * 0.5714286;
    auVar209._20_4_ = fVar197 + fVar171 * 0.71428573;
    auVar209._24_4_ = fVar198 + fVar173 * 0.8571429;
    auVar209._28_4_ = fVar199 + fVar175;
    auVar124 = vsubps_avx(auVar252._0_32_,auVar209);
    fVar138 = auVar124._0_4_;
    fVar172 = auVar124._4_4_;
    fVar174 = auVar124._8_4_;
    fVar200 = auVar124._12_4_;
    fVar213 = auVar124._16_4_;
    fVar214 = auVar124._20_4_;
    fVar215 = auVar124._24_4_;
    fVar234 = fVar138 * fVar138 * fVar138;
    fVar274 = fVar172 * fVar172 * fVar172;
    fVar278 = fVar174 * fVar174 * fVar174;
    fVar282 = fVar200 * fVar200 * fVar200;
    fVar286 = fVar213 * fVar213 * fVar213;
    fVar290 = fVar214 * fVar214 * fVar214;
    fVar294 = fVar215 * fVar215 * fVar215;
    fVar299 = auVar209._0_4_ * auVar209._0_4_ * auVar209._0_4_;
    fVar309 = auVar209._4_4_ * auVar209._4_4_ * auVar209._4_4_;
    fVar310 = auVar209._8_4_ * auVar209._8_4_ * auVar209._8_4_;
    fVar312 = auVar209._12_4_ * auVar209._12_4_ * auVar209._12_4_;
    fVar314 = auVar209._16_4_ * auVar209._16_4_ * auVar209._16_4_;
    fVar316 = auVar209._20_4_ * auVar209._20_4_ * auVar209._20_4_;
    fVar318 = auVar209._24_4_ * auVar209._24_4_ * auVar209._24_4_;
    fVar233 = auVar209._0_4_ * fVar138;
    fVar236 = auVar209._4_4_ * fVar172;
    fVar253 = auVar209._8_4_ * fVar174;
    fVar254 = auVar209._12_4_ * fVar200;
    fVar255 = auVar209._16_4_ * fVar213;
    fVar257 = auVar209._20_4_ * fVar214;
    fVar259 = auVar209._24_4_ * fVar215;
    fVar235 = auVar355._28_4_ + auVar373._28_4_;
    fVar344 = auVar308._28_4_ + auVar252._28_4_ + fVar235;
    fVar351 = fVar235 + auVar273._28_4_ + auVar360._28_4_ + auVar347._28_4_;
    fVar235 = fVar234 * 0.16666667;
    fVar275 = fVar274 * 0.16666667;
    fVar279 = fVar278 * 0.16666667;
    fVar283 = fVar282 * 0.16666667;
    fVar287 = fVar286 * 0.16666667;
    fVar291 = fVar290 * 0.16666667;
    fVar295 = fVar294 * 0.16666667;
    fVar321 = (fVar299 + fVar234 * 4.0 + fVar138 * fVar233 * 12.0 + auVar209._0_4_ * fVar233 * 6.0)
              * 0.16666667;
    fVar332 = (fVar309 + fVar274 * 4.0 + fVar172 * fVar236 * 12.0 + auVar209._4_4_ * fVar236 * 6.0)
              * 0.16666667;
    fVar334 = (fVar310 + fVar278 * 4.0 + fVar174 * fVar253 * 12.0 + auVar209._8_4_ * fVar253 * 6.0)
              * 0.16666667;
    fVar336 = (fVar312 + fVar282 * 4.0 + fVar200 * fVar254 * 12.0 + auVar209._12_4_ * fVar254 * 6.0)
              * 0.16666667;
    fVar338 = (fVar314 + fVar286 * 4.0 + fVar213 * fVar255 * 12.0 + auVar209._16_4_ * fVar255 * 6.0)
              * 0.16666667;
    fVar340 = (fVar316 + fVar290 * 4.0 + fVar214 * fVar257 * 12.0 + auVar209._20_4_ * fVar257 * 6.0)
              * 0.16666667;
    fVar342 = (fVar318 + fVar294 * 4.0 + fVar215 * fVar259 * 12.0 + auVar209._24_4_ * fVar259 * 6.0)
              * 0.16666667;
    fVar234 = (fVar299 * 4.0 + fVar234 + auVar209._0_4_ * fVar233 * 12.0 + fVar138 * fVar233 * 6.0)
              * 0.16666667;
    fVar274 = (fVar309 * 4.0 + fVar274 + auVar209._4_4_ * fVar236 * 12.0 + fVar172 * fVar236 * 6.0)
              * 0.16666667;
    fVar278 = (fVar310 * 4.0 + fVar278 + auVar209._8_4_ * fVar253 * 12.0 + fVar174 * fVar253 * 6.0)
              * 0.16666667;
    fVar282 = (fVar312 * 4.0 + fVar282 + auVar209._12_4_ * fVar254 * 12.0 + fVar200 * fVar254 * 6.0)
              * 0.16666667;
    fVar286 = (fVar314 * 4.0 + fVar286 + auVar209._16_4_ * fVar255 * 12.0 + fVar213 * fVar255 * 6.0)
              * 0.16666667;
    fVar290 = (fVar316 * 4.0 + fVar290 + auVar209._20_4_ * fVar257 * 12.0 + fVar214 * fVar257 * 6.0)
              * 0.16666667;
    fVar294 = (fVar318 * 4.0 + fVar294 + auVar209._24_4_ * fVar259 * 12.0 + fVar215 * fVar259 * 6.0)
              * 0.16666667;
    fVar299 = fVar299 * 0.16666667;
    fVar309 = fVar309 * 0.16666667;
    fVar310 = fVar310 * 0.16666667;
    fVar312 = fVar312 * 0.16666667;
    fVar314 = fVar314 * 0.16666667;
    fVar316 = fVar316 * 0.16666667;
    fVar318 = fVar318 * 0.16666667;
    fVar367 = auVar360._28_4_ + 12.0;
    fVar352 = fVar351 + 12.166667;
    fVar322 = (float)local_1a0._0_4_ * fVar235 +
              fVar321 * (float)local_360._0_4_ +
              fVar299 * (float)local_400._0_4_ + fVar234 * (float)local_380._0_4_;
    fVar333 = (float)local_1a0._4_4_ * fVar275 +
              fVar332 * (float)local_360._4_4_ +
              fVar309 * (float)local_400._4_4_ + fVar274 * (float)local_380._4_4_;
    fVar335 = fStack_198 * fVar279 +
              fVar334 * fStack_358 + fVar310 * fStack_3f8 + fVar278 * fStack_378;
    fVar337 = fStack_194 * fVar283 +
              fVar336 * fStack_354 + fVar312 * fStack_3f4 + fVar282 * fStack_374;
    fVar339 = fStack_190 * fVar287 +
              fVar338 * fStack_350 + fVar314 * fStack_3f0 + fVar286 * fStack_370;
    fVar341 = fStack_18c * fVar291 +
              fVar340 * fStack_34c + fVar316 * fStack_3ec + fVar290 * fStack_36c;
    fVar343 = fStack_188 * fVar295 +
              fVar342 * fStack_348 + fVar318 * fStack_3e8 + fVar294 * fStack_368;
    fVar345 = fVar344 + fVar352;
    local_8c0 = (float)local_1c0._0_4_ * fVar235 +
                (float)local_220._0_4_ * fVar321 +
                fVar299 * (float)local_420._0_4_ + fVar234 * (float)local_3a0._0_4_;
    fStack_8bc = (float)local_1c0._4_4_ * fVar275 +
                 (float)local_220._4_4_ * fVar332 +
                 fVar309 * (float)local_420._4_4_ + fVar274 * (float)local_3a0._4_4_;
    fStack_8b8 = fStack_1b8 * fVar279 +
                 fStack_218 * fVar334 + fVar310 * fStack_418 + fVar278 * fStack_398;
    fStack_8b4 = fStack_1b4 * fVar283 +
                 fStack_214 * fVar336 + fVar312 * fStack_414 + fVar282 * fStack_394;
    fStack_8b0 = fStack_1b0 * fVar287 +
                 fStack_210 * fVar338 + fVar314 * fStack_410 + fVar286 * fStack_390;
    fStack_8ac = fStack_1ac * fVar291 +
                 fStack_20c * fVar340 + fVar316 * fStack_40c + fVar290 * fStack_38c;
    fStack_8a8 = fStack_1a8 * fVar295 +
                 fStack_208 * fVar342 + fVar318 * fStack_408 + fVar294 * fStack_388;
    fStack_8a4 = fVar345 + fVar367 + 12.166667;
    fVar100 = (float)local_1e0._0_4_ * fVar235 +
              (float)local_240._0_4_ * fVar321 +
              fVar299 * (float)local_440._0_4_ + fVar234 * (float)local_3c0._0_4_;
    fVar131 = (float)local_1e0._4_4_ * fVar275 +
              (float)local_240._4_4_ * fVar332 +
              fVar309 * (float)local_440._4_4_ + fVar274 * (float)local_3c0._4_4_;
    fVar132 = fStack_1d8 * fVar279 +
              fStack_238 * fVar334 + fVar310 * fStack_438 + fVar278 * fStack_3b8;
    fVar133 = fStack_1d4 * fVar283 +
              fStack_234 * fVar336 + fVar312 * fStack_434 + fVar282 * fStack_3b4;
    fVar134 = fStack_1d0 * fVar287 +
              fStack_230 * fVar338 + fVar314 * fStack_430 + fVar286 * fStack_3b0;
    fVar135 = fStack_1cc * fVar291 +
              fStack_22c * fVar340 + fVar316 * fStack_42c + fVar290 * fStack_3ac;
    fVar136 = fStack_1c8 * fVar295 +
              fStack_228 * fVar342 + fVar318 * fStack_428 + fVar294 * fStack_3a8;
    fVar367 = fStack_8a4 + fVar367 + auVar373._28_4_ + 12.0;
    local_ba0._0_4_ =
         (float)local_200._0_4_ * fVar235 +
         (float)local_260._0_4_ * fVar321 +
         fVar234 * (float)local_3e0._0_4_ + local_460._0_4_ * fVar299;
    local_ba0._4_4_ =
         (float)local_200._4_4_ * fVar275 +
         (float)local_260._4_4_ * fVar332 +
         fVar274 * (float)local_3e0._4_4_ + local_460._4_4_ * fVar309;
    fStack_b98 = fStack_1f8 * fVar279 +
                 fStack_258 * fVar334 + fVar278 * fStack_3d8 + local_460._8_4_ * fVar310;
    fStack_b94 = fStack_1f4 * fVar283 +
                 fStack_254 * fVar336 + fVar282 * fStack_3d4 + local_460._12_4_ * fVar312;
    fStack_b90 = fStack_1f0 * fVar287 +
                 fStack_250 * fVar338 + fVar286 * fStack_3d0 + local_460._16_4_ * fVar314;
    fStack_b8c = fStack_1ec * fVar291 +
                 fStack_24c * fVar340 + fVar290 * fStack_3cc + local_460._20_4_ * fVar316;
    fStack_b88 = fStack_1e8 * fVar295 +
                 fStack_248 * fVar342 + fVar294 * fStack_3c8 + local_460._24_4_ * fVar318;
    fStack_b84 = auVar273._28_4_ + fVar344 + fVar351 + auVar308._28_4_;
    auVar249._4_4_ = auVar209._4_4_ * -auVar209._4_4_;
    auVar249._0_4_ = auVar209._0_4_ * -auVar209._0_4_;
    auVar249._8_4_ = auVar209._8_4_ * -auVar209._8_4_;
    auVar249._12_4_ = auVar209._12_4_ * -auVar209._12_4_;
    auVar249._16_4_ = auVar209._16_4_ * -auVar209._16_4_;
    auVar249._20_4_ = auVar209._20_4_ * -auVar209._20_4_;
    auVar249._24_4_ = auVar209._24_4_ * -auVar209._24_4_;
    auVar249._28_4_ = auVar209._28_4_;
    auVar156._4_4_ = fVar236 * 4.0;
    auVar156._0_4_ = fVar233 * 4.0;
    auVar156._8_4_ = fVar253 * 4.0;
    auVar156._12_4_ = fVar254 * 4.0;
    auVar156._16_4_ = fVar255 * 4.0;
    auVar156._20_4_ = fVar257 * 4.0;
    auVar156._24_4_ = fVar259 * 4.0;
    auVar156._28_4_ = auVar252._28_4_;
    auVar124 = vsubps_avx(auVar249,auVar156);
    fVar279 = fVar138 * -fVar138 * 0.5;
    fVar291 = fVar172 * -fVar172 * 0.5;
    fVar294 = fVar174 * -fVar174 * 0.5;
    fVar295 = fVar200 * -fVar200 * 0.5;
    fVar299 = fVar213 * -fVar213 * 0.5;
    fVar310 = fVar214 * -fVar214 * 0.5;
    fVar312 = fVar215 * -fVar215 * 0.5;
    fVar235 = auVar124._0_4_ * 0.5;
    fVar275 = auVar124._4_4_ * 0.5;
    fVar278 = auVar124._8_4_ * 0.5;
    fVar282 = auVar124._12_4_ * 0.5;
    fVar283 = auVar124._16_4_ * 0.5;
    fVar286 = auVar124._20_4_ * 0.5;
    fVar287 = auVar124._24_4_ * 0.5;
    fVar234 = (fVar138 * fVar138 + fVar233 * 4.0) * 0.5;
    fVar236 = (fVar172 * fVar172 + fVar236 * 4.0) * 0.5;
    fVar253 = (fVar174 * fVar174 + fVar253 * 4.0) * 0.5;
    fVar254 = (fVar200 * fVar200 + fVar254 * 4.0) * 0.5;
    fVar255 = (fVar213 * fVar213 + fVar255 * 4.0) * 0.5;
    fVar274 = (fVar214 * fVar214 + fVar257 * 4.0) * 0.5;
    fVar259 = (fVar215 * fVar215 + fVar259 * 4.0) * 0.5;
    fVar138 = auVar209._0_4_ * auVar209._0_4_ * 0.5;
    fVar172 = auVar209._4_4_ * auVar209._4_4_ * 0.5;
    fVar174 = auVar209._8_4_ * auVar209._8_4_ * 0.5;
    fVar200 = auVar209._12_4_ * auVar209._12_4_ * 0.5;
    fVar213 = auVar209._16_4_ * auVar209._16_4_ * 0.5;
    fVar215 = auVar209._20_4_ * auVar209._20_4_ * 0.5;
    fVar233 = auVar209._24_4_ * auVar209._24_4_ * 0.5;
    fVar298 = fStack_8a4 + fVar352 + fVar352 + 4.0;
    auVar143 = vpermilps_avx(ZEXT416((uint)(fVar216 * 0.04761905)),0);
    fVar214 = auVar143._0_4_;
    fVar261 = fVar214 * ((float)local_1a0._0_4_ * fVar279 +
                        fVar235 * (float)local_360._0_4_ +
                        fVar234 * (float)local_380._0_4_ + fVar138 * (float)local_400._0_4_);
    fVar257 = auVar143._4_4_;
    fVar276 = fVar257 * ((float)local_1a0._4_4_ * fVar291 +
                        fVar275 * (float)local_360._4_4_ +
                        fVar236 * (float)local_380._4_4_ + fVar172 * (float)local_400._4_4_);
    local_8e0._4_4_ = fVar276;
    local_8e0._0_4_ = fVar261;
    fVar290 = auVar143._8_4_;
    fVar280 = fVar290 * (fStack_198 * fVar294 +
                        fVar278 * fStack_358 + fVar253 * fStack_378 + fVar174 * fStack_3f8);
    local_8e0._8_4_ = fVar280;
    fVar318 = auVar143._12_4_;
    fVar284 = fVar318 * (fStack_194 * fVar295 +
                        fVar282 * fStack_354 + fVar254 * fStack_374 + fVar200 * fStack_3f4);
    local_8e0._12_4_ = fVar284;
    fVar288 = fVar214 * (fStack_190 * fVar299 +
                        fVar283 * fStack_350 + fVar255 * fStack_370 + fVar213 * fStack_3f0);
    local_8e0._16_4_ = fVar288;
    fVar292 = fVar257 * (fStack_18c * fVar310 +
                        fVar286 * fStack_34c + fVar274 * fStack_36c + fVar215 * fStack_3ec);
    local_8e0._20_4_ = fVar292;
    fVar296 = fVar290 * (fStack_188 * fVar312 +
                        fVar287 * fStack_348 + fVar259 * fStack_368 + fVar233 * fStack_3e8);
    local_8e0._24_4_ = fVar296;
    local_8e0._28_4_ = fVar298;
    fVar368 = fVar214 * ((float)local_1c0._0_4_ * fVar279 +
                        (float)local_220._0_4_ * fVar235 +
                        fVar234 * (float)local_3a0._0_4_ + fVar138 * (float)local_420._0_4_);
    fVar374 = fVar257 * ((float)local_1c0._4_4_ * fVar291 +
                        (float)local_220._4_4_ * fVar275 +
                        fVar236 * (float)local_3a0._4_4_ + fVar172 * (float)local_420._4_4_);
    auVar27._4_4_ = fVar374;
    auVar27._0_4_ = fVar368;
    fVar375 = fVar290 * (fStack_1b8 * fVar294 +
                        fStack_218 * fVar278 + fVar253 * fStack_398 + fVar174 * fStack_418);
    auVar27._8_4_ = fVar375;
    fVar376 = fVar318 * (fStack_1b4 * fVar295 +
                        fStack_214 * fVar282 + fVar254 * fStack_394 + fVar200 * fStack_414);
    auVar27._12_4_ = fVar376;
    fVar377 = fVar214 * (fStack_1b0 * fVar299 +
                        fStack_210 * fVar283 + fVar255 * fStack_390 + fVar213 * fStack_410);
    auVar27._16_4_ = fVar377;
    fVar378 = fVar257 * (fStack_1ac * fVar310 +
                        fStack_20c * fVar286 + fVar274 * fStack_38c + fVar215 * fStack_40c);
    auVar27._20_4_ = fVar378;
    fVar379 = fVar290 * (fStack_1a8 * fVar312 +
                        fStack_208 * fVar287 + fVar259 * fStack_388 + fVar233 * fStack_408);
    auVar27._24_4_ = fVar379;
    auVar27._28_4_ = uStack_184;
    fVar380 = fVar214 * ((float)local_1e0._0_4_ * fVar279 +
                        fVar138 * (float)local_440._0_4_ + fVar234 * (float)local_3c0._0_4_ +
                        (float)local_240._0_4_ * fVar235);
    fVar389 = fVar257 * ((float)local_1e0._4_4_ * fVar291 +
                        fVar172 * (float)local_440._4_4_ + fVar236 * (float)local_3c0._4_4_ +
                        (float)local_240._4_4_ * fVar275);
    auVar24._4_4_ = fVar389;
    auVar24._0_4_ = fVar380;
    fVar391 = fVar290 * (fStack_1d8 * fVar294 +
                        fVar174 * fStack_438 + fVar253 * fStack_3b8 + fStack_238 * fVar278);
    auVar24._8_4_ = fVar391;
    fVar393 = fVar318 * (fStack_1d4 * fVar295 +
                        fVar200 * fStack_434 + fVar254 * fStack_3b4 + fStack_234 * fVar282);
    auVar24._12_4_ = fVar393;
    fVar395 = fVar214 * (fStack_1d0 * fVar299 +
                        fVar213 * fStack_430 + fVar255 * fStack_3b0 + fStack_230 * fVar283);
    auVar24._16_4_ = fVar395;
    fVar397 = fVar257 * (fStack_1cc * fVar310 +
                        fVar215 * fStack_42c + fVar274 * fStack_3ac + fStack_22c * fVar286);
    auVar24._20_4_ = fVar397;
    fVar399 = fVar290 * (fStack_1c8 * fVar312 +
                        fVar233 * fStack_428 + fVar259 * fStack_3a8 + fStack_228 * fVar287);
    auVar24._24_4_ = fVar399;
    auVar24._28_4_ = uStack_1a4;
    fVar235 = fVar214 * ((float)local_200._0_4_ * fVar279 +
                        (float)local_260._0_4_ * fVar235 +
                        fVar138 * local_460._0_4_ + fVar234 * (float)local_3e0._0_4_);
    fVar279 = fVar257 * ((float)local_200._4_4_ * fVar291 +
                        (float)local_260._4_4_ * fVar275 +
                        fVar172 * local_460._4_4_ + fVar236 * (float)local_3e0._4_4_);
    auVar22._4_4_ = fVar279;
    auVar22._0_4_ = fVar235;
    fVar309 = fVar290 * (fStack_1f8 * fVar294 +
                        fStack_258 * fVar278 + fVar174 * local_460._8_4_ + fVar253 * fStack_3d8);
    auVar22._8_4_ = fVar309;
    fVar334 = fVar318 * (fStack_1f4 * fVar295 +
                        fStack_254 * fVar282 + fVar200 * local_460._12_4_ + fVar254 * fStack_3d4);
    auVar22._12_4_ = fVar334;
    fVar214 = fVar214 * (fStack_1f0 * fVar299 +
                        fStack_250 * fVar283 + fVar213 * local_460._16_4_ + fVar255 * fStack_3d0);
    auVar22._16_4_ = fVar214;
    fVar257 = fVar257 * (fStack_1ec * fVar310 +
                        fStack_24c * fVar286 + fVar215 * local_460._20_4_ + fVar274 * fStack_3cc);
    auVar22._20_4_ = fVar257;
    fVar290 = fVar290 * (fStack_1e8 * fVar312 +
                        fStack_248 * fVar287 + fVar233 * local_460._24_4_ + fVar259 * fStack_3c8);
    auVar22._24_4_ = fVar290;
    auVar22._28_4_ = fVar318;
    auVar85._4_4_ = fStack_8bc;
    auVar85._0_4_ = local_8c0;
    auVar85._8_4_ = fStack_8b8;
    auVar85._12_4_ = fStack_8b4;
    auVar85._16_4_ = fStack_8b0;
    auVar85._20_4_ = fStack_8ac;
    auVar85._24_4_ = fStack_8a8;
    auVar85._28_4_ = fStack_8a4;
    auVar124 = vperm2f128_avx(auVar85,auVar85,1);
    auVar124 = vshufps_avx(auVar124,auVar85,0x30);
    _local_a20 = vshufps_avx(auVar85,auVar124,0x29);
    auVar80._4_4_ = fVar131;
    auVar80._0_4_ = fVar100;
    auVar80._8_4_ = fVar132;
    auVar80._12_4_ = fVar133;
    auVar80._16_4_ = fVar134;
    auVar80._20_4_ = fVar135;
    auVar80._24_4_ = fVar136;
    auVar80._28_4_ = fVar367;
    auVar124 = vperm2f128_avx(auVar80,auVar80,1);
    auVar124 = vshufps_avx(auVar124,auVar80,0x30);
    auVar209 = vshufps_avx(auVar80,auVar124,0x29);
    auVar119 = vsubps_avx(_local_ba0,auVar22);
    auVar124 = vperm2f128_avx(auVar119,auVar119,1);
    auVar124 = vshufps_avx(auVar124,auVar119,0x30);
    _local_760 = vshufps_avx(auVar119,auVar124,0x29);
    auVar249 = vsubps_avx(_local_a20,auVar85);
    auVar156 = vsubps_avx(auVar209,auVar80);
    fVar172 = auVar249._0_4_;
    fVar215 = auVar249._4_4_;
    auVar23._4_4_ = fVar389 * fVar215;
    auVar23._0_4_ = fVar380 * fVar172;
    fVar236 = auVar249._8_4_;
    auVar23._8_4_ = fVar391 * fVar236;
    fVar274 = auVar249._12_4_;
    auVar23._12_4_ = fVar393 * fVar274;
    fVar282 = auVar249._16_4_;
    auVar23._16_4_ = fVar395 * fVar282;
    fVar291 = auVar249._20_4_;
    auVar23._20_4_ = fVar397 * fVar291;
    fVar310 = auVar249._24_4_;
    auVar23._24_4_ = fVar399 * fVar310;
    auVar23._28_4_ = auVar119._28_4_;
    fVar174 = auVar156._0_4_;
    fVar216 = auVar156._4_4_;
    auVar387._4_4_ = fVar374 * fVar216;
    auVar387._0_4_ = fVar368 * fVar174;
    fVar253 = auVar156._8_4_;
    auVar387._8_4_ = fVar375 * fVar253;
    fVar259 = auVar156._12_4_;
    auVar387._12_4_ = fVar376 * fVar259;
    fVar283 = auVar156._16_4_;
    auVar387._16_4_ = fVar377 * fVar283;
    fVar294 = auVar156._20_4_;
    auVar387._20_4_ = fVar378 * fVar294;
    fVar312 = auVar156._24_4_;
    auVar387._24_4_ = fVar379 * fVar312;
    auVar387._28_4_ = auVar124._28_4_;
    auVar156 = vsubps_avx(auVar387,auVar23);
    auVar78._4_4_ = fVar333;
    auVar78._0_4_ = fVar322;
    auVar78._8_4_ = fVar335;
    auVar78._12_4_ = fVar337;
    auVar78._16_4_ = fVar339;
    auVar78._20_4_ = fVar341;
    auVar78._24_4_ = fVar343;
    auVar78._28_4_ = fVar345;
    auVar124 = vperm2f128_avx(auVar78,auVar78,1);
    auVar124 = vshufps_avx(auVar124,auVar78,0x30);
    local_700 = vshufps_avx(auVar78,auVar124,0x29);
    auVar119 = vsubps_avx(local_700,auVar78);
    auVar158._4_4_ = fVar216 * fVar276;
    auVar158._0_4_ = fVar174 * fVar261;
    auVar158._8_4_ = fVar253 * fVar280;
    auVar158._12_4_ = fVar259 * fVar284;
    auVar158._16_4_ = fVar283 * fVar288;
    auVar158._20_4_ = fVar294 * fVar292;
    auVar158._24_4_ = fVar312 * fVar296;
    auVar158._28_4_ = local_700._28_4_;
    fVar200 = auVar119._0_4_;
    fVar233 = auVar119._4_4_;
    auVar25._4_4_ = fVar389 * fVar233;
    auVar25._0_4_ = fVar380 * fVar200;
    fVar254 = auVar119._8_4_;
    auVar25._8_4_ = fVar391 * fVar254;
    fVar275 = auVar119._12_4_;
    auVar25._12_4_ = fVar393 * fVar275;
    fVar286 = auVar119._16_4_;
    auVar25._16_4_ = fVar395 * fVar286;
    fVar295 = auVar119._20_4_;
    auVar25._20_4_ = fVar397 * fVar295;
    fVar314 = auVar119._24_4_;
    auVar25._24_4_ = fVar399 * fVar314;
    auVar25._28_4_ = fVar345;
    auVar22 = vsubps_avx(auVar25,auVar158);
    auVar157._4_4_ = fVar374 * fVar233;
    auVar157._0_4_ = fVar368 * fVar200;
    auVar157._8_4_ = fVar375 * fVar254;
    auVar157._12_4_ = fVar376 * fVar275;
    auVar157._16_4_ = fVar377 * fVar286;
    auVar157._20_4_ = fVar378 * fVar295;
    auVar157._24_4_ = fVar379 * fVar314;
    auVar157._28_4_ = fVar345;
    auVar330._4_4_ = fVar276 * fVar215;
    auVar330._0_4_ = fVar261 * fVar172;
    auVar330._8_4_ = fVar280 * fVar236;
    auVar330._12_4_ = fVar284 * fVar274;
    auVar330._16_4_ = fVar288 * fVar282;
    auVar330._20_4_ = fVar292 * fVar291;
    auVar330._24_4_ = fVar296 * fVar310;
    auVar330._28_4_ = uStack_1c4;
    auVar23 = vsubps_avx(auVar330,auVar157);
    fVar138 = auVar23._28_4_;
    auVar155._0_4_ = fVar200 * fVar200 + fVar172 * fVar172 + fVar174 * fVar174;
    auVar155._4_4_ = fVar233 * fVar233 + fVar215 * fVar215 + fVar216 * fVar216;
    auVar155._8_4_ = fVar254 * fVar254 + fVar236 * fVar236 + fVar253 * fVar253;
    auVar155._12_4_ = fVar275 * fVar275 + fVar274 * fVar274 + fVar259 * fVar259;
    auVar155._16_4_ = fVar286 * fVar286 + fVar282 * fVar282 + fVar283 * fVar283;
    auVar155._20_4_ = fVar295 * fVar295 + fVar291 * fVar291 + fVar294 * fVar294;
    auVar155._24_4_ = fVar314 * fVar314 + fVar310 * fVar310 + fVar312 * fVar312;
    auVar155._28_4_ = fVar138 + fVar138 + auVar156._28_4_;
    auVar124 = vrcpps_avx(auVar155);
    fVar336 = auVar124._0_4_;
    fVar338 = auVar124._4_4_;
    auVar386._4_4_ = fVar338 * auVar155._4_4_;
    auVar386._0_4_ = fVar336 * auVar155._0_4_;
    fVar340 = auVar124._8_4_;
    auVar386._8_4_ = fVar340 * auVar155._8_4_;
    fVar342 = auVar124._12_4_;
    auVar386._12_4_ = fVar342 * auVar155._12_4_;
    fVar344 = auVar124._16_4_;
    auVar386._16_4_ = fVar344 * auVar155._16_4_;
    fVar351 = auVar124._20_4_;
    auVar386._20_4_ = fVar351 * auVar155._20_4_;
    fVar352 = auVar124._24_4_;
    auVar386._24_4_ = fVar352 * auVar155._24_4_;
    auVar386._28_4_ = uStack_1c4;
    auVar402._8_4_ = 0x3f800000;
    auVar402._0_8_ = &DAT_3f8000003f800000;
    auVar402._12_4_ = 0x3f800000;
    auVar402._16_4_ = 0x3f800000;
    auVar402._20_4_ = 0x3f800000;
    auVar402._24_4_ = 0x3f800000;
    auVar402._28_4_ = 0x3f800000;
    auVar387 = vsubps_avx(auVar402,auVar386);
    fVar336 = auVar387._0_4_ * fVar336 + fVar336;
    fVar338 = auVar387._4_4_ * fVar338 + fVar338;
    fVar340 = auVar387._8_4_ * fVar340 + fVar340;
    fVar342 = auVar387._12_4_ * fVar342 + fVar342;
    fVar344 = auVar387._16_4_ * fVar344 + fVar344;
    fVar351 = auVar387._20_4_ * fVar351 + fVar351;
    fVar352 = auVar387._24_4_ * fVar352 + fVar352;
    auVar249 = vperm2f128_avx(auVar27,auVar27,1);
    auVar249 = vshufps_avx(auVar249,auVar27,0x30);
    local_ac0 = vshufps_avx(auVar27,auVar249,0x29);
    auVar249 = vperm2f128_avx(auVar24,auVar24,1);
    auVar249 = vshufps_avx(auVar249,auVar24,0x30);
    local_9e0 = vshufps_avx(auVar24,auVar249,0x29);
    fVar381 = local_9e0._0_4_;
    fVar390 = local_9e0._4_4_;
    auVar26._4_4_ = fVar390 * fVar215;
    auVar26._0_4_ = fVar381 * fVar172;
    fVar392 = local_9e0._8_4_;
    auVar26._8_4_ = fVar392 * fVar236;
    fVar394 = local_9e0._12_4_;
    auVar26._12_4_ = fVar394 * fVar274;
    fVar396 = local_9e0._16_4_;
    auVar26._16_4_ = fVar396 * fVar282;
    fVar398 = local_9e0._20_4_;
    auVar26._20_4_ = fVar398 * fVar291;
    fVar400 = local_9e0._24_4_;
    auVar26._24_4_ = fVar400 * fVar310;
    auVar26._28_4_ = auVar249._28_4_;
    fVar401 = local_ac0._0_4_;
    fVar405 = local_ac0._4_4_;
    auVar28._4_4_ = fVar405 * fVar216;
    auVar28._0_4_ = fVar401 * fVar174;
    fVar406 = local_ac0._8_4_;
    auVar28._8_4_ = fVar406 * fVar253;
    fVar407 = local_ac0._12_4_;
    auVar28._12_4_ = fVar407 * fVar259;
    fVar408 = local_ac0._16_4_;
    auVar28._16_4_ = fVar408 * fVar283;
    fVar409 = local_ac0._20_4_;
    auVar28._20_4_ = fVar409 * fVar294;
    fVar410 = local_ac0._24_4_;
    auVar28._24_4_ = fVar410 * fVar312;
    auVar28._28_4_ = uStack_184;
    auVar24 = vsubps_avx(auVar28,auVar26);
    auVar249 = vperm2f128_avx(local_8e0,local_8e0,1);
    auVar249 = vshufps_avx(auVar249,local_8e0,0x30);
    local_9c0 = vshufps_avx(local_8e0,auVar249,0x29);
    fVar213 = local_9c0._0_4_;
    fVar234 = local_9c0._4_4_;
    auVar29._4_4_ = fVar216 * fVar234;
    auVar29._0_4_ = fVar174 * fVar213;
    fVar255 = local_9c0._8_4_;
    auVar29._8_4_ = fVar253 * fVar255;
    fVar278 = local_9c0._12_4_;
    auVar29._12_4_ = fVar259 * fVar278;
    fVar287 = local_9c0._16_4_;
    auVar29._16_4_ = fVar283 * fVar287;
    fVar299 = local_9c0._20_4_;
    auVar29._20_4_ = fVar294 * fVar299;
    fVar316 = local_9c0._24_4_;
    auVar29._24_4_ = fVar312 * fVar316;
    auVar29._28_4_ = auVar249._28_4_;
    auVar30._4_4_ = fVar390 * fVar233;
    auVar30._0_4_ = fVar381 * fVar200;
    auVar30._8_4_ = fVar392 * fVar254;
    auVar30._12_4_ = fVar394 * fVar275;
    auVar30._16_4_ = fVar396 * fVar286;
    auVar30._20_4_ = fVar398 * fVar295;
    uVar90 = local_9e0._28_4_;
    auVar30._24_4_ = fVar400 * fVar314;
    auVar30._28_4_ = uVar90;
    auVar158 = vsubps_avx(auVar30,auVar29);
    auVar31._4_4_ = fVar405 * fVar233;
    auVar31._0_4_ = fVar401 * fVar200;
    auVar31._8_4_ = fVar406 * fVar254;
    auVar31._12_4_ = fVar407 * fVar275;
    auVar31._16_4_ = fVar408 * fVar286;
    auVar31._20_4_ = fVar409 * fVar295;
    auVar31._24_4_ = fVar410 * fVar314;
    auVar31._28_4_ = uVar90;
    auVar32._4_4_ = fVar234 * fVar215;
    auVar32._0_4_ = fVar213 * fVar172;
    auVar32._8_4_ = fVar255 * fVar236;
    auVar32._12_4_ = fVar278 * fVar274;
    auVar32._16_4_ = fVar287 * fVar282;
    auVar32._20_4_ = fVar299 * fVar291;
    fVar321 = local_ac0._28_4_;
    auVar32._24_4_ = fVar316 * fVar310;
    auVar32._28_4_ = fVar321;
    auVar249 = vsubps_avx(auVar32,auVar31);
    fVar332 = auVar249._28_4_;
    auVar33._4_4_ =
         (auVar156._4_4_ * auVar156._4_4_ +
         auVar22._4_4_ * auVar22._4_4_ + auVar23._4_4_ * auVar23._4_4_) * fVar338;
    auVar33._0_4_ =
         (auVar156._0_4_ * auVar156._0_4_ +
         auVar22._0_4_ * auVar22._0_4_ + auVar23._0_4_ * auVar23._0_4_) * fVar336;
    auVar33._8_4_ =
         (auVar156._8_4_ * auVar156._8_4_ +
         auVar22._8_4_ * auVar22._8_4_ + auVar23._8_4_ * auVar23._8_4_) * fVar340;
    auVar33._12_4_ =
         (auVar156._12_4_ * auVar156._12_4_ +
         auVar22._12_4_ * auVar22._12_4_ + auVar23._12_4_ * auVar23._12_4_) * fVar342;
    auVar33._16_4_ =
         (auVar156._16_4_ * auVar156._16_4_ +
         auVar22._16_4_ * auVar22._16_4_ + auVar23._16_4_ * auVar23._16_4_) * fVar344;
    auVar33._20_4_ =
         (auVar156._20_4_ * auVar156._20_4_ +
         auVar22._20_4_ * auVar22._20_4_ + auVar23._20_4_ * auVar23._20_4_) * fVar351;
    auVar33._24_4_ =
         (auVar156._24_4_ * auVar156._24_4_ +
         auVar22._24_4_ * auVar22._24_4_ + auVar23._24_4_ * auVar23._24_4_) * fVar352;
    auVar33._28_4_ = auVar156._28_4_ + auVar22._28_4_ + fVar138;
    auVar34._4_4_ =
         (auVar24._4_4_ * auVar24._4_4_ +
         auVar158._4_4_ * auVar158._4_4_ + auVar249._4_4_ * auVar249._4_4_) * fVar338;
    auVar34._0_4_ =
         (auVar24._0_4_ * auVar24._0_4_ +
         auVar158._0_4_ * auVar158._0_4_ + auVar249._0_4_ * auVar249._0_4_) * fVar336;
    auVar34._8_4_ =
         (auVar24._8_4_ * auVar24._8_4_ +
         auVar158._8_4_ * auVar158._8_4_ + auVar249._8_4_ * auVar249._8_4_) * fVar340;
    auVar34._12_4_ =
         (auVar24._12_4_ * auVar24._12_4_ +
         auVar158._12_4_ * auVar158._12_4_ + auVar249._12_4_ * auVar249._12_4_) * fVar342;
    auVar34._16_4_ =
         (auVar24._16_4_ * auVar24._16_4_ +
         auVar158._16_4_ * auVar158._16_4_ + auVar249._16_4_ * auVar249._16_4_) * fVar344;
    auVar34._20_4_ =
         (auVar24._20_4_ * auVar24._20_4_ +
         auVar158._20_4_ * auVar158._20_4_ + auVar249._20_4_ * auVar249._20_4_) * fVar351;
    auVar34._24_4_ =
         (auVar24._24_4_ * auVar24._24_4_ +
         auVar158._24_4_ * auVar158._24_4_ + auVar249._24_4_ * auVar249._24_4_) * fVar352;
    auVar34._28_4_ = auVar387._28_4_ + auVar124._28_4_;
    auVar124 = vmaxps_avx(auVar33,auVar34);
    auVar249 = vperm2f128_avx(_local_ba0,_local_ba0,1);
    auVar249 = vshufps_avx(auVar249,_local_ba0,0x30);
    local_780 = vshufps_avx(_local_ba0,auVar249,0x29);
    auVar120._0_4_ = (float)local_ba0._0_4_ + fVar235;
    auVar120._4_4_ = (float)local_ba0._4_4_ + fVar279;
    auVar120._8_4_ = fStack_b98 + fVar309;
    auVar120._12_4_ = fStack_b94 + fVar334;
    auVar120._16_4_ = fStack_b90 + fVar214;
    auVar120._20_4_ = fStack_b8c + fVar257;
    auVar120._24_4_ = fStack_b88 + fVar290;
    auVar120._28_4_ = fStack_b84 + fVar318;
    auVar249 = vmaxps_avx(_local_ba0,auVar120);
    auVar156 = vmaxps_avx(_local_760,local_780);
    auVar249 = vmaxps_avx(auVar249,auVar156);
    auVar156 = vrsqrtps_avx(auVar155);
    fVar138 = auVar156._0_4_;
    fVar214 = auVar156._4_4_;
    fVar235 = auVar156._8_4_;
    fVar257 = auVar156._12_4_;
    fVar279 = auVar156._16_4_;
    fVar290 = auVar156._20_4_;
    fVar309 = auVar156._24_4_;
    auVar35._4_4_ = fVar214 * fVar214 * fVar214 * auVar155._4_4_ * 0.5;
    auVar35._0_4_ = fVar138 * fVar138 * fVar138 * auVar155._0_4_ * 0.5;
    auVar35._8_4_ = fVar235 * fVar235 * fVar235 * auVar155._8_4_ * 0.5;
    auVar35._12_4_ = fVar257 * fVar257 * fVar257 * auVar155._12_4_ * 0.5;
    auVar35._16_4_ = fVar279 * fVar279 * fVar279 * auVar155._16_4_ * 0.5;
    auVar35._20_4_ = fVar290 * fVar290 * fVar290 * auVar155._20_4_ * 0.5;
    auVar35._24_4_ = fVar309 * fVar309 * fVar309 * auVar155._24_4_ * 0.5;
    auVar35._28_4_ = auVar155._28_4_;
    auVar36._4_4_ = fVar214 * 1.5;
    auVar36._0_4_ = fVar138 * 1.5;
    auVar36._8_4_ = fVar235 * 1.5;
    auVar36._12_4_ = fVar257 * 1.5;
    auVar36._16_4_ = fVar279 * 1.5;
    auVar36._20_4_ = fVar290 * 1.5;
    auVar36._24_4_ = fVar309 * 1.5;
    auVar36._28_4_ = auVar156._28_4_;
    auVar22 = vsubps_avx(auVar36,auVar35);
    auVar156 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar23 = vsubps_avx(auVar156,auVar85);
    auVar387 = vsubps_avx(auVar156,auVar80);
    fVar214 = auVar387._0_4_;
    fVar235 = auVar387._4_4_;
    fVar257 = auVar387._8_4_;
    fVar279 = auVar387._12_4_;
    fVar290 = auVar387._16_4_;
    fVar309 = auVar387._20_4_;
    fVar318 = auVar387._24_4_;
    fVar356 = auVar23._0_4_;
    fVar361 = auVar23._4_4_;
    fVar362 = auVar23._8_4_;
    fVar363 = auVar23._12_4_;
    fVar364 = auVar23._16_4_;
    fVar365 = auVar23._20_4_;
    fVar366 = auVar23._24_4_;
    auVar79._4_4_ = fVar333;
    auVar79._0_4_ = fVar322;
    auVar79._8_4_ = fVar335;
    auVar79._12_4_ = fVar337;
    auVar79._16_4_ = fVar339;
    auVar79._20_4_ = fVar341;
    auVar79._24_4_ = fVar343;
    auVar79._28_4_ = fVar345;
    auVar157 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar156 = vsubps_avx(auVar157,auVar79);
    fVar411 = auVar156._0_4_;
    fVar414 = auVar156._4_4_;
    fVar415 = auVar156._8_4_;
    fVar416 = auVar156._12_4_;
    fVar417 = auVar156._16_4_;
    fVar418 = auVar156._20_4_;
    fVar419 = auVar156._24_4_;
    auVar371._0_4_ =
         fVar411 * (float)local_7a0._0_4_ +
         fVar356 * (float)local_a40._0_4_ + (float)local_8a0._0_4_ * fVar214;
    auVar371._4_4_ =
         fVar414 * (float)local_7a0._4_4_ +
         fVar361 * (float)local_a40._4_4_ + (float)local_8a0._4_4_ * fVar235;
    auVar371._8_4_ = fVar415 * fStack_798 + fVar362 * fStack_a38 + fStack_898 * fVar257;
    auVar371._12_4_ = fVar416 * fStack_794 + fVar363 * fStack_a34 + fStack_894 * fVar279;
    auVar371._16_4_ = fVar417 * fStack_790 + fVar364 * fStack_a30 + fStack_890 * fVar290;
    auVar371._20_4_ = fVar418 * fStack_78c + fVar365 * fStack_a2c + fStack_88c * fVar309;
    auVar371._24_4_ = fVar419 * fStack_788 + fVar366 * fStack_a28 + fStack_888 * fVar318;
    auVar371._28_4_ = fVar332 + fVar332 + auVar158._28_4_ + fVar332;
    auVar384._0_4_ = fVar411 * fVar411 + fVar356 * fVar356 + fVar214 * fVar214;
    auVar384._4_4_ = fVar414 * fVar414 + fVar361 * fVar361 + fVar235 * fVar235;
    auVar384._8_4_ = fVar415 * fVar415 + fVar362 * fVar362 + fVar257 * fVar257;
    auVar384._12_4_ = fVar416 * fVar416 + fVar363 * fVar363 + fVar279 * fVar279;
    auVar384._16_4_ = fVar417 * fVar417 + fVar364 * fVar364 + fVar290 * fVar290;
    auVar384._20_4_ = fVar418 * fVar418 + fVar365 * fVar365 + fVar309 * fVar309;
    auVar384._24_4_ = fVar419 * fVar419 + fVar366 * fVar366 + fVar318 * fVar318;
    auVar384._28_4_ = fVar321 + fVar321 + fVar332;
    fVar342 = auVar22._0_4_;
    fVar344 = auVar22._4_4_;
    fVar351 = auVar22._8_4_;
    fVar352 = auVar22._12_4_;
    fVar256 = auVar22._16_4_;
    fVar258 = auVar22._20_4_;
    fVar260 = auVar22._24_4_;
    local_a00._0_4_ =
         (float)local_7a0._0_4_ * fVar200 * fVar342 +
         fVar342 * fVar172 * (float)local_a40._0_4_ + fVar174 * fVar342 * (float)local_8a0._0_4_;
    local_a00._4_4_ =
         (float)local_7a0._4_4_ * fVar233 * fVar344 +
         fVar344 * fVar215 * (float)local_a40._4_4_ + fVar216 * fVar344 * (float)local_8a0._4_4_;
    fStack_9f8 = fStack_798 * fVar254 * fVar351 +
                 fVar351 * fVar236 * fStack_a38 + fVar253 * fVar351 * fStack_898;
    fStack_9f4 = fStack_794 * fVar275 * fVar352 +
                 fVar352 * fVar274 * fStack_a34 + fVar259 * fVar352 * fStack_894;
    fStack_9f0 = fStack_790 * fVar286 * fVar256 +
                 fVar256 * fVar282 * fStack_a30 + fVar283 * fVar256 * fStack_890;
    fStack_9ec = fStack_78c * fVar295 * fVar258 +
                 fVar258 * fVar291 * fStack_a2c + fVar294 * fVar258 * fStack_88c;
    fStack_9e8 = fStack_788 * fVar314 * fVar260 +
                 fVar260 * fVar310 * fStack_a28 + fVar312 * fVar260 * fStack_888;
    fStack_9e4 = fStack_784 + fStack_a24 + fStack_884;
    fVar138 = fStack_784 + fStack_a24 + fStack_884;
    local_960._0_4_ =
         fVar411 * fVar200 * fVar342 + fVar356 * fVar342 * fVar172 + fVar174 * fVar342 * fVar214;
    local_960._4_4_ =
         fVar414 * fVar233 * fVar344 + fVar361 * fVar344 * fVar215 + fVar216 * fVar344 * fVar235;
    local_960._8_4_ =
         fVar415 * fVar254 * fVar351 + fVar362 * fVar351 * fVar236 + fVar253 * fVar351 * fVar257;
    local_960._12_4_ =
         fVar416 * fVar275 * fVar352 + fVar363 * fVar352 * fVar274 + fVar259 * fVar352 * fVar279;
    local_960._16_4_ =
         fVar417 * fVar286 * fVar256 + fVar364 * fVar256 * fVar282 + fVar283 * fVar256 * fVar290;
    local_960._20_4_ =
         fVar418 * fVar295 * fVar258 + fVar365 * fVar258 * fVar291 + fVar294 * fVar258 * fVar309;
    local_960._24_4_ =
         fVar419 * fVar314 * fVar260 + fVar366 * fVar260 * fVar310 + fVar312 * fVar260 * fVar318;
    local_960._28_4_ = fStack_a24 + fVar138;
    auVar37._4_4_ = (float)local_a00._4_4_ * local_960._4_4_;
    auVar37._0_4_ = (float)local_a00._0_4_ * (float)local_960._0_4_;
    auVar37._8_4_ = fStack_9f8 * local_960._8_4_;
    auVar37._12_4_ = fStack_9f4 * local_960._12_4_;
    auVar37._16_4_ = fStack_9f0 * local_960._16_4_;
    auVar37._20_4_ = fStack_9ec * local_960._20_4_;
    auVar37._24_4_ = fStack_9e8 * local_960._24_4_;
    auVar37._28_4_ = fVar138;
    auVar24 = vsubps_avx(auVar371,auVar37);
    auVar38._4_4_ = local_960._4_4_ * local_960._4_4_;
    auVar38._0_4_ = (float)local_960._0_4_ * (float)local_960._0_4_;
    auVar38._8_4_ = local_960._8_4_ * local_960._8_4_;
    auVar38._12_4_ = local_960._12_4_ * local_960._12_4_;
    auVar38._16_4_ = local_960._16_4_ * local_960._16_4_;
    auVar38._20_4_ = local_960._20_4_ * local_960._20_4_;
    auVar38._24_4_ = local_960._24_4_ * local_960._24_4_;
    auVar38._28_4_ = fStack_a24;
    auVar158 = vsubps_avx(auVar384,auVar38);
    auVar156 = vsqrtps_avx(auVar124);
    fVar138 = (auVar156._0_4_ + auVar249._0_4_) * 1.0000002;
    fVar321 = (auVar156._4_4_ + auVar249._4_4_) * 1.0000002;
    fVar332 = (auVar156._8_4_ + auVar249._8_4_) * 1.0000002;
    fVar334 = (auVar156._12_4_ + auVar249._12_4_) * 1.0000002;
    fVar336 = (auVar156._16_4_ + auVar249._16_4_) * 1.0000002;
    fVar338 = (auVar156._20_4_ + auVar249._20_4_) * 1.0000002;
    fVar340 = (auVar156._24_4_ + auVar249._24_4_) * 1.0000002;
    auVar39._4_4_ = fVar321 * fVar321;
    auVar39._0_4_ = fVar138 * fVar138;
    auVar39._8_4_ = fVar332 * fVar332;
    auVar39._12_4_ = fVar334 * fVar334;
    auVar39._16_4_ = fVar336 * fVar336;
    auVar39._20_4_ = fVar338 * fVar338;
    auVar39._24_4_ = fVar340 * fVar340;
    auVar39._28_4_ = auVar156._28_4_ + auVar249._28_4_;
    fVar321 = auVar24._0_4_ + auVar24._0_4_;
    fVar332 = auVar24._4_4_ + auVar24._4_4_;
    local_2c0._0_8_ = CONCAT44(fVar332,fVar321);
    local_2c0._8_4_ = auVar24._8_4_ + auVar24._8_4_;
    local_2c0._12_4_ = auVar24._12_4_ + auVar24._12_4_;
    local_2c0._16_4_ = auVar24._16_4_ + auVar24._16_4_;
    local_2c0._20_4_ = auVar24._20_4_ + auVar24._20_4_;
    local_2c0._24_4_ = auVar24._24_4_ + auVar24._24_4_;
    fVar138 = auVar24._28_4_;
    local_2c0._28_4_ = fVar138 + fVar138;
    auVar24 = vsubps_avx(auVar158,auVar39);
    auVar40._4_4_ = (float)local_a00._4_4_ * (float)local_a00._4_4_;
    auVar40._0_4_ = (float)local_a00._0_4_ * (float)local_a00._0_4_;
    auVar40._8_4_ = fStack_9f8 * fStack_9f8;
    auVar40._12_4_ = fStack_9f4 * fStack_9f4;
    auVar40._16_4_ = fStack_9f0 * fStack_9f0;
    auVar40._20_4_ = fStack_9ec * fStack_9ec;
    auVar40._24_4_ = fStack_9e8 * fStack_9e8;
    auVar40._28_4_ = auVar384._28_4_;
    auVar355 = ZEXT3264(local_280);
    auVar25 = vsubps_avx(local_280,auVar40);
    auVar347 = ZEXT3264(auVar25);
    auVar41._4_4_ = fVar332 * fVar332;
    auVar41._0_4_ = fVar321 * fVar321;
    auVar41._8_4_ = local_2c0._8_4_ * local_2c0._8_4_;
    auVar41._12_4_ = local_2c0._12_4_ * local_2c0._12_4_;
    auVar41._16_4_ = local_2c0._16_4_ * local_2c0._16_4_;
    auVar41._20_4_ = local_2c0._20_4_ * local_2c0._20_4_;
    auVar41._24_4_ = local_2c0._24_4_ * local_2c0._24_4_;
    auVar41._28_4_ = fVar138;
    fVar334 = auVar25._0_4_;
    fVar336 = auVar25._4_4_;
    fVar338 = auVar25._8_4_;
    fVar340 = auVar25._12_4_;
    fVar348 = auVar25._16_4_;
    fVar349 = auVar25._20_4_;
    fVar350 = auVar25._24_4_;
    auVar42._4_4_ = fVar336 * 4.0 * auVar24._4_4_;
    auVar42._0_4_ = fVar334 * 4.0 * auVar24._0_4_;
    auVar42._8_4_ = fVar338 * 4.0 * auVar24._8_4_;
    auVar42._12_4_ = fVar340 * 4.0 * auVar24._12_4_;
    auVar42._16_4_ = fVar348 * 4.0 * auVar24._16_4_;
    auVar42._20_4_ = fVar349 * 4.0 * auVar24._20_4_;
    auVar42._24_4_ = fVar350 * 4.0 * auVar24._24_4_;
    auVar42._28_4_ = 0x40800000;
    auVar249 = vsubps_avx(auVar41,auVar42);
    auVar124 = vcmpps_avx(auVar249,auVar157,5);
    fVar138 = auVar25._28_4_;
    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar124 >> 0x7f,0) == '\0') &&
          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar124 >> 0xbf,0) == '\0') &&
        (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar124[0x1f])
    {
      local_940._8_4_ = 0x7f800000;
      local_940._0_8_ = 0x7f8000007f800000;
      local_940._12_4_ = 0x7f800000;
      local_940._16_4_ = 0x7f800000;
      local_940._20_4_ = 0x7f800000;
      local_940._24_4_ = 0x7f800000;
      local_940._28_4_ = 0x7f800000;
      auVar403._8_4_ = 0xff800000;
      auVar403._0_8_ = 0xff800000ff800000;
      auVar403._12_4_ = 0xff800000;
      auVar403._16_4_ = 0xff800000;
      auVar403._20_4_ = 0xff800000;
      auVar403._24_4_ = 0xff800000;
      auVar403._28_4_ = 0xff800000;
      fVar321 = 0.0;
    }
    else {
      auVar386 = vsqrtps_avx(auVar249);
      auVar268._0_4_ = fVar334 + fVar334;
      auVar268._4_4_ = fVar336 + fVar336;
      auVar268._8_4_ = fVar338 + fVar338;
      auVar268._12_4_ = fVar340 + fVar340;
      auVar268._16_4_ = fVar348 + fVar348;
      auVar268._20_4_ = fVar349 + fVar349;
      auVar268._24_4_ = fVar350 + fVar350;
      auVar268._28_4_ = fVar138 + fVar138;
      auVar330 = vrcpps_avx(auVar268);
      auVar249 = vcmpps_avx(auVar249,auVar157,5);
      fVar262 = auVar330._0_4_;
      fVar277 = auVar330._4_4_;
      auVar43._4_4_ = auVar268._4_4_ * fVar277;
      auVar43._0_4_ = auVar268._0_4_ * fVar262;
      fVar281 = auVar330._8_4_;
      auVar43._8_4_ = auVar268._8_4_ * fVar281;
      fVar285 = auVar330._12_4_;
      auVar43._12_4_ = auVar268._12_4_ * fVar285;
      fVar289 = auVar330._16_4_;
      auVar43._16_4_ = auVar268._16_4_ * fVar289;
      fVar293 = auVar330._20_4_;
      auVar43._20_4_ = auVar268._20_4_ * fVar293;
      fVar297 = auVar330._24_4_;
      auVar43._24_4_ = auVar268._24_4_ * fVar297;
      auVar43._28_4_ = auVar268._28_4_;
      auVar328._8_4_ = 0x3f800000;
      auVar328._0_8_ = &DAT_3f8000003f800000;
      auVar328._12_4_ = 0x3f800000;
      auVar328._16_4_ = 0x3f800000;
      auVar328._20_4_ = 0x3f800000;
      auVar328._24_4_ = 0x3f800000;
      auVar328._28_4_ = 0x3f800000;
      auVar157 = vsubps_avx(auVar328,auVar43);
      fVar262 = fVar262 + fVar262 * auVar157._0_4_;
      fVar277 = fVar277 + fVar277 * auVar157._4_4_;
      fVar281 = fVar281 + fVar281 * auVar157._8_4_;
      fVar285 = fVar285 + fVar285 * auVar157._12_4_;
      fVar289 = fVar289 + fVar289 * auVar157._16_4_;
      fVar293 = fVar293 + fVar293 * auVar157._20_4_;
      fVar297 = fVar297 + fVar297 * auVar157._24_4_;
      auVar305._0_8_ = CONCAT44(fVar332,fVar321) ^ 0x8000000080000000;
      auVar305._8_4_ = -local_2c0._8_4_;
      auVar305._12_4_ = -local_2c0._12_4_;
      auVar305._16_4_ = -local_2c0._16_4_;
      auVar305._20_4_ = -local_2c0._20_4_;
      auVar305._24_4_ = -local_2c0._24_4_;
      auVar305._28_4_ = -local_2c0._28_4_;
      auVar26 = vsubps_avx(auVar305,auVar386);
      fVar321 = auVar26._0_4_ * fVar262;
      fVar332 = auVar26._4_4_ * fVar277;
      auVar44._4_4_ = fVar332;
      auVar44._0_4_ = fVar321;
      fVar311 = auVar26._8_4_ * fVar281;
      auVar44._8_4_ = fVar311;
      fVar313 = auVar26._12_4_ * fVar285;
      auVar44._12_4_ = fVar313;
      fVar315 = auVar26._16_4_ * fVar289;
      auVar44._16_4_ = fVar315;
      fVar317 = auVar26._20_4_ * fVar293;
      auVar44._20_4_ = fVar317;
      fVar319 = auVar26._24_4_ * fVar297;
      auVar44._24_4_ = fVar319;
      auVar44._28_4_ = auVar26._28_4_;
      auVar386 = vsubps_avx(auVar386,local_2c0);
      fVar262 = auVar386._0_4_ * fVar262;
      fVar277 = auVar386._4_4_ * fVar277;
      auVar45._4_4_ = fVar277;
      auVar45._0_4_ = fVar262;
      fVar281 = auVar386._8_4_ * fVar281;
      auVar45._8_4_ = fVar281;
      fVar285 = auVar386._12_4_ * fVar285;
      auVar45._12_4_ = fVar285;
      fVar289 = auVar386._16_4_ * fVar289;
      auVar45._16_4_ = fVar289;
      fVar293 = auVar386._20_4_ * fVar293;
      auVar45._20_4_ = fVar293;
      fVar297 = auVar386._24_4_ * fVar297;
      auVar45._24_4_ = fVar297;
      auVar45._28_4_ = auVar386._28_4_;
      fStack_4c4 = local_960._28_4_ + auVar330._28_4_ + auVar157._28_4_;
      local_4e0[0] = fVar342 * ((float)local_960._0_4_ + (float)local_a00._0_4_ * fVar321);
      local_4e0[1] = fVar344 * (local_960._4_4_ + (float)local_a00._4_4_ * fVar332);
      local_4e0[2] = fVar351 * (local_960._8_4_ + fStack_9f8 * fVar311);
      local_4e0[3] = fVar352 * (local_960._12_4_ + fStack_9f4 * fVar313);
      fStack_4d0 = fVar256 * (local_960._16_4_ + fStack_9f0 * fVar315);
      fStack_4cc = fVar258 * (local_960._20_4_ + fStack_9ec * fVar317);
      fStack_4c8 = fVar260 * (local_960._24_4_ + fStack_9e8 * fVar319);
      local_500[0] = fVar342 * ((float)local_960._0_4_ + (float)local_a00._0_4_ * fVar262);
      local_500[1] = fVar344 * (local_960._4_4_ + (float)local_a00._4_4_ * fVar277);
      local_500[2] = fVar351 * (local_960._8_4_ + fStack_9f8 * fVar281);
      local_500[3] = fVar352 * (local_960._12_4_ + fStack_9f4 * fVar285);
      fStack_4f0 = fVar256 * (local_960._16_4_ + fStack_9f0 * fVar289);
      fStack_4ec = fVar258 * (local_960._20_4_ + fStack_9ec * fVar293);
      fStack_4e8 = fVar260 * (local_960._24_4_ + fStack_9e8 * fVar297);
      fStack_4e4 = local_960._28_4_ + fStack_4c4;
      auVar269._8_4_ = 0x7f800000;
      auVar269._0_8_ = 0x7f8000007f800000;
      auVar269._12_4_ = 0x7f800000;
      auVar269._16_4_ = 0x7f800000;
      auVar269._20_4_ = 0x7f800000;
      auVar269._24_4_ = 0x7f800000;
      auVar269._28_4_ = 0x7f800000;
      local_940 = vblendvps_avx(auVar269,auVar44,auVar249);
      auVar306._8_4_ = 0x7fffffff;
      auVar306._0_8_ = 0x7fffffff7fffffff;
      auVar306._12_4_ = 0x7fffffff;
      auVar306._16_4_ = 0x7fffffff;
      auVar306._20_4_ = 0x7fffffff;
      auVar306._24_4_ = 0x7fffffff;
      auVar306._28_4_ = 0x7fffffff;
      auVar157 = vandps_avx(auVar40,auVar306);
      auVar157 = vmaxps_avx(local_4a0,auVar157);
      auVar46._4_4_ = auVar157._4_4_ * 1.9073486e-06;
      auVar46._0_4_ = auVar157._0_4_ * 1.9073486e-06;
      auVar46._8_4_ = auVar157._8_4_ * 1.9073486e-06;
      auVar46._12_4_ = auVar157._12_4_ * 1.9073486e-06;
      auVar46._16_4_ = auVar157._16_4_ * 1.9073486e-06;
      auVar46._20_4_ = auVar157._20_4_ * 1.9073486e-06;
      auVar46._24_4_ = auVar157._24_4_ * 1.9073486e-06;
      auVar46._28_4_ = auVar157._28_4_;
      auVar157 = vandps_avx(auVar25,auVar306);
      auVar157 = vcmpps_avx(auVar157,auVar46,1);
      auVar270._8_4_ = 0xff800000;
      auVar270._0_8_ = 0xff800000ff800000;
      auVar270._12_4_ = 0xff800000;
      auVar270._16_4_ = 0xff800000;
      auVar270._20_4_ = 0xff800000;
      auVar270._24_4_ = 0xff800000;
      auVar270._28_4_ = 0xff800000;
      auVar403 = vblendvps_avx(auVar270,auVar45,auVar249);
      auVar330 = auVar249 & auVar157;
      fVar321 = local_2c0._28_4_;
      if ((((((((auVar330 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar330 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar330 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar330 >> 0x7f,0) != '\0') ||
            (auVar330 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar330 >> 0xbf,0) != '\0') ||
          (auVar330 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar330[0x1f] < '\0') {
        auVar124 = vandps_avx(auVar157,auVar249);
        auVar143 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
        auVar330 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar157 = vcmpps_avx(auVar24,auVar330,2);
        auVar354._8_4_ = 0xff800000;
        auVar354._0_8_ = 0xff800000ff800000;
        auVar354._12_4_ = 0xff800000;
        auVar354._16_4_ = 0xff800000;
        auVar354._20_4_ = 0xff800000;
        auVar354._24_4_ = 0xff800000;
        auVar354._28_4_ = 0xff800000;
        auVar355 = ZEXT3264(auVar354);
        auVar388._8_4_ = 0x7f800000;
        auVar388._0_8_ = 0x7f8000007f800000;
        auVar388._12_4_ = 0x7f800000;
        auVar388._16_4_ = 0x7f800000;
        auVar388._20_4_ = 0x7f800000;
        auVar388._24_4_ = 0x7f800000;
        auVar388._28_4_ = 0x7f800000;
        auVar24 = vblendvps_avx(auVar388,auVar354,auVar157);
        auVar112 = vpmovsxwd_avx(auVar143);
        auVar143 = vpunpckhwd_avx(auVar143,auVar143);
        auVar251._16_16_ = auVar143;
        auVar251._0_16_ = auVar112;
        local_940 = vblendvps_avx(local_940,auVar24,auVar251);
        auVar24 = vblendvps_avx(auVar354,auVar388,auVar157);
        auVar403 = vblendvps_avx(auVar403,auVar24,auVar251);
        auVar24 = vcmpps_avx(auVar330,ZEXT1232(ZEXT812(0)) << 0x20,0xf);
        auVar129._0_4_ = auVar124._0_4_ ^ auVar24._0_4_;
        auVar129._4_4_ = auVar124._4_4_ ^ auVar24._4_4_;
        auVar129._8_4_ = auVar124._8_4_ ^ auVar24._8_4_;
        auVar129._12_4_ = auVar124._12_4_ ^ auVar24._12_4_;
        auVar129._16_4_ = auVar124._16_4_ ^ auVar24._16_4_;
        auVar129._20_4_ = auVar124._20_4_ ^ auVar24._20_4_;
        auVar129._24_4_ = auVar124._24_4_ ^ auVar24._24_4_;
        auVar129._28_4_ = auVar124._28_4_ ^ auVar24._28_4_;
        auVar124 = vorps_avx(auVar157,auVar129);
        auVar124 = vandps_avx(auVar249,auVar124);
      }
    }
    auVar373 = ZEXT3264(auVar249);
    auVar360 = ZEXT3264(auVar23);
    auVar308 = ZEXT3264(local_960);
    auVar273 = ZEXT3264(local_2c0);
    auVar249 = local_480 & auVar124;
    auVar243._8_4_ = 0x3f800000;
    auVar243._0_8_ = &DAT_3f8000003f800000;
    auVar243._12_4_ = 0x3f800000;
    auVar243._16_4_ = 0x3f800000;
    auVar243._20_4_ = 0x3f800000;
    auVar243._24_4_ = 0x3f800000;
    auVar243._28_4_ = 0x3f800000;
    auVar252 = ZEXT3264(auVar243);
    if ((((((((auVar249 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar249 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar249 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar249 >> 0x7f,0) != '\0') ||
          (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar249 >> 0xbf,0) != '\0') ||
        (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar249[0x1f] < '\0') {
      auVar143 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_870._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_870._0_4_)),0);
      auVar228._16_16_ = auVar143;
      auVar228._0_16_ = auVar143;
      auVar24 = vminps_avx(auVar228,auVar403);
      fVar293 = auVar387._28_4_;
      auVar412 = local_8a0._0_28_;
      auVar191._0_4_ =
           (float)local_7a0._0_4_ * fVar261 +
           (float)local_a40._0_4_ * fVar368 + (float)local_8a0._0_4_ * fVar380;
      auVar191._4_4_ =
           (float)local_7a0._4_4_ * fVar276 +
           (float)local_a40._4_4_ * fVar374 + (float)local_8a0._4_4_ * fVar389;
      auVar191._8_4_ = fStack_798 * fVar280 + fStack_a38 * fVar375 + fStack_898 * fVar391;
      auVar191._12_4_ = fStack_794 * fVar284 + fStack_a34 * fVar376 + fStack_894 * fVar393;
      auVar191._16_4_ = fStack_790 * fVar288 + fStack_a30 * fVar377 + fStack_890 * fVar395;
      auVar191._20_4_ = fStack_78c * fVar292 + fStack_a2c * fVar378 + fStack_88c * fVar397;
      auVar191._24_4_ = fStack_788 * fVar296 + fStack_a28 * fVar379 + fStack_888 * fVar399;
      auVar191._28_4_ = fVar298 + fVar293 + 1.0;
      auVar249 = vrcpps_avx(auVar191);
      fVar332 = auVar249._0_4_;
      fVar298 = auVar249._4_4_;
      auVar47._4_4_ = auVar191._4_4_ * fVar298;
      auVar47._0_4_ = auVar191._0_4_ * fVar332;
      fVar262 = auVar249._8_4_;
      auVar47._8_4_ = auVar191._8_4_ * fVar262;
      fVar277 = auVar249._12_4_;
      auVar47._12_4_ = auVar191._12_4_ * fVar277;
      fVar281 = auVar249._16_4_;
      auVar47._16_4_ = auVar191._16_4_ * fVar281;
      fVar285 = auVar249._20_4_;
      auVar47._20_4_ = auVar191._20_4_ * fVar285;
      fVar289 = auVar249._24_4_;
      auVar47._24_4_ = auVar191._24_4_ * fVar289;
      auVar47._28_4_ = 0x3f800000;
      auVar387 = vsubps_avx(auVar243,auVar47);
      auVar307._8_4_ = 0x7fffffff;
      auVar307._0_8_ = 0x7fffffff7fffffff;
      auVar307._12_4_ = 0x7fffffff;
      auVar307._16_4_ = 0x7fffffff;
      auVar307._20_4_ = 0x7fffffff;
      auVar307._24_4_ = 0x7fffffff;
      auVar307._28_4_ = 0x7fffffff;
      auVar249 = vandps_avx(auVar191,auVar307);
      auVar385._8_4_ = 0x219392ef;
      auVar385._0_8_ = 0x219392ef219392ef;
      auVar385._12_4_ = 0x219392ef;
      auVar385._16_4_ = 0x219392ef;
      auVar385._20_4_ = 0x219392ef;
      auVar385._24_4_ = 0x219392ef;
      auVar385._28_4_ = 0x219392ef;
      auVar23 = vcmpps_avx(auVar249,auVar385,1);
      auVar347 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar48._4_4_ =
           (fVar298 + fVar298 * auVar387._4_4_) *
           -(fVar414 * fVar276 + fVar361 * fVar374 + fVar389 * fVar235);
      auVar48._0_4_ =
           (fVar332 + fVar332 * auVar387._0_4_) *
           -(fVar411 * fVar261 + fVar356 * fVar368 + fVar380 * fVar214);
      auVar48._8_4_ =
           (fVar262 + fVar262 * auVar387._8_4_) *
           -(fVar415 * fVar280 + fVar362 * fVar375 + fVar391 * fVar257);
      auVar48._12_4_ =
           (fVar277 + fVar277 * auVar387._12_4_) *
           -(fVar416 * fVar284 + fVar363 * fVar376 + fVar393 * fVar279);
      auVar48._16_4_ =
           (fVar281 + fVar281 * auVar387._16_4_) *
           -(fVar417 * fVar288 + fVar364 * fVar377 + fVar395 * fVar290);
      auVar48._20_4_ =
           (fVar285 + fVar285 * auVar387._20_4_) *
           -(fVar418 * fVar292 + fVar365 * fVar378 + fVar397 * fVar309);
      auVar48._24_4_ =
           (fVar289 + fVar289 * auVar387._24_4_) *
           -(fVar419 * fVar296 + fVar366 * fVar379 + fVar399 * fVar318);
      auVar48._28_4_ = -(fVar293 + fVar321 + fVar293);
      auVar71 = ZEXT812(0);
      auVar249 = vcmpps_avx(auVar191,ZEXT1232(auVar71) << 0x20,1);
      auVar249 = vorps_avx(auVar23,auVar249);
      auVar359._8_4_ = 0xff800000;
      auVar359._0_8_ = 0xff800000ff800000;
      auVar359._12_4_ = 0xff800000;
      auVar359._16_4_ = 0xff800000;
      auVar359._20_4_ = 0xff800000;
      auVar359._24_4_ = 0xff800000;
      auVar359._28_4_ = 0xff800000;
      auVar360 = ZEXT3264(auVar359);
      auVar249 = vblendvps_avx(auVar48,auVar359,auVar249);
      auVar387 = vcmpps_avx(auVar191,ZEXT1232(auVar71) << 0x20,6);
      auVar23 = vorps_avx(auVar23,auVar387);
      auVar372._8_4_ = 0x7f800000;
      auVar372._0_8_ = 0x7f8000007f800000;
      auVar372._12_4_ = 0x7f800000;
      auVar372._16_4_ = 0x7f800000;
      auVar372._20_4_ = 0x7f800000;
      auVar372._24_4_ = 0x7f800000;
      auVar372._28_4_ = 0x7f800000;
      auVar373 = ZEXT3264(auVar372);
      auVar23 = vblendvps_avx(auVar48,auVar372,auVar23);
      auVar387 = vmaxps_avx(local_2a0,local_940);
      auVar387 = vmaxps_avx(auVar387,auVar249);
      auVar23 = vminps_avx(auVar24,auVar23);
      auVar386 = ZEXT1232(auVar71) << 0x20;
      auVar249 = vsubps_avx(auVar386,_local_a20);
      auVar209 = vsubps_avx(auVar386,auVar209);
      auVar49._4_4_ = auVar209._4_4_ * -fVar390;
      auVar49._0_4_ = auVar209._0_4_ * -fVar381;
      auVar49._8_4_ = auVar209._8_4_ * -fVar392;
      auVar49._12_4_ = auVar209._12_4_ * -fVar394;
      auVar49._16_4_ = auVar209._16_4_ * -fVar396;
      auVar49._20_4_ = auVar209._20_4_ * -fVar398;
      auVar49._24_4_ = auVar209._24_4_ * -fVar400;
      auVar49._28_4_ = auVar209._28_4_;
      auVar355 = ZEXT3264(local_ac0);
      auVar50._4_4_ = fVar405 * auVar249._4_4_;
      auVar50._0_4_ = fVar401 * auVar249._0_4_;
      auVar50._8_4_ = fVar406 * auVar249._8_4_;
      auVar50._12_4_ = fVar407 * auVar249._12_4_;
      auVar50._16_4_ = fVar408 * auVar249._16_4_;
      auVar50._20_4_ = fVar409 * auVar249._20_4_;
      auVar50._24_4_ = fVar410 * auVar249._24_4_;
      auVar50._28_4_ = auVar249._28_4_;
      auVar249 = vsubps_avx(auVar49,auVar50);
      auVar209 = vsubps_avx(auVar386,local_700);
      auVar308 = ZEXT3264(auVar124);
      auVar51._4_4_ = fVar234 * auVar209._4_4_;
      auVar51._0_4_ = fVar213 * auVar209._0_4_;
      auVar51._8_4_ = fVar255 * auVar209._8_4_;
      auVar51._12_4_ = fVar278 * auVar209._12_4_;
      auVar51._16_4_ = fVar287 * auVar209._16_4_;
      auVar51._20_4_ = fVar299 * auVar209._20_4_;
      uVar8 = auVar209._28_4_;
      auVar51._24_4_ = fVar316 * auVar209._24_4_;
      auVar51._28_4_ = uVar8;
      auVar24 = vsubps_avx(auVar249,auVar51);
      auVar52._4_4_ = (float)local_8a0._4_4_ * -fVar390;
      auVar52._0_4_ = (float)local_8a0._0_4_ * -fVar381;
      auVar52._8_4_ = fStack_898 * -fVar392;
      auVar52._12_4_ = fStack_894 * -fVar394;
      auVar52._16_4_ = fStack_890 * -fVar396;
      auVar52._20_4_ = fStack_88c * -fVar398;
      auVar52._24_4_ = fStack_888 * -fVar400;
      auVar52._28_4_ = uVar90 ^ 0x80000000;
      auVar53._4_4_ = (float)local_a40._4_4_ * fVar405;
      auVar53._0_4_ = (float)local_a40._0_4_ * fVar401;
      auVar53._8_4_ = fStack_a38 * fVar406;
      auVar53._12_4_ = fStack_a34 * fVar407;
      auVar53._16_4_ = fStack_a30 * fVar408;
      auVar53._20_4_ = fStack_a2c * fVar409;
      auVar53._24_4_ = fStack_a28 * fVar410;
      auVar53._28_4_ = uVar8;
      auVar249 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = (float)local_7a0._4_4_ * fVar234;
      auVar54._0_4_ = (float)local_7a0._0_4_ * fVar213;
      auVar54._8_4_ = fStack_798 * fVar255;
      auVar54._12_4_ = fStack_794 * fVar278;
      auVar54._16_4_ = fStack_790 * fVar287;
      auVar54._20_4_ = fStack_78c * fVar299;
      auVar54._24_4_ = fStack_788 * fVar316;
      auVar54._28_4_ = uVar8;
      auVar157 = vsubps_avx(auVar249,auVar54);
      auVar249 = vrcpps_avx(auVar157);
      fVar213 = auVar249._0_4_;
      fVar214 = auVar249._4_4_;
      auVar55._4_4_ = auVar157._4_4_ * fVar214;
      auVar55._0_4_ = auVar157._0_4_ * fVar213;
      fVar234 = auVar249._8_4_;
      auVar55._8_4_ = auVar157._8_4_ * fVar234;
      fVar235 = auVar249._12_4_;
      auVar55._12_4_ = auVar157._12_4_ * fVar235;
      fVar255 = auVar249._16_4_;
      auVar55._16_4_ = auVar157._16_4_ * fVar255;
      fVar257 = auVar249._20_4_;
      auVar55._20_4_ = auVar157._20_4_ * fVar257;
      fVar278 = auVar249._24_4_;
      auVar55._24_4_ = auVar157._24_4_ * fVar278;
      auVar55._28_4_ = fStack_784;
      auVar330 = vsubps_avx(auVar243,auVar55);
      auVar121._8_4_ = 0x7fffffff;
      auVar121._0_8_ = 0x7fffffff7fffffff;
      auVar121._12_4_ = 0x7fffffff;
      auVar121._16_4_ = 0x7fffffff;
      auVar121._20_4_ = 0x7fffffff;
      auVar121._24_4_ = 0x7fffffff;
      auVar121._28_4_ = 0x7fffffff;
      auVar249 = vandps_avx(auVar157,auVar121);
      auVar122._8_4_ = 0x219392ef;
      auVar122._0_8_ = 0x219392ef219392ef;
      auVar122._12_4_ = 0x219392ef;
      auVar122._16_4_ = 0x219392ef;
      auVar122._20_4_ = 0x219392ef;
      auVar122._24_4_ = 0x219392ef;
      auVar122._28_4_ = 0x219392ef;
      auVar209 = vcmpps_avx(auVar249,auVar122,1);
      auVar273 = ZEXT3264(auVar209);
      auVar56._4_4_ = (fVar214 + fVar214 * auVar330._4_4_) * -auVar24._4_4_;
      auVar56._0_4_ = (fVar213 + fVar213 * auVar330._0_4_) * -auVar24._0_4_;
      auVar56._8_4_ = (fVar234 + fVar234 * auVar330._8_4_) * -auVar24._8_4_;
      auVar56._12_4_ = (fVar235 + fVar235 * auVar330._12_4_) * -auVar24._12_4_;
      auVar56._16_4_ = (fVar255 + fVar255 * auVar330._16_4_) * -auVar24._16_4_;
      auVar56._20_4_ = (fVar257 + fVar257 * auVar330._20_4_) * -auVar24._20_4_;
      auVar56._24_4_ = (fVar278 + fVar278 * auVar330._24_4_) * -auVar24._24_4_;
      auVar56._28_4_ = auVar24._28_4_ ^ 0x80000000;
      auVar249 = vcmpps_avx(auVar157,auVar386,1);
      auVar249 = vorps_avx(auVar209,auVar249);
      auVar249 = vblendvps_avx(auVar56,auVar359,auVar249);
      local_820 = vmaxps_avx(auVar387,auVar249);
      auVar387 = ZEXT1232(auVar71) << 0x20;
      auVar249 = vcmpps_avx(auVar157,auVar387,6);
      auVar249 = vorps_avx(auVar209,auVar249);
      auVar209 = vblendvps_avx(auVar56,auVar372,auVar249);
      auVar249 = vandps_avx(auVar124,local_480);
      local_2e0 = vminps_avx(auVar23,auVar209);
      auVar209 = vcmpps_avx(local_820,local_2e0,2);
      auVar23 = auVar249 & auVar209;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0x7f,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0xbf,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f])
      {
        auVar252 = ZEXT3264(auVar243);
      }
      else {
        auVar23 = vminps_avx(_local_ba0,auVar120);
        auVar24 = vminps_avx(_local_760,local_780);
        auVar23 = vminps_avx(auVar23,auVar24);
        auVar23 = vsubps_avx(auVar23,auVar156);
        auVar249 = vandps_avx(auVar209,auVar249);
        auVar87._4_4_ = local_4e0[1];
        auVar87._0_4_ = local_4e0[0];
        auVar87._8_4_ = local_4e0[2];
        auVar87._12_4_ = local_4e0[3];
        auVar87._16_4_ = fStack_4d0;
        auVar87._20_4_ = fStack_4cc;
        auVar87._24_4_ = fStack_4c8;
        auVar87._28_4_ = fStack_4c4;
        auVar156 = vminps_avx(auVar87,auVar243);
        auVar156 = vmaxps_avx(auVar156,ZEXT832(0) << 0x20);
        local_4e0[0] = fVar176 + fVar320 * (auVar156._0_4_ + 0.0) * 0.125;
        local_4e0[1] = fVar197 + fVar171 * (auVar156._4_4_ + 1.0) * 0.125;
        local_4e0[2] = fVar198 + fVar173 * (auVar156._8_4_ + 2.0) * 0.125;
        local_4e0[3] = fVar199 + fVar175 * (auVar156._12_4_ + 3.0) * 0.125;
        fStack_4d0 = fVar176 + fVar320 * (auVar156._16_4_ + 4.0) * 0.125;
        fStack_4cc = fVar197 + fVar171 * (auVar156._20_4_ + 5.0) * 0.125;
        fStack_4c8 = fVar198 + fVar173 * (auVar156._24_4_ + 6.0) * 0.125;
        fStack_4c4 = fVar199 + auVar156._28_4_ + 7.0;
        auVar86._4_4_ = local_500[1];
        auVar86._0_4_ = local_500[0];
        auVar86._8_4_ = local_500[2];
        auVar86._12_4_ = local_500[3];
        auVar86._16_4_ = fStack_4f0;
        auVar86._20_4_ = fStack_4ec;
        auVar86._24_4_ = fStack_4e8;
        auVar86._28_4_ = fStack_4e4;
        auVar156 = vminps_avx(auVar86,auVar243);
        auVar156 = vmaxps_avx(auVar156,ZEXT832(0) << 0x20);
        local_500[0] = fVar176 + fVar320 * (auVar156._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar197 + fVar171 * (auVar156._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar198 + fVar173 * (auVar156._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar199 + fVar175 * (auVar156._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar176 + fVar320 * (auVar156._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar197 + fVar171 * (auVar156._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar198 + fVar173 * (auVar156._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar199 + auVar156._28_4_ + 7.0;
        auVar57._4_4_ = auVar23._4_4_ * 0.99999976;
        auVar57._0_4_ = auVar23._0_4_ * 0.99999976;
        auVar57._8_4_ = auVar23._8_4_ * 0.99999976;
        auVar57._12_4_ = auVar23._12_4_ * 0.99999976;
        auVar57._16_4_ = auVar23._16_4_ * 0.99999976;
        auVar57._20_4_ = auVar23._20_4_ * 0.99999976;
        auVar57._24_4_ = auVar23._24_4_ * 0.99999976;
        auVar57._28_4_ = 0x3f7ffffc;
        auVar156 = vmaxps_avx(auVar387,auVar57);
        auVar58._4_4_ = auVar156._4_4_ * auVar156._4_4_;
        auVar58._0_4_ = auVar156._0_4_ * auVar156._0_4_;
        auVar58._8_4_ = auVar156._8_4_ * auVar156._8_4_;
        auVar58._12_4_ = auVar156._12_4_ * auVar156._12_4_;
        auVar58._16_4_ = auVar156._16_4_ * auVar156._16_4_;
        auVar58._20_4_ = auVar156._20_4_ * auVar156._20_4_;
        auVar58._24_4_ = auVar156._24_4_ * auVar156._24_4_;
        auVar58._28_4_ = auVar156._28_4_;
        auVar209 = vsubps_avx(auVar158,auVar58);
        auVar59._4_4_ = auVar209._4_4_ * fVar336 * 4.0;
        auVar59._0_4_ = auVar209._0_4_ * fVar334 * 4.0;
        auVar59._8_4_ = auVar209._8_4_ * fVar338 * 4.0;
        auVar59._12_4_ = auVar209._12_4_ * fVar340 * 4.0;
        auVar59._16_4_ = auVar209._16_4_ * fVar348 * 4.0;
        auVar59._20_4_ = auVar209._20_4_ * fVar349 * 4.0;
        auVar59._24_4_ = auVar209._24_4_ * fVar350 * 4.0;
        auVar59._28_4_ = auVar156._28_4_;
        auVar23 = vsubps_avx(auVar41,auVar59);
        _local_800 = ZEXT432(0) << 0x20;
        local_aa0 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,5);
        auVar156 = local_aa0;
        if ((((((((local_aa0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_aa0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_aa0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_aa0 >> 0x7f,0) == '\0') &&
              (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_aa0 >> 0xbf,0) == '\0') &&
            (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_aa0[0x1f]) {
          auVar158 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_620 = ZEXT832(0) << 0x20;
          auVar208 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar327 = ZEXT828(0) << 0x20;
          auVar229._8_4_ = 0x7f800000;
          auVar229._0_8_ = 0x7f8000007f800000;
          auVar229._12_4_ = 0x7f800000;
          auVar229._16_4_ = 0x7f800000;
          auVar229._20_4_ = 0x7f800000;
          auVar229._24_4_ = 0x7f800000;
          auVar229._28_4_ = 0x7f800000;
          auVar244._8_4_ = 0xff800000;
          auVar244._0_8_ = 0xff800000ff800000;
          auVar244._12_4_ = 0xff800000;
          auVar244._16_4_ = 0xff800000;
          auVar244._20_4_ = 0xff800000;
          auVar244._24_4_ = 0xff800000;
          auVar244._28_4_ = 0xff800000;
          auVar10 = local_740;
          local_aa0 = auVar27;
          _local_600 = _local_620;
        }
        else {
          auVar158 = vsqrtps_avx(auVar23);
          auVar210._0_4_ = fVar334 + fVar334;
          auVar210._4_4_ = fVar336 + fVar336;
          auVar210._8_4_ = fVar338 + fVar338;
          auVar210._12_4_ = fVar340 + fVar340;
          auVar210._16_4_ = fVar348 + fVar348;
          auVar210._20_4_ = fVar349 + fVar349;
          auVar210._24_4_ = fVar350 + fVar350;
          auVar210._28_4_ = fVar138 + fVar138;
          auVar24 = vrcpps_avx(auVar210);
          fVar138 = auVar24._0_4_;
          fVar213 = auVar24._4_4_;
          auVar60._4_4_ = auVar210._4_4_ * fVar213;
          auVar60._0_4_ = auVar210._0_4_ * fVar138;
          fVar214 = auVar24._8_4_;
          auVar60._8_4_ = auVar210._8_4_ * fVar214;
          fVar234 = auVar24._12_4_;
          auVar60._12_4_ = auVar210._12_4_ * fVar234;
          fVar235 = auVar24._16_4_;
          auVar60._16_4_ = auVar210._16_4_ * fVar235;
          fVar255 = auVar24._20_4_;
          auVar60._20_4_ = auVar210._20_4_ * fVar255;
          fVar257 = auVar24._24_4_;
          auVar60._24_4_ = auVar210._24_4_ * fVar257;
          auVar60._28_4_ = auVar210._28_4_;
          auVar27 = vsubps_avx(auVar243,auVar60);
          fVar138 = fVar138 + fVar138 * auVar27._0_4_;
          fVar213 = fVar213 + fVar213 * auVar27._4_4_;
          fVar214 = fVar214 + fVar214 * auVar27._8_4_;
          fVar234 = fVar234 + fVar234 * auVar27._12_4_;
          fVar235 = fVar235 + fVar235 * auVar27._16_4_;
          fVar255 = fVar255 + fVar255 * auVar27._20_4_;
          fVar257 = fVar257 + fVar257 * auVar27._24_4_;
          fVar278 = auVar24._28_4_ + auVar27._28_4_;
          auVar245._0_8_ = local_2c0._0_8_ ^ 0x8000000080000000;
          auVar245._8_4_ = -local_2c0._8_4_;
          auVar245._12_4_ = -local_2c0._12_4_;
          auVar245._16_4_ = -local_2c0._16_4_;
          auVar245._20_4_ = -local_2c0._20_4_;
          auVar245._24_4_ = -local_2c0._24_4_;
          auVar245._28_4_ = -local_2c0._28_4_;
          auVar24 = vsubps_avx(auVar245,auVar158);
          fVar321 = auVar24._0_4_ * fVar138;
          fVar332 = auVar24._4_4_ * fVar213;
          auVar61._4_4_ = fVar332;
          auVar61._0_4_ = fVar321;
          fVar334 = auVar24._8_4_ * fVar214;
          auVar61._8_4_ = fVar334;
          fVar336 = auVar24._12_4_ * fVar234;
          auVar61._12_4_ = fVar336;
          fVar338 = auVar24._16_4_ * fVar235;
          auVar61._16_4_ = fVar338;
          fVar340 = auVar24._20_4_ * fVar255;
          auVar61._20_4_ = fVar340;
          fVar320 = auVar24._24_4_ * fVar257;
          auVar61._24_4_ = fVar320;
          auVar61._28_4_ = auVar124._28_4_;
          auVar308 = ZEXT3264(auVar61);
          auVar124 = vsubps_avx(auVar158,local_2c0);
          fVar138 = auVar124._0_4_ * fVar138;
          fVar213 = auVar124._4_4_ * fVar213;
          auVar62._4_4_ = fVar213;
          auVar62._0_4_ = fVar138;
          fVar214 = auVar124._8_4_ * fVar214;
          auVar62._8_4_ = fVar214;
          fVar234 = auVar124._12_4_ * fVar234;
          auVar62._12_4_ = fVar234;
          fVar235 = auVar124._16_4_ * fVar235;
          auVar62._16_4_ = fVar235;
          fVar255 = auVar124._20_4_ * fVar255;
          auVar62._20_4_ = fVar255;
          fVar257 = auVar124._24_4_ * fVar257;
          auVar62._24_4_ = fVar257;
          auVar62._28_4_ = 0x7f800000;
          auVar373 = ZEXT3264(auVar62);
          fVar279 = (fVar321 * (float)local_a00._0_4_ + (float)local_960._0_4_) * fVar342;
          fVar287 = (fVar332 * (float)local_a00._4_4_ + local_960._4_4_) * fVar344;
          fVar290 = (fVar334 * fStack_9f8 + local_960._8_4_) * fVar351;
          fVar299 = (fVar336 * fStack_9f4 + local_960._12_4_) * fVar352;
          fVar309 = (fVar338 * fStack_9f0 + local_960._16_4_) * fVar256;
          fVar316 = (fVar340 * fStack_9ec + local_960._20_4_) * fVar258;
          fVar318 = (fVar320 * fStack_9e8 + local_960._24_4_) * fVar260;
          auVar159._0_4_ = fVar322 + fVar200 * fVar279;
          auVar159._4_4_ = fVar333 + fVar233 * fVar287;
          auVar159._8_4_ = fVar335 + fVar254 * fVar290;
          auVar159._12_4_ = fVar337 + fVar275 * fVar299;
          auVar159._16_4_ = fVar339 + fVar286 * fVar309;
          auVar159._20_4_ = fVar341 + fVar295 * fVar316;
          auVar159._24_4_ = fVar343 + fVar314 * fVar318;
          auVar159._28_4_ = fVar345 + auVar124._28_4_ + local_960._28_4_;
          auVar63._4_4_ = (float)local_7a0._4_4_ * fVar332;
          auVar63._0_4_ = (float)local_7a0._0_4_ * fVar321;
          auVar63._8_4_ = fStack_798 * fVar334;
          auVar63._12_4_ = fStack_794 * fVar336;
          auVar63._16_4_ = fStack_790 * fVar338;
          auVar63._20_4_ = fStack_78c * fVar340;
          auVar63._24_4_ = fStack_788 * fVar320;
          auVar63._28_4_ = fVar278;
          auVar158 = vsubps_avx(auVar63,auVar159);
          auVar10._4_4_ = fStack_8bc;
          auVar10._0_4_ = local_8c0;
          auVar10._8_4_ = fStack_8b8;
          auVar10._12_4_ = fStack_8b4;
          auVar10._16_4_ = fStack_8b0;
          auVar10._20_4_ = fStack_8ac;
          auVar10._24_4_ = fStack_8a8;
          auVar10._28_4_ = fStack_8a4;
          auVar211._0_4_ = local_8c0 + fVar172 * fVar279;
          auVar211._4_4_ = fStack_8bc + fVar215 * fVar287;
          auVar211._8_4_ = fStack_8b8 + fVar236 * fVar290;
          auVar211._12_4_ = fStack_8b4 + fVar274 * fVar299;
          auVar211._16_4_ = fStack_8b0 + fVar282 * fVar309;
          auVar211._20_4_ = fStack_8ac + fVar291 * fVar316;
          auVar211._24_4_ = fStack_8a8 + fVar310 * fVar318;
          auVar211._28_4_ = fStack_8a4 + fVar278;
          auVar64._4_4_ = (float)local_a40._4_4_ * fVar332;
          auVar64._0_4_ = (float)local_a40._0_4_ * fVar321;
          auVar64._8_4_ = fStack_a38 * fVar334;
          auVar64._12_4_ = fStack_a34 * fVar336;
          auVar64._16_4_ = fStack_a30 * fVar338;
          auVar64._20_4_ = fStack_a2c * fVar340;
          auVar64._24_4_ = fStack_a28 * fVar320;
          auVar64._28_4_ = fVar199;
          auVar27 = vsubps_avx(auVar64,auVar211);
          auVar246._0_4_ = fVar100 + fVar174 * fVar279;
          auVar246._4_4_ = fVar131 + fVar216 * fVar287;
          auVar246._8_4_ = fVar132 + fVar253 * fVar290;
          auVar246._12_4_ = fVar133 + fVar259 * fVar299;
          auVar246._16_4_ = fVar134 + fVar283 * fVar309;
          auVar246._20_4_ = fVar135 + fVar294 * fVar316;
          auVar246._24_4_ = fVar136 + fVar312 * fVar318;
          auVar246._28_4_ = fVar367 + auVar24._28_4_;
          auVar65._4_4_ = (float)local_8a0._4_4_ * fVar332;
          auVar65._0_4_ = (float)local_8a0._0_4_ * fVar321;
          auVar65._8_4_ = fStack_898 * fVar334;
          auVar65._12_4_ = fStack_894 * fVar336;
          auVar65._16_4_ = fStack_890 * fVar338;
          auVar65._20_4_ = fStack_88c * fVar340;
          auVar65._24_4_ = fStack_888 * fVar320;
          auVar65._28_4_ = fVar199;
          local_8e0 = vsubps_avx(auVar65,auVar246);
          fVar342 = (fVar138 * (float)local_a00._0_4_ + (float)local_960._0_4_) * fVar342;
          fVar344 = (fVar213 * (float)local_a00._4_4_ + local_960._4_4_) * fVar344;
          fVar351 = (fVar214 * fStack_9f8 + local_960._8_4_) * fVar351;
          fVar352 = (fVar234 * fStack_9f4 + local_960._12_4_) * fVar352;
          fVar256 = (fVar235 * fStack_9f0 + local_960._16_4_) * fVar256;
          fVar258 = (fVar255 * fStack_9ec + local_960._20_4_) * fVar258;
          fVar260 = (fVar257 * fStack_9e8 + local_960._24_4_) * fVar260;
          auVar271._0_4_ = fVar322 + fVar200 * fVar342;
          auVar271._4_4_ = fVar333 + fVar233 * fVar344;
          auVar271._8_4_ = fVar335 + fVar254 * fVar351;
          auVar271._12_4_ = fVar337 + fVar275 * fVar352;
          auVar271._16_4_ = fVar339 + fVar286 * fVar256;
          auVar271._20_4_ = fVar341 + fVar295 * fVar258;
          auVar271._24_4_ = fVar343 + fVar314 * fVar260;
          auVar271._28_4_ = fVar345 + fVar199;
          auVar66._4_4_ = (float)local_7a0._4_4_ * fVar213;
          auVar66._0_4_ = (float)local_7a0._0_4_ * fVar138;
          auVar66._8_4_ = fStack_798 * fVar214;
          auVar66._12_4_ = fStack_794 * fVar234;
          auVar66._16_4_ = fStack_790 * fVar235;
          auVar66._20_4_ = fStack_78c * fVar255;
          auVar66._24_4_ = fStack_788 * fVar257;
          auVar66._28_4_ = fStack_784;
          _local_800 = vsubps_avx(auVar66,auVar271);
          auVar272._0_4_ = local_8c0 + fVar172 * fVar342;
          auVar272._4_4_ = fStack_8bc + fVar215 * fVar344;
          auVar272._8_4_ = fStack_8b8 + fVar236 * fVar351;
          auVar272._12_4_ = fStack_8b4 + fVar274 * fVar352;
          auVar272._16_4_ = fStack_8b0 + fVar282 * fVar256;
          auVar272._20_4_ = fStack_8ac + fVar291 * fVar258;
          auVar272._24_4_ = fStack_8a8 + fVar310 * fVar260;
          auVar272._28_4_ = fStack_8a4 + local_800._28_4_;
          auVar67._4_4_ = (float)local_a40._4_4_ * fVar213;
          auVar67._0_4_ = (float)local_a40._0_4_ * fVar138;
          auVar67._8_4_ = fStack_a38 * fVar214;
          auVar67._12_4_ = fStack_a34 * fVar234;
          auVar67._16_4_ = fStack_a30 * fVar235;
          auVar67._20_4_ = fStack_a2c * fVar255;
          auVar67._24_4_ = fStack_a28 * fVar257;
          auVar67._28_4_ = fStack_784;
          _local_600 = vsubps_avx(auVar67,auVar272);
          auVar247._0_4_ = fVar100 + fVar174 * fVar342;
          auVar247._4_4_ = fVar131 + fVar216 * fVar344;
          auVar247._8_4_ = fVar132 + fVar253 * fVar351;
          auVar247._12_4_ = fVar133 + fVar259 * fVar352;
          auVar247._16_4_ = fVar134 + fVar283 * fVar256;
          auVar247._20_4_ = fVar135 + fVar294 * fVar258;
          auVar247._24_4_ = fVar136 + fVar312 * fVar260;
          auVar247._28_4_ = fVar367 + local_8e0._28_4_ + local_960._28_4_;
          auVar68._4_4_ = (float)local_8a0._4_4_ * fVar213;
          auVar68._0_4_ = (float)local_8a0._0_4_ * fVar138;
          auVar68._8_4_ = fStack_898 * fVar214;
          auVar68._12_4_ = fStack_894 * fVar234;
          auVar68._16_4_ = fStack_890 * fVar235;
          auVar68._20_4_ = fStack_88c * fVar255;
          auVar68._24_4_ = fStack_888 * fVar257;
          auVar68._28_4_ = local_600._28_4_;
          _local_620 = vsubps_avx(auVar68,auVar247);
          auVar23 = vcmpps_avx(auVar23,auVar387,5);
          auVar230._8_4_ = 0x7f800000;
          auVar230._0_8_ = 0x7f8000007f800000;
          auVar230._12_4_ = 0x7f800000;
          auVar230._16_4_ = 0x7f800000;
          auVar230._20_4_ = 0x7f800000;
          auVar230._24_4_ = 0x7f800000;
          auVar230._28_4_ = 0x7f800000;
          auVar229 = vblendvps_avx(auVar230,auVar61,auVar23);
          auVar329._8_4_ = 0x7fffffff;
          auVar329._0_8_ = 0x7fffffff7fffffff;
          auVar329._12_4_ = 0x7fffffff;
          auVar329._16_4_ = 0x7fffffff;
          auVar329._20_4_ = 0x7fffffff;
          auVar329._24_4_ = 0x7fffffff;
          auVar329._28_4_ = 0x7fffffff;
          auVar124 = vandps_avx(auVar329,auVar40);
          auVar124 = vmaxps_avx(local_4a0,auVar124);
          auVar69._4_4_ = auVar124._4_4_ * 1.9073486e-06;
          auVar69._0_4_ = auVar124._0_4_ * 1.9073486e-06;
          auVar69._8_4_ = auVar124._8_4_ * 1.9073486e-06;
          auVar69._12_4_ = auVar124._12_4_ * 1.9073486e-06;
          auVar69._16_4_ = auVar124._16_4_ * 1.9073486e-06;
          auVar69._20_4_ = auVar124._20_4_ * 1.9073486e-06;
          auVar69._24_4_ = auVar124._24_4_ * 1.9073486e-06;
          auVar69._28_4_ = auVar124._28_4_;
          auVar124 = vandps_avx(auVar329,auVar25);
          auVar124 = vcmpps_avx(auVar124,auVar69,1);
          auVar248._8_4_ = 0xff800000;
          auVar248._0_8_ = 0xff800000ff800000;
          auVar248._12_4_ = 0xff800000;
          auVar248._16_4_ = 0xff800000;
          auVar248._20_4_ = 0xff800000;
          auVar248._24_4_ = 0xff800000;
          auVar248._28_4_ = 0xff800000;
          auVar244 = vblendvps_avx(auVar248,auVar62,auVar23);
          auVar24 = auVar23 & auVar124;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0x7f,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0xbf,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar24[0x1f] < '\0') {
            auVar124 = vandps_avx(auVar124,auVar23);
            auVar143 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
            auVar156 = vcmpps_avx(auVar209,auVar387,2);
            auVar404._8_4_ = 0xff800000;
            auVar404._0_8_ = 0xff800000ff800000;
            auVar404._12_4_ = 0xff800000;
            auVar404._16_4_ = 0xff800000;
            auVar404._20_4_ = 0xff800000;
            auVar404._24_4_ = 0xff800000;
            auVar404._28_4_ = 0xff800000;
            auVar413._8_4_ = 0x7f800000;
            auVar413._0_8_ = 0x7f8000007f800000;
            auVar413._12_4_ = 0x7f800000;
            auVar413._16_4_ = 0x7f800000;
            auVar413._20_4_ = 0x7f800000;
            auVar413._24_4_ = 0x7f800000;
            auVar413._28_4_ = 0x7f800000;
            auVar119 = vblendvps_avx(auVar413,auVar404,auVar156);
            auVar112 = vpmovsxwd_avx(auVar143);
            auVar373 = ZEXT1664(auVar112);
            auVar143 = vpunpckhwd_avx(auVar143,auVar143);
            auVar331._16_16_ = auVar143;
            auVar331._0_16_ = auVar112;
            auVar229 = vblendvps_avx(auVar229,auVar119,auVar331);
            auVar119 = vblendvps_avx(auVar404,auVar413,auVar156);
            auVar244 = vblendvps_avx(auVar244,auVar119,auVar331);
            auVar209 = vcmpps_avx(auVar387,auVar387,0xf);
            auVar130._0_4_ = auVar209._0_4_ ^ auVar124._0_4_;
            auVar130._4_4_ = auVar209._4_4_ ^ auVar124._4_4_;
            auVar130._8_4_ = auVar209._8_4_ ^ auVar124._8_4_;
            auVar130._12_4_ = auVar209._12_4_ ^ auVar124._12_4_;
            auVar130._16_4_ = auVar209._16_4_ ^ auVar124._16_4_;
            auVar130._20_4_ = auVar209._20_4_ ^ auVar124._20_4_;
            auVar130._24_4_ = auVar209._24_4_ ^ auVar124._24_4_;
            auVar130._28_4_ = auVar209._28_4_ ^ auVar124._28_4_;
            auVar124 = vorps_avx(auVar156,auVar130);
            auVar156 = vandps_avx(auVar23,auVar124);
          }
          auVar360 = ZEXT3264(auVar119);
          auVar208 = auVar27._0_28_;
          auVar327 = local_8e0._0_28_;
          _local_a20 = auVar158;
        }
        auVar355 = ZEXT3264(auVar249);
        auVar347 = ZEXT3264(auVar10);
        _local_340 = local_820;
        local_320 = vminps_avx(local_2e0,auVar229);
        _local_300 = vmaxps_avx(local_820,auVar244);
        auVar124 = vcmpps_avx(local_820,local_320,2);
        local_520 = vandps_avx(auVar249,auVar124);
        auVar124 = vcmpps_avx(_local_300,local_2e0,2);
        local_5c0 = vandps_avx(auVar249,auVar124);
        auVar273 = ZEXT3264(local_5c0);
        auVar124 = vorps_avx(local_5c0,local_520);
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0x7f,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar124 >> 0xbf,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar124[0x1f] < '\0') {
          local_7e0 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_580._0_4_ = auVar156._0_4_ ^ local_7e0._0_4_;
          local_580._4_4_ = auVar156._4_4_ ^ local_7e0._4_4_;
          local_580._8_4_ = auVar156._8_4_ ^ local_7e0._8_4_;
          local_580._12_4_ = auVar156._12_4_ ^ local_7e0._12_4_;
          local_580._16_4_ = auVar156._16_4_ ^ local_7e0._16_4_;
          local_580._20_4_ = auVar156._20_4_ ^ local_7e0._20_4_;
          local_580._24_4_ = auVar156._24_4_ ^ local_7e0._24_4_;
          local_580._28_4_ = (uint)auVar156._28_4_ ^ local_7e0._28_4_;
          auVar308 = ZEXT3264(local_580);
          auVar123._0_4_ =
               auVar158._0_4_ * (float)local_7a0._0_4_ +
               (float)local_a40._0_4_ * auVar208._0_4_ + (float)local_8a0._0_4_ * auVar327._0_4_;
          auVar123._4_4_ =
               auVar158._4_4_ * (float)local_7a0._4_4_ +
               (float)local_a40._4_4_ * auVar208._4_4_ + (float)local_8a0._4_4_ * auVar327._4_4_;
          auVar123._8_4_ =
               auVar158._8_4_ * fStack_798 +
               fStack_a38 * auVar208._8_4_ + fStack_898 * auVar327._8_4_;
          auVar123._12_4_ =
               auVar158._12_4_ * fStack_794 +
               fStack_a34 * auVar208._12_4_ + fStack_894 * auVar327._12_4_;
          auVar123._16_4_ =
               auVar158._16_4_ * fStack_790 +
               fStack_a30 * auVar208._16_4_ + fStack_890 * auVar327._16_4_;
          auVar123._20_4_ =
               auVar158._20_4_ * fStack_78c +
               fStack_a2c * auVar208._20_4_ + fStack_88c * auVar327._20_4_;
          auVar123._24_4_ =
               auVar158._24_4_ * fStack_788 +
               fStack_a28 * auVar208._24_4_ + fStack_888 * auVar327._24_4_;
          auVar123._28_4_ = auVar156._28_4_ + auVar158._28_4_ + fStack_a24;
          auVar160._8_4_ = 0x7fffffff;
          auVar160._0_8_ = 0x7fffffff7fffffff;
          auVar160._12_4_ = 0x7fffffff;
          auVar160._16_4_ = 0x7fffffff;
          auVar160._20_4_ = 0x7fffffff;
          auVar160._24_4_ = 0x7fffffff;
          auVar160._28_4_ = 0x7fffffff;
          auVar124 = vandps_avx(auVar123,auVar160);
          auVar161._8_4_ = 0x3e99999a;
          auVar161._0_8_ = 0x3e99999a3e99999a;
          auVar161._12_4_ = 0x3e99999a;
          auVar161._16_4_ = 0x3e99999a;
          auVar161._20_4_ = 0x3e99999a;
          auVar161._24_4_ = 0x3e99999a;
          auVar161._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar161,1);
          auVar124 = vorps_avx(auVar124,local_580);
          auVar162._8_4_ = 3;
          auVar162._0_8_ = 0x300000003;
          auVar162._12_4_ = 3;
          auVar162._16_4_ = 3;
          auVar162._20_4_ = 3;
          auVar162._24_4_ = 3;
          auVar162._28_4_ = 3;
          auVar192._8_4_ = 2;
          auVar192._0_8_ = 0x200000002;
          auVar192._12_4_ = 2;
          auVar192._16_4_ = 2;
          auVar192._20_4_ = 2;
          auVar192._24_4_ = 2;
          auVar192._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar192,auVar162,auVar124);
          local_560 = ZEXT432((uint)uVar98);
          local_840 = vpshufd_avx(ZEXT416((uint)uVar98),0);
          auVar143 = vpcmpgtd_avx(auVar124._16_16_,local_840);
          auStack_830 = auVar22._16_16_;
          auVar112 = vpcmpgtd_avx(auVar124._0_16_,local_840);
          auVar163._16_16_ = auVar143;
          auVar163._0_16_ = auVar112;
          auVar124 = vblendps_avx(ZEXT1632(auVar112),auVar163,0xf0);
          local_5a0 = vandnps_avx(auVar124,local_520);
          auVar252 = ZEXT3264(local_5a0);
          auVar119 = local_520 & ~auVar124;
          auVar232 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auStack_5d8 = auVar120._8_24_;
          local_5e0 = uVar98;
          auVar249 = _local_300;
          fVar138 = (float)local_a40._0_4_;
          fVar172 = (float)local_a40._4_4_;
          fVar174 = fStack_a38;
          fVar200 = fStack_a34;
          fVar213 = fStack_a30;
          fVar214 = fStack_a2c;
          fVar215 = fStack_a28;
          local_540 = auVar124;
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0x7f,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0xbf,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar119[0x1f] < '\0') {
            local_7c0._4_4_ = local_820._4_4_ + (float)local_920._4_4_;
            local_7c0._0_4_ = local_820._0_4_ + (float)local_920._0_4_;
            fStack_7b8 = local_820._8_4_ + fStack_918;
            fStack_7b4 = local_820._12_4_ + fStack_914;
            fStack_7b0 = local_820._16_4_ + fStack_910;
            fStack_7ac = local_820._20_4_ + fStack_90c;
            fStack_7a8 = local_820._24_4_ + fStack_908;
            fStack_7a4 = local_820._28_4_ + fStack_904;
            local_ac0 = _local_300;
            local_9c0 = local_5c0;
            do {
              auVar220 = auVar232._0_16_;
              auVar164._8_4_ = 0x7f800000;
              auVar164._0_8_ = 0x7f8000007f800000;
              auVar164._12_4_ = 0x7f800000;
              auVar164._16_4_ = 0x7f800000;
              auVar164._20_4_ = 0x7f800000;
              auVar164._24_4_ = 0x7f800000;
              auVar164._28_4_ = 0x7f800000;
              auVar124 = auVar252._0_32_;
              auVar119 = vblendvps_avx(auVar164,local_820,auVar124);
              auVar249 = vshufps_avx(auVar119,auVar119,0xb1);
              auVar249 = vminps_avx(auVar119,auVar249);
              auVar156 = vshufpd_avx(auVar249,auVar249,5);
              auVar249 = vminps_avx(auVar249,auVar156);
              auVar156 = vperm2f128_avx(auVar249,auVar249,1);
              auVar249 = vminps_avx(auVar249,auVar156);
              auVar119 = vcmpps_avx(auVar119,auVar249,0);
              auVar249 = auVar124 & auVar119;
              if ((((((((auVar249 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar249 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar249 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar249 >> 0x7f,0) != '\0') ||
                    (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar249 >> 0xbf,0) != '\0') ||
                  (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar249[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar119,auVar124);
              }
              local_780._0_8_ = uVar97;
              uVar89 = vmovmskps_avx(auVar124);
              uVar90 = 0;
              if (uVar89 != 0) {
                for (; (uVar89 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
                }
              }
              uVar98 = (ulong)uVar90;
              *(undefined4 *)(local_5a0 + uVar98 * 4) = 0;
              fVar138 = local_4e0[uVar98];
              uVar90 = *(uint *)(local_340 + uVar98 * 4);
              fVar172 = local_ac4;
              if ((float)local_900._0_4_ < 0.0) {
                fVar172 = sqrtf((float)local_900._0_4_);
                auVar220._8_4_ = 0x7fffffff;
                auVar220._0_8_ = 0x7fffffff7fffffff;
                auVar220._12_4_ = 0x7fffffff;
              }
              auVar360 = ZEXT464(uVar90);
              auVar347 = ZEXT464((uint)fVar138);
              auVar112 = vminps_avx(_local_a50,_local_a70);
              auVar143 = vmaxps_avx(_local_a50,_local_a70);
              auVar107 = vminps_avx(_local_a60,_local_a80);
              auVar114 = vminps_avx(auVar112,auVar107);
              auVar112 = vmaxps_avx(_local_a60,_local_a80);
              auVar107 = vmaxps_avx(auVar143,auVar112);
              auVar143 = vandps_avx(auVar114,auVar220);
              auVar112 = vandps_avx(auVar107,auVar220);
              auVar143 = vmaxps_avx(auVar143,auVar112);
              auVar112 = vmovshdup_avx(auVar143);
              auVar112 = vmaxss_avx(auVar112,auVar143);
              auVar143 = vshufpd_avx(auVar143,auVar143,1);
              auVar143 = vmaxss_avx(auVar143,auVar112);
              local_8c0 = auVar143._0_4_ * 1.9073486e-06;
              local_700._0_4_ = fVar172 * 1.9073486e-06;
              _local_760 = vshufps_avx(auVar107,auVar107,0xff);
              lVar94 = 5;
              do {
                fVar216 = auVar347._0_4_;
                fVar213 = 1.0 - fVar216;
                fVar138 = fVar213 * fVar213 * fVar213;
                fVar172 = fVar216 * fVar216;
                fVar174 = fVar216 * fVar172;
                fVar200 = fVar216 * fVar213;
                auVar143 = vshufps_avx(ZEXT416((uint)(fVar174 * 0.16666667)),
                                       ZEXT416((uint)(fVar174 * 0.16666667)),0);
                auVar112 = ZEXT416((uint)((fVar174 * 4.0 + fVar138 +
                                          fVar216 * fVar200 * 12.0 + fVar213 * fVar200 * 6.0) *
                                         0.16666667));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar107 = ZEXT416((uint)((fVar138 * 4.0 + fVar174 +
                                          fVar213 * fVar200 * 12.0 + fVar216 * fVar200 * 6.0) *
                                         0.16666667));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar114 = vshufps_avx(auVar360._0_16_,auVar360._0_16_,0);
                auVar181._0_4_ = auVar114._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar181._4_4_ = auVar114._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar181._8_4_ = auVar114._8_4_ * fStack_8e8 + 0.0;
                auVar181._12_4_ = auVar114._12_4_ * fStack_8e4 + 0.0;
                auVar114 = vshufps_avx(ZEXT416((uint)(fVar138 * 0.16666667)),
                                       ZEXT416((uint)(fVar138 * 0.16666667)),0);
                auVar105._0_4_ =
                     auVar114._0_4_ * (float)local_a50._0_4_ +
                     auVar107._0_4_ * (float)local_a70._0_4_ +
                     auVar143._0_4_ * (float)local_a80._0_4_ +
                     auVar112._0_4_ * (float)local_a60._0_4_;
                auVar105._4_4_ =
                     auVar114._4_4_ * (float)local_a50._4_4_ +
                     auVar107._4_4_ * (float)local_a70._4_4_ +
                     auVar143._4_4_ * (float)local_a80._4_4_ +
                     auVar112._4_4_ * (float)local_a60._4_4_;
                auVar105._8_4_ =
                     auVar114._8_4_ * fStack_a48 +
                     auVar107._8_4_ * fStack_a68 +
                     auVar143._8_4_ * fStack_a78 + auVar112._8_4_ * fStack_a58;
                auVar105._12_4_ =
                     auVar114._12_4_ * fStack_a44 +
                     auVar107._12_4_ * fStack_a64 +
                     auVar143._12_4_ * fStack_a74 + auVar112._12_4_ * fStack_a54;
                local_8e0._0_16_ = auVar105;
                auVar143 = vsubps_avx(auVar181,auVar105);
                _local_a20 = auVar143;
                auVar143 = vdpps_avx(auVar143,auVar143,0x7f);
                fVar233 = auVar143._0_4_;
                if (fVar233 < 0.0) {
                  local_aa0._0_4_ = fVar172;
                  local_9e0._0_4_ = fVar200;
                  fVar138 = sqrtf(fVar233);
                  fVar172 = (float)local_aa0._0_4_;
                  fVar200 = (float)local_9e0._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar143,auVar143);
                  fVar138 = auVar112._0_4_;
                }
                auVar112 = vshufps_avx(ZEXT416((uint)(fVar172 * 0.5)),ZEXT416((uint)(fVar172 * 0.5))
                                       ,0);
                auVar107 = ZEXT416((uint)((fVar213 * fVar213 + fVar200 * 4.0) * 0.5));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar114 = ZEXT416((uint)((fVar216 * -fVar216 - fVar200 * 4.0) * 0.5));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar106 = ZEXT416((uint)(fVar213 * -fVar213 * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar325._0_4_ =
                     (float)local_a50._0_4_ * auVar106._0_4_ +
                     (float)local_a70._0_4_ * auVar114._0_4_ +
                     (float)local_a80._0_4_ * auVar112._0_4_ +
                     (float)local_a60._0_4_ * auVar107._0_4_;
                auVar325._4_4_ =
                     (float)local_a50._4_4_ * auVar106._4_4_ +
                     (float)local_a70._4_4_ * auVar114._4_4_ +
                     (float)local_a80._4_4_ * auVar112._4_4_ +
                     (float)local_a60._4_4_ * auVar107._4_4_;
                auVar325._8_4_ =
                     fStack_a48 * auVar106._8_4_ +
                     fStack_a68 * auVar114._8_4_ +
                     fStack_a78 * auVar112._8_4_ + fStack_a58 * auVar107._8_4_;
                auVar325._12_4_ =
                     fStack_a44 * auVar106._12_4_ +
                     fStack_a64 * auVar114._12_4_ +
                     fStack_a74 * auVar112._12_4_ + fStack_a54 * auVar107._12_4_;
                auVar112 = vshufps_avx(auVar347._0_16_,auVar347._0_16_,0);
                auVar107 = ZEXT416((uint)(fVar213 - (fVar216 + fVar216)));
                auVar114 = vshufps_avx(auVar107,auVar107,0);
                auVar107 = ZEXT416((uint)(fVar216 - (fVar213 + fVar213)));
                auVar106 = vshufps_avx(auVar107,auVar107,0);
                auVar113 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                auVar107 = vdpps_avx(auVar325,auVar325,0x7f);
                auVar144._0_4_ =
                     (float)local_a50._0_4_ * auVar113._0_4_ +
                     (float)local_a70._0_4_ * auVar106._0_4_ +
                     (float)local_a80._0_4_ * auVar112._0_4_ +
                     (float)local_a60._0_4_ * auVar114._0_4_;
                auVar144._4_4_ =
                     (float)local_a50._4_4_ * auVar113._4_4_ +
                     (float)local_a70._4_4_ * auVar106._4_4_ +
                     (float)local_a80._4_4_ * auVar112._4_4_ +
                     (float)local_a60._4_4_ * auVar114._4_4_;
                auVar144._8_4_ =
                     fStack_a48 * auVar113._8_4_ +
                     fStack_a68 * auVar106._8_4_ +
                     fStack_a78 * auVar112._8_4_ + fStack_a58 * auVar114._8_4_;
                auVar144._12_4_ =
                     fStack_a44 * auVar113._12_4_ +
                     fStack_a64 * auVar106._12_4_ +
                     fStack_a74 * auVar112._12_4_ + fStack_a54 * auVar114._12_4_;
                auVar112 = vblendps_avx(auVar107,_DAT_01feba10,0xe);
                auVar114 = vrsqrtss_avx(auVar112,auVar112);
                fVar174 = auVar114._0_4_;
                fVar172 = auVar107._0_4_;
                auVar114 = vdpps_avx(auVar325,auVar144,0x7f);
                auVar106 = vshufps_avx(auVar107,auVar107,0);
                auVar145._0_4_ = auVar144._0_4_ * auVar106._0_4_;
                auVar145._4_4_ = auVar144._4_4_ * auVar106._4_4_;
                auVar145._8_4_ = auVar144._8_4_ * auVar106._8_4_;
                auVar145._12_4_ = auVar144._12_4_ * auVar106._12_4_;
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar221._0_4_ = auVar325._0_4_ * auVar114._0_4_;
                auVar221._4_4_ = auVar325._4_4_ * auVar114._4_4_;
                auVar221._8_4_ = auVar325._8_4_ * auVar114._8_4_;
                auVar221._12_4_ = auVar325._12_4_ * auVar114._12_4_;
                auVar113 = vsubps_avx(auVar145,auVar221);
                auVar114 = vrcpss_avx(auVar112,auVar112);
                auVar112 = vmaxss_avx(ZEXT416((uint)local_8c0),
                                      ZEXT416((uint)(auVar360._0_4_ * (float)local_700._0_4_)));
                auVar373 = ZEXT1664(auVar112);
                auVar114 = ZEXT416((uint)(auVar114._0_4_ * (2.0 - fVar172 * auVar114._0_4_)));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                uVar98 = CONCAT44(auVar325._4_4_,auVar325._0_4_);
                auVar239._0_8_ = uVar98 ^ 0x8000000080000000;
                auVar239._8_4_ = -auVar325._8_4_;
                auVar239._12_4_ = -auVar325._12_4_;
                auVar106 = ZEXT416((uint)(fVar174 * 1.5 +
                                         fVar172 * -0.5 * fVar174 * fVar174 * fVar174));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar204._0_4_ = auVar106._0_4_ * auVar113._0_4_ * auVar114._0_4_;
                auVar204._4_4_ = auVar106._4_4_ * auVar113._4_4_ * auVar114._4_4_;
                auVar204._8_4_ = auVar106._8_4_ * auVar113._8_4_ * auVar114._8_4_;
                auVar204._12_4_ = auVar106._12_4_ * auVar113._12_4_ * auVar114._12_4_;
                auVar266._0_4_ = auVar325._0_4_ * auVar106._0_4_;
                auVar266._4_4_ = auVar325._4_4_ * auVar106._4_4_;
                auVar266._8_4_ = auVar325._8_4_ * auVar106._8_4_;
                auVar266._12_4_ = auVar325._12_4_ * auVar106._12_4_;
                local_aa0._0_4_ = auVar112._0_4_;
                if (fVar172 < 0.0) {
                  local_9e0._0_16_ = auVar239;
                  local_940._0_16_ = auVar266;
                  _local_a00 = auVar204;
                  fVar172 = sqrtf(fVar172);
                  auVar373 = ZEXT464((uint)local_aa0._0_4_);
                  auVar204 = _local_a00;
                  auVar239 = local_9e0._0_16_;
                  auVar266 = local_940._0_16_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar107,auVar107);
                  fVar172 = auVar112._0_4_;
                }
                auVar112 = vdpps_avx(_local_a20,auVar266,0x7f);
                fVar234 = (local_8c0 / fVar172) * (fVar138 + 1.0) +
                          auVar373._0_4_ + fVar138 * local_8c0;
                auVar107 = vdpps_avx(auVar239,auVar266,0x7f);
                auVar114 = vdpps_avx(_local_a20,auVar204,0x7f);
                auVar106 = vdpps_avx(_local_8f0,auVar266,0x7f);
                auVar113 = vdpps_avx(_local_a20,auVar239,0x7f);
                fVar138 = auVar107._0_4_ + auVar114._0_4_;
                fVar172 = auVar112._0_4_;
                auVar108._0_4_ = fVar172 * fVar172;
                auVar108._4_4_ = auVar112._4_4_ * auVar112._4_4_;
                auVar108._8_4_ = auVar112._8_4_ * auVar112._8_4_;
                auVar108._12_4_ = auVar112._12_4_ * auVar112._12_4_;
                auVar114 = vsubps_avx(auVar143,auVar108);
                auVar107 = vdpps_avx(_local_a20,_local_8f0,0x7f);
                fVar174 = auVar113._0_4_ - fVar172 * fVar138;
                fVar200 = auVar107._0_4_ - fVar172 * auVar106._0_4_;
                auVar107 = vrsqrtss_avx(auVar114,auVar114);
                fVar213 = auVar114._0_4_;
                fVar172 = auVar107._0_4_;
                fVar172 = fVar172 * 1.5 + fVar213 * -0.5 * fVar172 * fVar172 * fVar172;
                if (fVar213 < 0.0) {
                  local_9e0._0_16_ = auVar112;
                  local_940._0_4_ = fVar234;
                  local_960._0_4_ = fVar174;
                  local_720._0_4_ = fVar200;
                  local_740._0_4_ = fVar172;
                  _local_a00 = auVar106;
                  fVar213 = sqrtf(fVar213);
                  auVar373 = ZEXT464((uint)local_aa0._0_4_);
                  fVar172 = (float)local_740._0_4_;
                  fVar174 = (float)local_960._0_4_;
                  fVar200 = (float)local_720._0_4_;
                  auVar106 = _local_a00;
                  auVar112 = local_9e0._0_16_;
                  fVar234 = (float)local_940._0_4_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar114,auVar114);
                  fVar213 = auVar107._0_4_;
                }
                auVar308 = ZEXT1664(auVar143);
                auVar355 = ZEXT3264(_local_8a0);
                auVar146 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar113 = vshufps_avx(auVar325,auVar325,0xff);
                fVar174 = fVar174 * fVar172 - auVar113._0_4_;
                auVar222._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
                auVar222._8_4_ = auVar106._8_4_ ^ 0x80000000;
                auVar222._12_4_ = auVar106._12_4_ ^ 0x80000000;
                auVar240._0_4_ = -fVar174;
                auVar240._4_4_ = 0x80000000;
                auVar240._8_4_ = 0x80000000;
                auVar240._12_4_ = 0x80000000;
                auVar107 = vinsertps_avx(ZEXT416((uint)(fVar200 * fVar172)),auVar222,0x10);
                auVar114 = vmovsldup_avx(ZEXT416((uint)(fVar138 * fVar200 * fVar172 -
                                                       auVar106._0_4_ * fVar174)));
                auVar107 = vdivps_avx(auVar107,auVar114);
                auVar146 = ZEXT416((uint)(fVar213 - auVar146._0_4_));
                auVar106 = vinsertps_avx(auVar112,auVar146,0x10);
                auVar205._0_4_ = auVar106._0_4_ * auVar107._0_4_;
                auVar205._4_4_ = auVar106._4_4_ * auVar107._4_4_;
                auVar205._8_4_ = auVar106._8_4_ * auVar107._8_4_;
                auVar205._12_4_ = auVar106._12_4_ * auVar107._12_4_;
                auVar107 = vinsertps_avx(auVar240,ZEXT416((uint)fVar138),0x1c);
                auVar107 = vdivps_avx(auVar107,auVar114);
                auVar114 = vhaddps_avx(auVar205,auVar205);
                auVar182._0_4_ = auVar106._0_4_ * auVar107._0_4_;
                auVar182._4_4_ = auVar106._4_4_ * auVar107._4_4_;
                auVar182._8_4_ = auVar106._8_4_ * auVar107._8_4_;
                auVar182._12_4_ = auVar106._12_4_ * auVar107._12_4_;
                auVar107 = vhaddps_avx(auVar182,auVar182);
                fVar216 = fVar216 - auVar114._0_4_;
                fVar235 = auVar360._0_4_ - auVar107._0_4_;
                auVar223._8_4_ = 0x7fffffff;
                auVar223._0_8_ = 0x7fffffff7fffffff;
                auVar223._12_4_ = 0x7fffffff;
                auVar232 = ZEXT1664(auVar223);
                auVar112 = vandps_avx(auVar112,auVar223);
                bVar99 = true;
                auVar412 = local_8a0._0_28_;
                fVar138 = (float)local_a40._0_4_;
                fVar172 = (float)local_a40._4_4_;
                fVar174 = fStack_a38;
                fVar200 = fStack_a34;
                fVar213 = fStack_a30;
                fVar214 = fStack_a2c;
                fVar215 = fStack_a28;
                if (fVar234 <= auVar112._0_4_) {
LAB_01010bf8:
                  auVar273 = ZEXT3264(local_9c0);
                  auVar360 = ZEXT464((uint)fVar235);
                }
                else {
                  auVar112 = vandps_avx(auVar146,auVar223);
                  auVar273 = ZEXT3264(local_9c0);
                  if ((float)local_760._0_4_ * 1.9073486e-06 + auVar373._0_4_ + fVar234 <=
                      auVar112._0_4_) goto LAB_01010bf8;
                  fVar235 = fVar235 + (float)local_870._0_4_;
                  if (fVar235 < fVar137) {
                    bVar99 = false;
                    uVar91 = 0;
                    goto LAB_01010bf8;
                  }
                  fVar234 = *(float *)(ray + k * 4 + 0x80);
                  auVar373 = ZEXT464((uint)fVar234);
                  auVar112 = ZEXT416((uint)fVar235);
                  bVar99 = false;
                  if (fVar235 <= fVar234) {
                    auVar360 = ZEXT1664(auVar112);
                    if ((fVar216 < 0.0) || (1.0 < fVar216)) {
                      uVar91 = 0;
                    }
                    else {
                      auVar143 = vrsqrtss_avx(auVar143,auVar143);
                      fVar236 = auVar143._0_4_;
                      pGVar12 = (context->scene->geometries).items[local_998].ptr;
                      if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        uVar91 = 0;
                      }
                      else {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar143 = ZEXT416((uint)(fVar236 * 1.5 +
                                                   fVar233 * -0.5 * fVar236 * fVar236 * fVar236));
                          auVar143 = vshufps_avx(auVar143,auVar143,0);
                          auVar147._0_4_ = auVar143._0_4_ * (float)local_a20._0_4_;
                          auVar147._4_4_ = auVar143._4_4_ * (float)local_a20._4_4_;
                          auVar147._8_4_ = auVar143._8_4_ * fStack_a18;
                          auVar147._12_4_ = auVar143._12_4_ * fStack_a14;
                          auVar308 = ZEXT1664(auVar325);
                          auVar109._0_4_ = auVar325._0_4_ + auVar113._0_4_ * auVar147._0_4_;
                          auVar109._4_4_ = auVar325._4_4_ + auVar113._4_4_ * auVar147._4_4_;
                          auVar109._8_4_ = auVar325._8_4_ + auVar113._8_4_ * auVar147._8_4_;
                          auVar109._12_4_ = auVar325._12_4_ + auVar113._12_4_ * auVar147._12_4_;
                          auVar143 = vshufps_avx(auVar147,auVar147,0xc9);
                          auVar107 = vshufps_avx(auVar325,auVar325,0xc9);
                          auVar148._0_4_ = auVar107._0_4_ * auVar147._0_4_;
                          auVar148._4_4_ = auVar107._4_4_ * auVar147._4_4_;
                          auVar148._8_4_ = auVar107._8_4_ * auVar147._8_4_;
                          auVar148._12_4_ = auVar107._12_4_ * auVar147._12_4_;
                          auVar183._0_4_ = auVar325._0_4_ * auVar143._0_4_;
                          auVar183._4_4_ = auVar325._4_4_ * auVar143._4_4_;
                          auVar183._8_4_ = auVar325._8_4_ * auVar143._8_4_;
                          auVar183._12_4_ = auVar325._12_4_ * auVar143._12_4_;
                          auVar114 = vsubps_avx(auVar183,auVar148);
                          auVar143 = vshufps_avx(auVar114,auVar114,0xc9);
                          auVar107 = vshufps_avx(auVar109,auVar109,0xc9);
                          auVar184._0_4_ = auVar107._0_4_ * auVar143._0_4_;
                          auVar184._4_4_ = auVar107._4_4_ * auVar143._4_4_;
                          auVar184._8_4_ = auVar107._8_4_ * auVar143._8_4_;
                          auVar184._12_4_ = auVar107._12_4_ * auVar143._12_4_;
                          auVar143 = vshufps_avx(auVar114,auVar114,0xd2);
                          auVar110._0_4_ = auVar109._0_4_ * auVar143._0_4_;
                          auVar110._4_4_ = auVar109._4_4_ * auVar143._4_4_;
                          auVar110._8_4_ = auVar109._8_4_ * auVar143._8_4_;
                          auVar110._12_4_ = auVar109._12_4_ * auVar143._12_4_;
                          auVar143 = vsubps_avx(auVar184,auVar110);
                          local_690 = vshufps_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),0);
                          local_6c0 = (RTCHitN  [16])vshufps_avx(auVar143,auVar143,0x55);
                          auStack_6b0 = vshufps_avx(auVar143,auVar143,0xaa);
                          local_6a0 = vshufps_avx(auVar143,auVar143,0);
                          local_680 = ZEXT816(0) << 0x20;
                          local_670 = local_6e0._0_8_;
                          uStack_668 = local_6e0._8_8_;
                          local_660 = local_6d0._0_8_;
                          uStack_658 = local_6d0._8_8_;
                          uVar90 = context->user->instID[0];
                          _local_650 = CONCAT44(uVar90,uVar90);
                          _uStack_648 = CONCAT44(uVar90,uVar90);
                          uVar90 = context->user->instPrimID[0];
                          _uStack_640 = CONCAT44(uVar90,uVar90);
                          _uStack_638 = CONCAT44(uVar90,uVar90);
                          *(float *)(ray + k * 4 + 0x80) = fVar235;
                          local_ae0 = *local_9a0;
                          uStack_ad8 = local_9a0[1];
                          local_990.valid = (int *)&local_ae0;
                          local_990.geometryUserPtr = pGVar12->userPtr;
                          local_990.context = context->user;
                          local_990.hit = local_6c0;
                          local_990.N = 4;
                          local_990.ray = (RTCRayN *)ray;
                          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar308 = ZEXT1664(auVar325);
                            auVar355 = ZEXT1664(local_8a0._0_16_);
                            (*pGVar12->occlusionFilterN)(&local_990);
                            auVar273 = ZEXT3264(local_9c0);
                            auVar412 = local_8a0._0_28_;
                            auVar232 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar81._8_8_ = uStack_ad8;
                          auVar81._0_8_ = local_ae0;
                          if (auVar81 == (undefined1  [16])0x0) {
                            auVar143 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar143 = auVar143 ^ _DAT_01febe20;
                            fVar138 = (float)local_a40._0_4_;
                            fVar172 = (float)local_a40._4_4_;
                            fVar174 = fStack_a38;
                            fVar200 = fStack_a34;
                            fVar213 = fStack_a30;
                            fVar214 = fStack_a2c;
                            fVar215 = fStack_a28;
                          }
                          else {
                            p_Var16 = context->args->filter;
                            if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar308 = ZEXT1664(auVar308._0_16_);
                              auVar355 = ZEXT1664(auVar355._0_16_);
                              (*p_Var16)(&local_990);
                              auVar273 = ZEXT3264(local_9c0);
                              auVar412 = local_8a0._0_28_;
                              auVar232 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            auVar82._8_8_ = uStack_ad8;
                            auVar82._0_8_ = local_ae0;
                            auVar107 = vpcmpeqd_avx((undefined1  [16])0x0,auVar82);
                            auVar143 = auVar107 ^ _DAT_01febe20;
                            auVar185._8_4_ = 0xff800000;
                            auVar185._0_8_ = 0xff800000ff800000;
                            auVar185._12_4_ = 0xff800000;
                            auVar107 = vblendvps_avx(auVar185,*(undefined1 (*) [16])
                                                               (local_990.ray + 0x80),auVar107);
                            *(undefined1 (*) [16])(local_990.ray + 0x80) = auVar107;
                            fVar138 = (float)local_a40._0_4_;
                            fVar172 = (float)local_a40._4_4_;
                            fVar174 = fStack_a38;
                            fVar200 = fStack_a34;
                            fVar213 = fStack_a30;
                            fVar214 = fStack_a2c;
                            fVar215 = fStack_a28;
                          }
                          auVar360 = ZEXT1664(auVar112);
                          auVar373 = ZEXT464((uint)fVar234);
                          auVar149._8_8_ = 0x100000001;
                          auVar149._0_8_ = 0x100000001;
                          bVar99 = (auVar149 & auVar143) != (undefined1  [16])0x0;
                          uVar91 = (ulong)bVar99;
                          if (!bVar99) {
                            *(float *)(ray + k * 4 + 0x80) = fVar234;
                          }
                          bVar99 = false;
                          goto LAB_01010bfd;
                        }
                        uVar91 = 1;
                      }
                      bVar99 = false;
                    }
                  }
                  else {
                    uVar91 = 0;
                    auVar360 = ZEXT1664(auVar112);
                  }
                }
LAB_01010bfd:
                auVar347 = ZEXT464((uint)fVar216);
                bVar93 = (byte)uVar91;
                if (!bVar99) goto LAB_01010fa2;
                lVar94 = lVar94 + -1;
              } while (lVar94 != 0);
              bVar93 = 0;
              auVar273 = ZEXT3264(local_9c0);
              fVar138 = (float)local_a40._0_4_;
              fVar172 = (float)local_a40._4_4_;
              fVar174 = fStack_a38;
              fVar200 = fStack_a34;
              fVar213 = fStack_a30;
              fVar214 = fStack_a2c;
              fVar215 = fStack_a28;
LAB_01010fa2:
              uVar91 = (ulong)(bVar93 & 1);
              uVar97 = CONCAT71(local_780._1_7_,local_780[0] | bVar93 & 1);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar125._4_4_ = uVar8;
              auVar125._0_4_ = uVar8;
              auVar125._8_4_ = uVar8;
              auVar125._12_4_ = uVar8;
              auVar125._16_4_ = uVar8;
              auVar125._20_4_ = uVar8;
              auVar125._24_4_ = uVar8;
              auVar125._28_4_ = uVar8;
              auVar124 = vcmpps_avx(_local_7c0,auVar125,2);
              auVar119 = vandps_avx(auVar124,local_5a0);
              auVar252 = ZEXT3264(auVar119);
              auVar156 = local_5a0 & auVar124;
              uVar98 = local_5e0;
              auVar249 = local_ac0;
              local_5a0 = auVar119;
            } while ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar156 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar156 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar156 >> 0x7f,0) != '\0') ||
                       (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar156 >> 0xbf,0) != '\0') ||
                     (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar156[0x1f] < '\0');
          }
          auVar126._0_4_ =
               (float)local_800._0_4_ * (float)local_7a0._0_4_ +
               fVar138 * (float)local_600._0_4_ + auVar412._0_4_ * (float)local_620._0_4_;
          auVar126._4_4_ =
               (float)local_800._4_4_ * (float)local_7a0._4_4_ +
               fVar172 * (float)local_600._4_4_ + auVar412._4_4_ * (float)local_620._4_4_;
          auVar126._8_4_ =
               fStack_7f8 * fStack_798 + fVar174 * fStack_5f8 + auVar412._8_4_ * fStack_618;
          auVar126._12_4_ =
               fStack_7f4 * fStack_794 + fVar200 * fStack_5f4 + auVar412._12_4_ * fStack_614;
          auVar126._16_4_ =
               fStack_7f0 * fStack_790 + fVar213 * fStack_5f0 + auVar412._16_4_ * fStack_610;
          auVar126._20_4_ =
               fStack_7ec * fStack_78c + fVar214 * fStack_5ec + auVar412._20_4_ * fStack_60c;
          auVar126._24_4_ =
               fStack_7e8 * fStack_788 + fVar215 * fStack_5e8 + auVar412._24_4_ * fStack_608;
          auVar126._28_4_ = fStack_7e4 + auVar124._28_4_ + auVar252._28_4_;
          auVar165._8_4_ = 0x7fffffff;
          auVar165._0_8_ = 0x7fffffff7fffffff;
          auVar165._12_4_ = 0x7fffffff;
          auVar165._16_4_ = 0x7fffffff;
          auVar165._20_4_ = 0x7fffffff;
          auVar165._24_4_ = 0x7fffffff;
          auVar165._28_4_ = 0x7fffffff;
          auVar124 = vandps_avx(auVar126,auVar165);
          auVar166._8_4_ = 0x3e99999a;
          auVar166._0_8_ = 0x3e99999a3e99999a;
          auVar166._12_4_ = 0x3e99999a;
          auVar166._16_4_ = 0x3e99999a;
          auVar166._20_4_ = 0x3e99999a;
          auVar166._24_4_ = 0x3e99999a;
          auVar166._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar166,1);
          auVar119 = vorps_avx(auVar124,local_580);
          auVar167._0_4_ = (float)local_920._0_4_ + auVar249._0_4_;
          auVar167._4_4_ = (float)local_920._4_4_ + auVar249._4_4_;
          auVar167._8_4_ = fStack_918 + auVar249._8_4_;
          auVar167._12_4_ = fStack_914 + auVar249._12_4_;
          auVar167._16_4_ = fStack_910 + auVar249._16_4_;
          auVar167._20_4_ = fStack_90c + auVar249._20_4_;
          auVar167._24_4_ = fStack_908 + auVar249._24_4_;
          auVar167._28_4_ = fStack_904 + auVar249._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar193._4_4_ = uVar8;
          auVar193._0_4_ = uVar8;
          auVar193._8_4_ = uVar8;
          auVar193._12_4_ = uVar8;
          auVar193._16_4_ = uVar8;
          auVar193._20_4_ = uVar8;
          auVar193._24_4_ = uVar8;
          auVar193._28_4_ = uVar8;
          auVar124 = vcmpps_avx(auVar167,auVar193,2);
          _local_7c0 = vandps_avx(auVar124,auVar273._0_32_);
          auVar168._8_4_ = 3;
          auVar168._0_8_ = 0x300000003;
          auVar168._12_4_ = 3;
          auVar168._16_4_ = 3;
          auVar168._20_4_ = 3;
          auVar168._24_4_ = 3;
          auVar168._28_4_ = 3;
          auVar194._8_4_ = 2;
          auVar194._0_8_ = 0x200000002;
          auVar194._12_4_ = 2;
          auVar194._16_4_ = 2;
          auVar194._20_4_ = 2;
          auVar194._24_4_ = 2;
          auVar194._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar194,auVar168,auVar119);
          auVar143 = vpcmpgtd_avx(auVar124._16_16_,local_840);
          auVar112 = vpshufd_avx(local_560._0_16_,0);
          auVar112 = vpcmpgtd_avx(auVar124._0_16_,auVar112);
          auVar169._16_16_ = auVar143;
          auVar169._0_16_ = auVar112;
          _local_800 = vblendps_avx(ZEXT1632(auVar112),auVar169,0xf0);
          auVar124 = vandnps_avx(_local_800,_local_7c0);
          auVar119 = _local_7c0 & ~_local_800;
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0x7f,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0xbf,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar119[0x1f] < '\0') {
            local_740 = _local_300;
            local_760._4_4_ = (float)local_920._4_4_ + (float)local_300._4_4_;
            local_760._0_4_ = (float)local_920._0_4_ + (float)local_300._0_4_;
            fStack_758 = fStack_918 + fStack_2f8;
            fStack_754 = fStack_914 + fStack_2f4;
            fStack_750 = fStack_910 + fStack_2f0;
            fStack_74c = fStack_90c + fStack_2ec;
            fStack_748 = fStack_908 + fStack_2e8;
            fStack_744 = fStack_904 + fStack_2e4;
            do {
              auVar224 = auVar232._0_16_;
              auVar170._8_4_ = 0x7f800000;
              auVar170._0_8_ = 0x7f8000007f800000;
              auVar170._12_4_ = 0x7f800000;
              auVar170._16_4_ = 0x7f800000;
              auVar170._20_4_ = 0x7f800000;
              auVar170._24_4_ = 0x7f800000;
              auVar170._28_4_ = 0x7f800000;
              auVar119 = vblendvps_avx(auVar170,local_740,auVar124);
              auVar249 = vshufps_avx(auVar119,auVar119,0xb1);
              auVar249 = vminps_avx(auVar119,auVar249);
              auVar156 = vshufpd_avx(auVar249,auVar249,5);
              auVar249 = vminps_avx(auVar249,auVar156);
              auVar156 = vperm2f128_avx(auVar249,auVar249,1);
              auVar249 = vminps_avx(auVar249,auVar156);
              auVar249 = vcmpps_avx(auVar119,auVar249,0);
              auVar156 = auVar124 & auVar249;
              auVar119 = auVar124;
              if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar156 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar156 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar156 >> 0x7f,0) != '\0') ||
                    (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar156 >> 0xbf,0) != '\0') ||
                  (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar156[0x1f] < '\0') {
                auVar119 = vandps_avx(auVar249,auVar124);
              }
              local_780._0_8_ = uVar97;
              uVar89 = vmovmskps_avx(auVar119);
              uVar90 = 0;
              if (uVar89 != 0) {
                for (; (uVar89 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
                }
              }
              uVar98 = (ulong)uVar90;
              local_5c0 = auVar124;
              *(undefined4 *)(local_5c0 + uVar98 * 4) = 0;
              fVar138 = local_500[uVar98];
              uVar90 = *(uint *)(local_2e0 + uVar98 * 4);
              fVar172 = local_ac8;
              if ((float)local_900._0_4_ < 0.0) {
                fVar172 = sqrtf((float)local_900._0_4_);
                auVar224._8_4_ = 0x7fffffff;
                auVar224._0_8_ = 0x7fffffff7fffffff;
                auVar224._12_4_ = 0x7fffffff;
              }
              auVar360 = ZEXT464(uVar90);
              auVar347 = ZEXT464((uint)fVar138);
              auVar112 = vminps_avx(_local_a50,_local_a70);
              auVar143 = vmaxps_avx(_local_a50,_local_a70);
              auVar107 = vminps_avx(_local_a60,_local_a80);
              auVar114 = vminps_avx(auVar112,auVar107);
              auVar112 = vmaxps_avx(_local_a60,_local_a80);
              auVar107 = vmaxps_avx(auVar143,auVar112);
              auVar143 = vandps_avx(auVar114,auVar224);
              auVar112 = vandps_avx(auVar107,auVar224);
              auVar143 = vmaxps_avx(auVar143,auVar112);
              auVar112 = vmovshdup_avx(auVar143);
              auVar112 = vmaxss_avx(auVar112,auVar143);
              auVar143 = vshufpd_avx(auVar143,auVar143,1);
              auVar143 = vmaxss_avx(auVar143,auVar112);
              local_8c0 = auVar143._0_4_ * 1.9073486e-06;
              local_700._0_4_ = fVar172 * 1.9073486e-06;
              local_720._0_16_ = vshufps_avx(auVar107,auVar107,0xff);
              lVar94 = 5;
              do {
                fVar214 = auVar347._0_4_;
                fVar213 = 1.0 - fVar214;
                fVar138 = fVar213 * fVar213 * fVar213;
                fVar172 = fVar214 * fVar214;
                fVar174 = fVar214 * fVar172;
                fVar200 = fVar214 * fVar213;
                auVar143 = vshufps_avx(ZEXT416((uint)(fVar174 * 0.16666667)),
                                       ZEXT416((uint)(fVar174 * 0.16666667)),0);
                auVar112 = ZEXT416((uint)((fVar174 * 4.0 + fVar138 +
                                          fVar214 * fVar200 * 12.0 + fVar213 * fVar200 * 6.0) *
                                         0.16666667));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar107 = ZEXT416((uint)((fVar138 * 4.0 + fVar174 +
                                          fVar213 * fVar200 * 12.0 + fVar214 * fVar200 * 6.0) *
                                         0.16666667));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar114 = vshufps_avx(auVar360._0_16_,auVar360._0_16_,0);
                auVar186._0_4_ = auVar114._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar186._4_4_ = auVar114._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar186._8_4_ = auVar114._8_4_ * fStack_8e8 + 0.0;
                auVar186._12_4_ = auVar114._12_4_ * fStack_8e4 + 0.0;
                auVar114 = vshufps_avx(ZEXT416((uint)(fVar138 * 0.16666667)),
                                       ZEXT416((uint)(fVar138 * 0.16666667)),0);
                auVar111._0_4_ =
                     auVar114._0_4_ * (float)local_a50._0_4_ +
                     auVar107._0_4_ * (float)local_a70._0_4_ +
                     auVar143._0_4_ * (float)local_a80._0_4_ +
                     auVar112._0_4_ * (float)local_a60._0_4_;
                auVar111._4_4_ =
                     auVar114._4_4_ * (float)local_a50._4_4_ +
                     auVar107._4_4_ * (float)local_a70._4_4_ +
                     auVar143._4_4_ * (float)local_a80._4_4_ +
                     auVar112._4_4_ * (float)local_a60._4_4_;
                auVar111._8_4_ =
                     auVar114._8_4_ * fStack_a48 +
                     auVar107._8_4_ * fStack_a68 +
                     auVar143._8_4_ * fStack_a78 + auVar112._8_4_ * fStack_a58;
                auVar111._12_4_ =
                     auVar114._12_4_ * fStack_a44 +
                     auVar107._12_4_ * fStack_a64 +
                     auVar143._12_4_ * fStack_a74 + auVar112._12_4_ * fStack_a54;
                local_8e0._0_16_ = auVar111;
                auVar143 = vsubps_avx(auVar186,auVar111);
                _local_a20 = auVar143;
                auVar143 = vdpps_avx(auVar143,auVar143,0x7f);
                fVar138 = auVar143._0_4_;
                if (fVar138 < 0.0) {
                  local_aa0._0_4_ = fVar172;
                  local_ac0._0_4_ = fVar200;
                  auVar252._0_4_ = sqrtf(fVar138);
                  auVar252._4_60_ = extraout_var;
                  auVar112 = auVar252._0_16_;
                  fVar172 = (float)local_aa0._0_4_;
                  fVar200 = (float)local_ac0._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar143,auVar143);
                }
                auVar355 = ZEXT1664(auVar112);
                auVar107 = vshufps_avx(ZEXT416((uint)(fVar172 * 0.5)),ZEXT416((uint)(fVar172 * 0.5))
                                       ,0);
                auVar114 = ZEXT416((uint)((fVar213 * fVar213 + fVar200 * 4.0) * 0.5));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar106 = ZEXT416((uint)((fVar214 * -fVar214 - fVar200 * 4.0) * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar113 = ZEXT416((uint)(fVar213 * -fVar213 * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar326._0_4_ =
                     (float)local_a50._0_4_ * auVar113._0_4_ +
                     (float)local_a70._0_4_ * auVar106._0_4_ +
                     (float)local_a80._0_4_ * auVar107._0_4_ +
                     (float)local_a60._0_4_ * auVar114._0_4_;
                auVar326._4_4_ =
                     (float)local_a50._4_4_ * auVar113._4_4_ +
                     (float)local_a70._4_4_ * auVar106._4_4_ +
                     (float)local_a80._4_4_ * auVar107._4_4_ +
                     (float)local_a60._4_4_ * auVar114._4_4_;
                auVar326._8_4_ =
                     fStack_a48 * auVar113._8_4_ +
                     fStack_a68 * auVar106._8_4_ +
                     fStack_a78 * auVar107._8_4_ + fStack_a58 * auVar114._8_4_;
                auVar326._12_4_ =
                     fStack_a44 * auVar113._12_4_ +
                     fStack_a64 * auVar106._12_4_ +
                     fStack_a74 * auVar107._12_4_ + fStack_a54 * auVar114._12_4_;
                auVar107 = vshufps_avx(auVar347._0_16_,auVar347._0_16_,0);
                auVar114 = ZEXT416((uint)(fVar213 - (fVar214 + fVar214)));
                auVar106 = vshufps_avx(auVar114,auVar114,0);
                auVar114 = ZEXT416((uint)(fVar214 - (fVar213 + fVar213)));
                auVar113 = vshufps_avx(auVar114,auVar114,0);
                auVar146 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                auVar114 = vdpps_avx(auVar326,auVar326,0x7f);
                auVar150._0_4_ =
                     (float)local_a50._0_4_ * auVar146._0_4_ +
                     (float)local_a70._0_4_ * auVar113._0_4_ +
                     (float)local_a80._0_4_ * auVar107._0_4_ +
                     (float)local_a60._0_4_ * auVar106._0_4_;
                auVar150._4_4_ =
                     (float)local_a50._4_4_ * auVar146._4_4_ +
                     (float)local_a70._4_4_ * auVar113._4_4_ +
                     (float)local_a80._4_4_ * auVar107._4_4_ +
                     (float)local_a60._4_4_ * auVar106._4_4_;
                auVar150._8_4_ =
                     fStack_a48 * auVar146._8_4_ +
                     fStack_a68 * auVar113._8_4_ +
                     fStack_a78 * auVar107._8_4_ + fStack_a58 * auVar106._8_4_;
                auVar150._12_4_ =
                     fStack_a44 * auVar146._12_4_ +
                     fStack_a64 * auVar113._12_4_ +
                     fStack_a74 * auVar107._12_4_ + fStack_a54 * auVar106._12_4_;
                auVar107 = vblendps_avx(auVar114,_DAT_01feba10,0xe);
                auVar106 = vrsqrtss_avx(auVar107,auVar107);
                fVar174 = auVar106._0_4_;
                fVar172 = auVar114._0_4_;
                auVar106 = vdpps_avx(auVar326,auVar150,0x7f);
                auVar113 = vshufps_avx(auVar114,auVar114,0);
                auVar151._0_4_ = auVar150._0_4_ * auVar113._0_4_;
                auVar151._4_4_ = auVar150._4_4_ * auVar113._4_4_;
                auVar151._8_4_ = auVar150._8_4_ * auVar113._8_4_;
                auVar151._12_4_ = auVar150._12_4_ * auVar113._12_4_;
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar225._0_4_ = auVar326._0_4_ * auVar106._0_4_;
                auVar225._4_4_ = auVar326._4_4_ * auVar106._4_4_;
                auVar225._8_4_ = auVar326._8_4_ * auVar106._8_4_;
                auVar225._12_4_ = auVar326._12_4_ * auVar106._12_4_;
                auVar146 = vsubps_avx(auVar151,auVar225);
                auVar106 = vrcpss_avx(auVar107,auVar107);
                auVar107 = vmaxss_avx(ZEXT416((uint)local_8c0),
                                      ZEXT416((uint)(auVar360._0_4_ * (float)local_700._0_4_)));
                auVar373 = ZEXT1664(auVar107);
                auVar106 = ZEXT416((uint)(auVar106._0_4_ * (2.0 - fVar172 * auVar106._0_4_)));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                uVar98 = CONCAT44(auVar326._4_4_,auVar326._0_4_);
                auVar241._0_8_ = uVar98 ^ 0x8000000080000000;
                auVar241._8_4_ = -auVar326._8_4_;
                auVar241._12_4_ = -auVar326._12_4_;
                auVar113 = ZEXT416((uint)(fVar174 * 1.5 +
                                         fVar172 * -0.5 * fVar174 * fVar174 * fVar174));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar206._0_4_ = auVar113._0_4_ * auVar146._0_4_ * auVar106._0_4_;
                auVar206._4_4_ = auVar113._4_4_ * auVar146._4_4_ * auVar106._4_4_;
                auVar206._8_4_ = auVar113._8_4_ * auVar146._8_4_ * auVar106._8_4_;
                auVar206._12_4_ = auVar113._12_4_ * auVar146._12_4_ * auVar106._12_4_;
                auVar267._0_4_ = auVar326._0_4_ * auVar113._0_4_;
                auVar267._4_4_ = auVar326._4_4_ * auVar113._4_4_;
                auVar267._8_4_ = auVar326._8_4_ * auVar113._8_4_;
                auVar267._12_4_ = auVar326._12_4_ * auVar113._12_4_;
                local_aa0._0_4_ = auVar107._0_4_;
                if (fVar172 < 0.0) {
                  local_ac0._0_16_ = auVar241;
                  local_9c0._0_16_ = auVar267;
                  local_9e0._0_16_ = auVar206;
                  fVar172 = sqrtf(fVar172);
                  auVar355 = ZEXT464(auVar112._0_4_);
                  auVar373 = ZEXT464((uint)local_aa0._0_4_);
                  auVar206 = local_9e0._0_16_;
                  auVar241 = local_ac0._0_16_;
                  auVar267 = local_9c0._0_16_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar114,auVar114);
                  fVar172 = auVar112._0_4_;
                }
                auVar112 = vdpps_avx(_local_a20,auVar267,0x7f);
                fVar172 = (local_8c0 / fVar172) * (auVar355._0_4_ + 1.0) +
                          auVar373._0_4_ + auVar355._0_4_ * local_8c0;
                auVar107 = vdpps_avx(auVar241,auVar267,0x7f);
                auVar114 = vdpps_avx(_local_a20,auVar206,0x7f);
                auVar106 = vdpps_avx(_local_8f0,auVar267,0x7f);
                auVar113 = vdpps_avx(_local_a20,auVar241,0x7f);
                fVar174 = auVar107._0_4_ + auVar114._0_4_;
                fVar200 = auVar112._0_4_;
                auVar115._0_4_ = fVar200 * fVar200;
                auVar115._4_4_ = auVar112._4_4_ * auVar112._4_4_;
                auVar115._8_4_ = auVar112._8_4_ * auVar112._8_4_;
                auVar115._12_4_ = auVar112._12_4_ * auVar112._12_4_;
                auVar114 = vsubps_avx(auVar143,auVar115);
                auVar107 = vdpps_avx(_local_a20,_local_8f0,0x7f);
                fVar213 = auVar113._0_4_ - fVar200 * fVar174;
                fVar215 = auVar107._0_4_ - fVar200 * auVar106._0_4_;
                auVar107 = vrsqrtss_avx(auVar114,auVar114);
                fVar216 = auVar114._0_4_;
                fVar200 = auVar107._0_4_;
                fVar200 = fVar200 * 1.5 + fVar216 * -0.5 * fVar200 * fVar200 * fVar200;
                if (fVar216 < 0.0) {
                  local_ac0._0_16_ = auVar112;
                  local_9c0._0_4_ = fVar172;
                  local_9e0._0_16_ = auVar106;
                  local_940._0_4_ = fVar213;
                  local_a00._0_4_ = fVar215;
                  local_960._0_4_ = fVar200;
                  auVar355 = ZEXT1664(auVar355._0_16_);
                  fVar216 = sqrtf(fVar216);
                  auVar373 = ZEXT464((uint)local_aa0._0_4_);
                  fVar200 = (float)local_960._0_4_;
                  fVar213 = (float)local_940._0_4_;
                  fVar215 = (float)local_a00._0_4_;
                  auVar106 = local_9e0._0_16_;
                  auVar112 = local_ac0._0_16_;
                  fVar172 = (float)local_9c0._0_4_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar114,auVar114);
                  fVar216 = auVar107._0_4_;
                }
                auVar308 = ZEXT1664(auVar143);
                auVar146 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar113 = vshufps_avx(auVar326,auVar326,0xff);
                fVar233 = fVar213 * fVar200 - auVar113._0_4_;
                auVar226._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
                auVar226._8_4_ = auVar106._8_4_ ^ 0x80000000;
                auVar226._12_4_ = auVar106._12_4_ ^ 0x80000000;
                auVar242._0_4_ = -fVar233;
                auVar242._4_4_ = 0x80000000;
                auVar242._8_4_ = 0x80000000;
                auVar242._12_4_ = 0x80000000;
                fVar213 = fVar174 * fVar215 * fVar200;
                auVar273 = ZEXT464((uint)fVar213);
                auVar107 = vinsertps_avx(ZEXT416((uint)(fVar215 * fVar200)),auVar226,0x10);
                auVar114 = vmovsldup_avx(ZEXT416((uint)(fVar213 - auVar106._0_4_ * fVar233)));
                auVar107 = vdivps_avx(auVar107,auVar114);
                auVar146 = ZEXT416((uint)(fVar216 - auVar146._0_4_));
                auVar106 = vinsertps_avx(auVar112,auVar146,0x10);
                auVar207._0_4_ = auVar106._0_4_ * auVar107._0_4_;
                auVar207._4_4_ = auVar106._4_4_ * auVar107._4_4_;
                auVar207._8_4_ = auVar106._8_4_ * auVar107._8_4_;
                auVar207._12_4_ = auVar106._12_4_ * auVar107._12_4_;
                auVar107 = vinsertps_avx(auVar242,ZEXT416((uint)fVar174),0x1c);
                auVar107 = vdivps_avx(auVar107,auVar114);
                auVar114 = vhaddps_avx(auVar207,auVar207);
                auVar187._0_4_ = auVar106._0_4_ * auVar107._0_4_;
                auVar187._4_4_ = auVar106._4_4_ * auVar107._4_4_;
                auVar187._8_4_ = auVar106._8_4_ * auVar107._8_4_;
                auVar187._12_4_ = auVar106._12_4_ * auVar107._12_4_;
                auVar107 = vhaddps_avx(auVar187,auVar187);
                fVar214 = fVar214 - auVar114._0_4_;
                fVar174 = auVar360._0_4_ - auVar107._0_4_;
                auVar360 = ZEXT464((uint)fVar174);
                auVar227._8_4_ = 0x7fffffff;
                auVar227._0_8_ = 0x7fffffff7fffffff;
                auVar227._12_4_ = 0x7fffffff;
                auVar232 = ZEXT1664(auVar227);
                auVar112 = vandps_avx(auVar112,auVar227);
                bVar99 = true;
                if (auVar112._0_4_ < fVar172) {
                  auVar112 = vandps_avx(auVar146,auVar227);
                  if (auVar112._0_4_ <
                      (float)local_720._0_4_ * 1.9073486e-06 + auVar373._0_4_ + fVar172) {
                    fVar174 = fVar174 + (float)local_870._0_4_;
                    auVar360 = ZEXT464((uint)fVar174);
                    if ((((fVar137 <= fVar174) &&
                         (fVar172 = *(float *)(ray + k * 4 + 0x80), fVar174 <= fVar172)) &&
                        (0.0 <= fVar214)) && (fVar214 <= 1.0)) {
                      auVar112 = vrsqrtss_avx(auVar143,auVar143);
                      fVar200 = auVar112._0_4_;
                      pGVar12 = (context->scene->geometries).items[local_998].ptr;
                      if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar91 = 1;
                        }
                        else {
                          auVar112 = ZEXT416((uint)(fVar200 * 1.5 +
                                                   fVar138 * -0.5 * fVar200 * fVar200 * fVar200));
                          auVar112 = vshufps_avx(auVar112,auVar112,0);
                          auVar152._0_4_ = auVar112._0_4_ * (float)local_a20._0_4_;
                          auVar152._4_4_ = auVar112._4_4_ * (float)local_a20._4_4_;
                          auVar152._8_4_ = auVar112._8_4_ * fStack_a18;
                          auVar152._12_4_ = auVar112._12_4_ * fStack_a14;
                          auVar116._0_4_ = auVar326._0_4_ + auVar113._0_4_ * auVar152._0_4_;
                          auVar116._4_4_ = auVar326._4_4_ + auVar113._4_4_ * auVar152._4_4_;
                          auVar116._8_4_ = auVar326._8_4_ + auVar113._8_4_ * auVar152._8_4_;
                          auVar116._12_4_ = auVar326._12_4_ + auVar113._12_4_ * auVar152._12_4_;
                          auVar112 = vshufps_avx(auVar152,auVar152,0xc9);
                          auVar107 = vshufps_avx(auVar326,auVar326,0xc9);
                          auVar153._0_4_ = auVar107._0_4_ * auVar152._0_4_;
                          auVar153._4_4_ = auVar107._4_4_ * auVar152._4_4_;
                          auVar153._8_4_ = auVar107._8_4_ * auVar152._8_4_;
                          auVar153._12_4_ = auVar107._12_4_ * auVar152._12_4_;
                          auVar188._0_4_ = auVar326._0_4_ * auVar112._0_4_;
                          auVar188._4_4_ = auVar326._4_4_ * auVar112._4_4_;
                          auVar188._8_4_ = auVar326._8_4_ * auVar112._8_4_;
                          auVar188._12_4_ = auVar326._12_4_ * auVar112._12_4_;
                          auVar114 = vsubps_avx(auVar188,auVar153);
                          auVar112 = vshufps_avx(auVar114,auVar114,0xc9);
                          auVar107 = vshufps_avx(auVar116,auVar116,0xc9);
                          auVar189._0_4_ = auVar107._0_4_ * auVar112._0_4_;
                          auVar189._4_4_ = auVar107._4_4_ * auVar112._4_4_;
                          auVar189._8_4_ = auVar107._8_4_ * auVar112._8_4_;
                          auVar189._12_4_ = auVar107._12_4_ * auVar112._12_4_;
                          auVar112 = vshufps_avx(auVar114,auVar114,0xd2);
                          auVar117._0_4_ = auVar116._0_4_ * auVar112._0_4_;
                          auVar117._4_4_ = auVar116._4_4_ * auVar112._4_4_;
                          auVar117._8_4_ = auVar116._8_4_ * auVar112._8_4_;
                          auVar117._12_4_ = auVar116._12_4_ * auVar112._12_4_;
                          auVar112 = vsubps_avx(auVar189,auVar117);
                          local_690 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
                          local_6c0 = (RTCHitN  [16])vshufps_avx(auVar112,auVar112,0x55);
                          auStack_6b0 = vshufps_avx(auVar112,auVar112,0xaa);
                          local_6a0 = vshufps_avx(auVar112,auVar112,0);
                          local_680 = ZEXT816(0) << 0x20;
                          local_670 = local_6e0._0_8_;
                          uStack_668 = local_6e0._8_8_;
                          local_660 = local_6d0._0_8_;
                          uStack_658 = local_6d0._8_8_;
                          uVar90 = context->user->instID[0];
                          _local_650 = CONCAT44(uVar90,uVar90);
                          _uStack_648 = CONCAT44(uVar90,uVar90);
                          uVar90 = context->user->instPrimID[0];
                          _uStack_640 = CONCAT44(uVar90,uVar90);
                          _uStack_638 = CONCAT44(uVar90,uVar90);
                          *(float *)(ray + k * 4 + 0x80) = fVar174;
                          local_ae0 = *local_9a0;
                          uStack_ad8 = local_9a0[1];
                          local_990.valid = (int *)&local_ae0;
                          local_990.geometryUserPtr = pGVar12->userPtr;
                          local_990.context = context->user;
                          local_990.hit = local_6c0;
                          local_990.N = 4;
                          local_990.ray = (RTCRayN *)ray;
                          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar273 = ZEXT464((uint)fVar213);
                            auVar308 = ZEXT1664(auVar143);
                            auVar355 = ZEXT1664(auVar355._0_16_);
                            auVar373 = ZEXT1664(auVar373._0_16_);
                            (*pGVar12->occlusionFilterN)(&local_990);
                            auVar360 = ZEXT1664(ZEXT416((uint)fVar174));
                            auVar232 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar83._8_8_ = uStack_ad8;
                          auVar83._0_8_ = local_ae0;
                          if (auVar83 == (undefined1  [16])0x0) {
                            auVar143 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar143 = auVar143 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var16 = context->args->filter;
                            if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar273 = ZEXT1664(auVar273._0_16_);
                              auVar308 = ZEXT1664(auVar308._0_16_);
                              auVar355 = ZEXT1664(auVar355._0_16_);
                              auVar373 = ZEXT1664(auVar373._0_16_);
                              (*p_Var16)(&local_990);
                              auVar360 = ZEXT1664(ZEXT416((uint)fVar174));
                              auVar232 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            auVar84._8_8_ = uStack_ad8;
                            auVar84._0_8_ = local_ae0;
                            auVar112 = vpcmpeqd_avx((undefined1  [16])0x0,auVar84);
                            auVar143 = auVar112 ^ _DAT_01febe20;
                            auVar190._8_4_ = 0xff800000;
                            auVar190._0_8_ = 0xff800000ff800000;
                            auVar190._12_4_ = 0xff800000;
                            auVar112 = vblendvps_avx(auVar190,*(undefined1 (*) [16])
                                                               (local_990.ray + 0x80),auVar112);
                            *(undefined1 (*) [16])(local_990.ray + 0x80) = auVar112;
                          }
                          auVar154._8_8_ = 0x100000001;
                          auVar154._0_8_ = 0x100000001;
                          bVar99 = (auVar154 & auVar143) != (undefined1  [16])0x0;
                          uVar91 = (ulong)bVar99;
                          if (!bVar99) {
                            *(float *)(ray + k * 4 + 0x80) = fVar172;
                          }
                        }
                        bVar99 = false;
                        goto LAB_010117ef;
                      }
                    }
                    bVar99 = false;
                    uVar91 = 0;
                  }
                }
LAB_010117ef:
                auVar347 = ZEXT464((uint)fVar214);
                bVar93 = (byte)uVar91;
                if (!bVar99) goto LAB_01011af4;
                lVar94 = lVar94 + -1;
              } while (lVar94 != 0);
              bVar93 = 0;
LAB_01011af4:
              uVar91 = (ulong)(bVar93 & 1);
              uVar97 = CONCAT71(local_780._1_7_,local_780[0] | bVar93 & 1);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar127._4_4_ = uVar8;
              auVar127._0_4_ = uVar8;
              auVar127._8_4_ = uVar8;
              auVar127._12_4_ = uVar8;
              auVar127._16_4_ = uVar8;
              auVar127._20_4_ = uVar8;
              auVar127._24_4_ = uVar8;
              auVar127._28_4_ = uVar8;
              auVar119 = vcmpps_avx(_local_760,auVar127,2);
              auVar124 = vandps_avx(auVar119,local_5c0);
              local_5c0 = local_5c0 & auVar119;
              uVar98 = local_5e0;
            } while ((((((((local_5c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_5c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_5c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_5c0 >> 0x7f,0) != '\0') ||
                       (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_5c0 >> 0xbf,0) != '\0') ||
                     (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_5c0[0x1f] < '\0');
          }
          auVar124 = vandps_avx(local_540,local_520);
          auVar119 = vandps_avx(_local_800,_local_7c0);
          auVar195._0_4_ = (float)local_920._0_4_ + local_340._0_4_;
          auVar195._4_4_ = (float)local_920._4_4_ + local_340._4_4_;
          auVar195._8_4_ = fStack_918 + local_340._8_4_;
          auVar195._12_4_ = fStack_914 + local_340._12_4_;
          auVar195._16_4_ = fStack_910 + local_340._16_4_;
          auVar195._20_4_ = fStack_90c + local_340._20_4_;
          auVar195._24_4_ = fStack_908 + local_340._24_4_;
          auVar195._28_4_ = fStack_904 + local_340._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar231._4_4_ = uVar8;
          auVar231._0_4_ = uVar8;
          auVar231._8_4_ = uVar8;
          auVar231._12_4_ = uVar8;
          auVar231._16_4_ = uVar8;
          auVar231._20_4_ = uVar8;
          auVar231._24_4_ = uVar8;
          auVar231._28_4_ = uVar8;
          auVar249 = vcmpps_avx(auVar195,auVar231,2);
          auVar124 = vandps_avx(auVar249,auVar124);
          auVar250._0_4_ = (float)local_920._0_4_ + local_300._0_4_;
          auVar250._4_4_ = (float)local_920._4_4_ + local_300._4_4_;
          auVar250._8_4_ = fStack_918 + local_300._8_4_;
          auVar250._12_4_ = fStack_914 + local_300._12_4_;
          auVar250._16_4_ = fStack_910 + local_300._16_4_;
          auVar250._20_4_ = fStack_90c + local_300._20_4_;
          auVar250._24_4_ = fStack_908 + local_300._24_4_;
          auVar250._28_4_ = fStack_904 + local_300._28_4_;
          auVar249 = vcmpps_avx(auVar250,auVar231,2);
          auVar119 = vandps_avx(auVar249,auVar119);
          auVar119 = vorps_avx(auVar124,auVar119);
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0x7f,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0xbf,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar119[0x1f] < '\0') {
            uVar92 = (ulong)uVar88;
            *(undefined1 (*) [32])(auStack_180 + uVar92 * 0x60) = auVar119;
            auVar124 = vblendvps_avx(_local_300,_local_340,auVar124);
            *(undefined1 (*) [32])(auStack_160 + uVar92 * 0x60) = auVar124;
            uVar9 = vmovlps_avx(local_860);
            *(undefined8 *)(afStack_140 + uVar92 * 0x18) = uVar9;
            auStack_138[uVar92 * 0x18] = (int)uVar98 + 1;
            uVar88 = uVar88 + 1;
          }
        }
        auVar252 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    do {
      if (uVar88 == 0) {
        if ((uVar97 & 1) != 0) {
          return local_ba9;
        }
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar118._4_4_ = uVar8;
        auVar118._0_4_ = uVar8;
        auVar118._8_4_ = uVar8;
        auVar118._12_4_ = uVar8;
        auVar143 = vcmpps_avx(local_4b0,auVar118,2);
        uVar88 = vmovmskps_avx(auVar143);
        uVar88 = (uint)local_848 - 1 & (uint)local_848 & uVar88;
        local_ba9 = uVar88 != 0;
        if (!local_ba9) {
          return local_ba9;
        }
        goto LAB_0100f1ae;
      }
      uVar90 = uVar88 - 1;
      uVar92 = (ulong)uVar90;
      lVar94 = uVar92 * 0x60;
      auVar124 = *(undefined1 (*) [32])(auStack_160 + lVar94);
      auVar128._0_4_ = (float)local_920._0_4_ + auVar124._0_4_;
      auVar128._4_4_ = (float)local_920._4_4_ + auVar124._4_4_;
      auVar128._8_4_ = fStack_918 + auVar124._8_4_;
      auVar128._12_4_ = fStack_914 + auVar124._12_4_;
      auVar128._16_4_ = fStack_910 + auVar124._16_4_;
      auVar128._20_4_ = fStack_90c + auVar124._20_4_;
      auVar128._24_4_ = fStack_908 + auVar124._24_4_;
      auVar128._28_4_ = fStack_904 + auVar124._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar212._4_4_ = uVar8;
      auVar212._0_4_ = uVar8;
      auVar212._8_4_ = uVar8;
      auVar212._12_4_ = uVar8;
      auVar212._16_4_ = uVar8;
      auVar212._20_4_ = uVar8;
      auVar212._24_4_ = uVar8;
      auVar212._28_4_ = uVar8;
      auVar119 = vcmpps_avx(auVar128,auVar212,2);
      _local_6c0 = vandps_avx(auVar119,*(undefined1 (*) [32])(auStack_180 + lVar94));
      auVar119 = *(undefined1 (*) [32])(auStack_180 + lVar94) & auVar119;
      bVar76 = (auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar77 = (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar75 = (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar74 = SUB321(auVar119 >> 0x7f,0) == '\0';
      bVar73 = (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar72 = SUB321(auVar119 >> 0xbf,0) == '\0';
      bVar70 = (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar99 = -1 < auVar119[0x1f];
      if (((((((!bVar76 || !bVar77) || !bVar75) || !bVar74) || !bVar73) || !bVar72) || !bVar70) ||
          !bVar99) {
        auVar196._8_4_ = 0x7f800000;
        auVar196._0_8_ = 0x7f8000007f800000;
        auVar196._12_4_ = 0x7f800000;
        auVar196._16_4_ = 0x7f800000;
        auVar196._20_4_ = 0x7f800000;
        auVar196._24_4_ = 0x7f800000;
        auVar196._28_4_ = 0x7f800000;
        auVar124 = vblendvps_avx(auVar196,auVar124,_local_6c0);
        auVar119 = vshufps_avx(auVar124,auVar124,0xb1);
        auVar119 = vminps_avx(auVar124,auVar119);
        auVar249 = vshufpd_avx(auVar119,auVar119,5);
        auVar119 = vminps_avx(auVar119,auVar249);
        auVar249 = vperm2f128_avx(auVar119,auVar119,1);
        auVar119 = vminps_avx(auVar119,auVar249);
        auVar119 = vcmpps_avx(auVar124,auVar119,0);
        auVar249 = _local_6c0 & auVar119;
        auVar124 = _local_6c0;
        if ((((((((auVar249 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar249 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar249 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar249 >> 0x7f,0) != '\0') ||
              (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar249 >> 0xbf,0) != '\0') ||
            (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar249[0x1f] < '\0') {
          auVar124 = vandps_avx(auVar119,_local_6c0);
        }
        fVar138 = afStack_140[uVar92 * 0x18 + 1];
        uVar98 = (ulong)auStack_138[uVar92 * 0x18];
        uVar95 = vmovmskps_avx(auVar124);
        uVar89 = 0;
        if (uVar95 != 0) {
          for (; (uVar95 >> uVar89 & 1) == 0; uVar89 = uVar89 + 1) {
          }
        }
        fVar172 = afStack_140[uVar92 * 0x18];
        *(undefined4 *)(local_6c0 + (ulong)uVar89 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar94) = _local_6c0;
        if ((((((((_local_6c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_6c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_6c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_6c0 >> 0x7f,0) != '\0') ||
              (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_6c0 >> 0xbf,0) != '\0') ||
            (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_6c0[0x1f] < '\0') {
          uVar90 = uVar88;
        }
        auVar143 = vshufps_avx(ZEXT416((uint)(fVar138 - fVar172)),ZEXT416((uint)(fVar138 - fVar172))
                               ,0);
        local_340._4_4_ = fVar172 + auVar143._4_4_ * 0.14285715;
        local_340._0_4_ = fVar172 + auVar143._0_4_ * 0.0;
        fStack_338 = fVar172 + auVar143._8_4_ * 0.2857143;
        fStack_334 = fVar172 + auVar143._12_4_ * 0.42857146;
        fStack_330 = fVar172 + auVar143._0_4_ * 0.5714286;
        fStack_32c = fVar172 + auVar143._4_4_ * 0.71428573;
        fStack_328 = fVar172 + auVar143._8_4_ * 0.8571429;
        fStack_324 = fVar172 + auVar143._12_4_;
        local_860._8_8_ = 0;
        local_860._0_8_ = *(ulong *)(local_340 + (ulong)uVar89 * 4);
      }
      uVar88 = uVar90;
    } while (((((((bVar76 && bVar77) && bVar75) && bVar74) && bVar73) && bVar72) && bVar70) &&
             bVar99);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }